

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O3

void embree::avx::CurveNiMBIntersectorK<8,4>::
     intersect_t<embree::avx::SweepCurve1IntersectorK<embree::BSplineCurveT,4>,embree::avx::Intersect1KEpilog1<4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  undefined4 uVar8;
  undefined8 uVar9;
  undefined1 auVar10 [28];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  Primitive PVar25;
  Geometry *pGVar26;
  __int_type_conflict _Var27;
  long lVar28;
  long lVar29;
  RTCFilterFunctionN p_Var30;
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [12];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  uint uVar101;
  uint uVar102;
  ulong uVar103;
  undefined1 (*pauVar104) [32];
  uint uVar105;
  ulong uVar106;
  long lVar107;
  long lVar108;
  long lVar109;
  uint uVar110;
  uint uVar111;
  __m128 a;
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  float fVar140;
  float fVar142;
  float fVar144;
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  float fVar139;
  float fVar141;
  float fVar143;
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar114 [16];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar123 [16];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  float fVar145;
  undefined8 extraout_XMM1_Qa;
  undefined8 extraout_XMM1_Qa_00;
  float fVar175;
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar156 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar184 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [32];
  float fVar146;
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  float fVar174;
  float fVar176;
  float fVar177;
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  float fVar178;
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  float fVar201;
  float fVar202;
  undefined1 auVar188 [32];
  float fVar204;
  undefined1 auVar189 [32];
  undefined1 auVar179 [16];
  undefined1 auVar190 [32];
  undefined1 auVar180 [16];
  float fVar203;
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar183 [16];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  float fVar205;
  float fVar228;
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar367 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [28];
  float fVar227;
  float fVar229;
  float fVar230;
  undefined1 auVar220 [32];
  undefined1 auVar221 [32];
  float fVar231;
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  undefined1 auVar225 [32];
  undefined1 auVar226 [32];
  float fVar232;
  float fVar246;
  float fVar247;
  float fVar248;
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  float fVar249;
  float fVar250;
  float fVar251;
  undefined1 auVar243 [32];
  undefined1 auVar244 [32];
  undefined1 auVar245 [32];
  float fVar252;
  float fVar253;
  float fVar268;
  float fVar270;
  undefined1 auVar254 [16];
  float fVar272;
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  float fVar274;
  float fVar276;
  float fVar278;
  undefined1 auVar260 [32];
  float fVar280;
  undefined1 auVar261 [32];
  undefined1 auVar262 [32];
  undefined1 auVar263 [32];
  float fVar269;
  float fVar271;
  float fVar273;
  float fVar275;
  float fVar277;
  float fVar279;
  undefined1 auVar264 [32];
  undefined1 auVar265 [32];
  undefined1 auVar266 [32];
  undefined1 auVar267 [64];
  undefined1 auVar281 [16];
  float fVar299;
  float fVar302;
  undefined1 auVar285 [32];
  float fVar296;
  float fVar300;
  float fVar303;
  undefined1 auVar286 [32];
  undefined1 auVar287 [32];
  undefined1 auVar288 [32];
  undefined1 auVar289 [32];
  undefined1 auVar290 [32];
  undefined1 auVar291 [32];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar292 [32];
  float fVar294;
  float fVar295;
  float fVar297;
  float fVar298;
  float fVar301;
  undefined1 auVar284 [32];
  undefined1 auVar293 [64];
  float fVar304;
  float fVar314;
  float fVar315;
  float fVar317;
  float fVar319;
  float fVar321;
  float fVar323;
  undefined1 auVar305 [32];
  undefined1 auVar306 [32];
  undefined1 auVar307 [32];
  undefined1 auVar308 [32];
  undefined1 auVar309 [32];
  undefined1 auVar310 [32];
  float fVar316;
  float fVar318;
  float fVar320;
  float fVar322;
  float fVar324;
  undefined1 auVar311 [32];
  undefined1 auVar312 [32];
  undefined1 auVar313 [64];
  float fVar325;
  float fVar326;
  float fVar327;
  float fVar328;
  undefined1 auVar329 [16];
  undefined1 auVar330 [16];
  float fVar341;
  float fVar345;
  float fVar353;
  float fVar357;
  float fVar361;
  undefined1 auVar331 [32];
  undefined1 auVar332 [32];
  undefined1 auVar333 [32];
  undefined1 auVar334 [32];
  undefined1 auVar335 [32];
  undefined1 auVar336 [32];
  float fVar342;
  float fVar343;
  float fVar344;
  float fVar346;
  float fVar347;
  float fVar348;
  float fVar349;
  float fVar350;
  float fVar351;
  float fVar352;
  float fVar354;
  float fVar355;
  float fVar356;
  float fVar358;
  float fVar359;
  float fVar360;
  float fVar362;
  float fVar363;
  float fVar364;
  float fVar365;
  float fVar366;
  undefined1 auVar337 [32];
  undefined1 auVar338 [32];
  undefined1 auVar339 [32];
  undefined1 auVar340 [32];
  float fVar376;
  float fVar377;
  float fVar378;
  undefined1 auVar368 [32];
  undefined1 auVar369 [32];
  undefined1 auVar370 [32];
  undefined1 auVar371 [32];
  float fVar379;
  float fVar380;
  undefined1 auVar372 [32];
  undefined1 auVar373 [32];
  undefined1 auVar374 [32];
  undefined1 auVar375 [64];
  undefined1 auVar381 [32];
  undefined1 auVar382 [32];
  undefined1 auVar383 [32];
  undefined1 auVar384 [32];
  undefined1 auVar385 [32];
  undefined1 auVar386 [32];
  undefined1 auVar387 [32];
  undefined1 auVar388 [64];
  undefined1 auVar389 [16];
  undefined1 auVar390 [32];
  undefined1 auVar391 [32];
  undefined1 auVar392 [32];
  undefined1 auVar393 [32];
  undefined1 auVar394 [32];
  float fVar398;
  undefined1 auVar395 [32];
  undefined1 auVar396 [32];
  undefined1 auVar400 [16];
  float fVar399;
  float fVar406;
  float fVar407;
  float fVar408;
  float fVar409;
  float fVar410;
  float fVar411;
  float in_register_0000151c;
  undefined1 auVar401 [32];
  undefined1 auVar402 [32];
  undefined1 auVar403 [32];
  undefined1 auVar404 [32];
  float fVar412;
  float fVar413;
  undefined1 auVar414 [16];
  float fVar420;
  float fVar422;
  float fVar426;
  float fVar428;
  float fVar430;
  undefined1 auVar415 [32];
  undefined1 auVar416 [32];
  float fVar421;
  float fVar423;
  float fVar424;
  float fVar425;
  float fVar427;
  float fVar429;
  float fVar431;
  undefined1 auVar417 [32];
  undefined1 auVar418 [32];
  undefined1 auVar419 [32];
  float fVar432;
  float fVar438;
  float fVar439;
  float fVar440;
  float fVar441;
  float fVar442;
  float fVar443;
  float in_register_0000159c;
  undefined1 auVar433 [32];
  undefined1 auVar434 [32];
  undefined1 auVar435 [32];
  undefined1 auVar436 [32];
  undefined1 auVar437 [32];
  float in_register_000015dc;
  undefined1 auVar444 [32];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  BBox<embree::vfloat_impl<8>_> tp0;
  BBox<embree::vfloat_impl<8>_> tp1;
  StackEntry stack [3];
  float local_c00;
  undefined1 local_bc0 [8];
  float fStack_bb8;
  float fStack_bb4;
  float fStack_bb0;
  float fStack_bac;
  float fStack_ba8;
  float fStack_ba4;
  float local_ad0;
  float fStack_acc;
  float fStack_ac8;
  float fStack_ac4;
  float local_ac0;
  float fStack_abc;
  float fStack_ab8;
  float fStack_ab4;
  float local_ab0;
  float fStack_aac;
  float fStack_aa8;
  float fStack_aa4;
  float local_aa0;
  float fStack_a9c;
  float fStack_a98;
  float fStack_a94;
  RTCFilterFunctionNArguments local_a90;
  undefined1 local_a60 [8];
  float fStack_a58;
  float fStack_a54;
  float fStack_a50;
  float fStack_a4c;
  float fStack_a48;
  float fStack_a44;
  undefined1 (*local_a30) [16];
  ulong local_a28;
  undefined1 local_a20 [32];
  undefined1 local_a00 [32];
  undefined1 local_9e0 [32];
  undefined1 local_9c0 [16];
  undefined1 local_9b0 [8];
  float fStack_9a8;
  float fStack_9a4;
  undefined1 local_9a0 [8];
  float fStack_998;
  float fStack_994;
  float fStack_990;
  float fStack_98c;
  float fStack_988;
  float fStack_984;
  undefined1 local_980 [32];
  float local_960;
  float fStack_95c;
  float fStack_958;
  float fStack_954;
  float fStack_950;
  float fStack_94c;
  float fStack_948;
  float fStack_944;
  float local_940;
  float fStack_93c;
  float fStack_938;
  float fStack_934;
  float fStack_930;
  float fStack_92c;
  float fStack_928;
  float fStack_924;
  undefined1 local_920 [32];
  undefined1 local_900 [32];
  undefined1 local_8e0 [16];
  undefined1 local_8d0 [16];
  undefined1 local_8c0 [16];
  Primitive *local_8b0;
  ulong local_8a8;
  undefined1 local_8a0 [8];
  float fStack_898;
  float fStack_894;
  float fStack_890;
  float fStack_88c;
  float fStack_888;
  undefined1 local_880 [8];
  float fStack_878;
  float fStack_874;
  float fStack_870;
  float fStack_86c;
  float fStack_868;
  undefined1 local_860 [8];
  float fStack_858;
  float fStack_854;
  float fStack_850;
  float fStack_84c;
  float fStack_848;
  float fStack_844;
  undefined1 local_840 [8];
  float fStack_838;
  float fStack_834;
  float fStack_830;
  float fStack_82c;
  float fStack_828;
  undefined1 local_820 [8];
  float fStack_818;
  float fStack_814;
  float fStack_810;
  float fStack_80c;
  float fStack_808;
  float fStack_804;
  undefined1 local_800 [8];
  float fStack_7f8;
  float fStack_7f4;
  float fStack_7f0;
  float fStack_7ec;
  float fStack_7e8;
  float fStack_7e4;
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [16];
  undefined1 local_790 [16];
  RTCHitN local_780 [16];
  undefined1 auStack_770 [16];
  undefined1 local_760 [16];
  undefined1 local_750 [16];
  undefined1 local_740 [16];
  undefined8 local_730;
  undefined8 uStack_728;
  undefined8 local_720;
  undefined8 uStack_718;
  uint local_710;
  uint uStack_70c;
  uint uStack_708;
  uint uStack_704;
  undefined1 auStack_700 [16];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [8];
  float fStack_6b8;
  float fStack_6b4;
  float fStack_6b0;
  float fStack_6ac;
  float fStack_6a8;
  float fStack_6a4;
  undefined1 local_6a0 [8];
  float fStack_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  float fStack_688;
  float fStack_684;
  undefined1 local_680 [8];
  float fStack_678;
  float fStack_674;
  float fStack_670;
  float fStack_66c;
  float fStack_668;
  float fStack_664;
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_590 [16];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [8];
  float fStack_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  undefined1 local_4c0 [8];
  float fStack_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  float fStack_4a8;
  undefined1 local_4a0 [8];
  float fStack_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  undefined1 local_460 [8];
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  undefined1 local_440 [8];
  float fStack_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  undefined1 local_420 [8];
  float fStack_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  undefined1 local_400 [8];
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  undefined1 local_3e0 [8];
  float fStack_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  float fStack_3c4;
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  float local_340;
  float fStack_33c;
  float fStack_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  float fStack_324;
  float local_320;
  float fStack_31c;
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  float fStack_304;
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [8];
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  undefined1 local_280 [8];
  float fStack_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  undefined1 local_260 [8];
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  undefined1 local_240 [8];
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  undefined1 local_220 [8];
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  undefined4 uStack_204;
  undefined1 local_200 [8];
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  undefined4 uStack_1e4;
  undefined1 local_1e0 [8];
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  undefined4 uStack_1c4;
  float local_1c0 [4];
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  float local_1a0 [4];
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  undefined8 uStack_140;
  int aiStack_138 [66];
  undefined1 auVar397 [64];
  undefined1 auVar405 [64];
  
  PVar25 = prim[1];
  uVar103 = (ulong)(byte)PVar25;
  lVar107 = uVar103 * 0x25;
  auVar150 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                           0x10);
  auVar150 = vinsertps_avx(auVar150,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar36 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar36 = vinsertps_avx(auVar36,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar150 = vsubps_avx(auVar150,*(undefined1 (*) [16])(prim + lVar107 + 6));
  fVar205 = *(float *)(prim + lVar107 + 0x12);
  auVar147._0_4_ = fVar205 * auVar150._0_4_;
  auVar147._4_4_ = fVar205 * auVar150._4_4_;
  auVar147._8_4_ = fVar205 * auVar150._8_4_;
  auVar147._12_4_ = fVar205 * auVar150._12_4_;
  auVar150 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar103 * 4 + 6)));
  auVar254._0_4_ = fVar205 * auVar36._0_4_;
  auVar254._4_4_ = fVar205 * auVar36._4_4_;
  auVar254._8_4_ = fVar205 * auVar36._8_4_;
  auVar254._12_4_ = fVar205 * auVar36._12_4_;
  auVar36 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar103 * 4 + 10)));
  auVar124._16_16_ = auVar36;
  auVar124._0_16_ = auVar150;
  auVar124 = vcvtdq2ps_avx(auVar124);
  lVar28 = uVar103 * 5;
  auVar150 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar28 + 6)));
  auVar36 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar28 + 10)));
  auVar188._16_16_ = auVar36;
  auVar188._0_16_ = auVar150;
  auVar150 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar103 * 6 + 6)));
  auVar36 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar103 * 6 + 10)));
  auVar173 = vcvtdq2ps_avx(auVar188);
  auVar220._16_16_ = auVar36;
  auVar220._0_16_ = auVar150;
  auVar31 = vcvtdq2ps_avx(auVar220);
  auVar150 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar103 * 0xf + 6)));
  auVar36 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar103 * 0xf + 10)));
  auVar221._16_16_ = auVar36;
  auVar221._0_16_ = auVar150;
  auVar374 = vcvtdq2ps_avx(auVar221);
  lVar108 = (ulong)(byte)PVar25 * 0x10;
  auVar150 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar108 + 6)));
  auVar36 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar108 + 10)));
  auVar284._16_16_ = auVar36;
  auVar284._0_16_ = auVar150;
  auVar150 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar108 + uVar103 + 6)));
  auVar192 = vcvtdq2ps_avx(auVar284);
  auVar36 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar108 + uVar103 + 10)));
  auVar305._16_16_ = auVar36;
  auVar305._0_16_ = auVar150;
  auVar150 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar103 * 0x1a + 6)));
  auVar32 = vcvtdq2ps_avx(auVar305);
  auVar36 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar103 * 0x1a + 10)));
  auVar306._16_16_ = auVar36;
  auVar306._0_16_ = auVar150;
  auVar33 = vcvtdq2ps_avx(auVar306);
  auVar150 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar103 * 0x1b + 6)));
  auVar36 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar103 * 0x1b + 10)));
  auVar368._16_16_ = auVar36;
  auVar368._0_16_ = auVar150;
  auVar150 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar103 * 0x1c + 6)));
  auVar36 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar103 * 0x1c + 10)));
  auVar34 = vcvtdq2ps_avx(auVar368);
  auVar381._16_16_ = auVar36;
  auVar381._0_16_ = auVar150;
  auVar35 = vcvtdq2ps_avx(auVar381);
  auVar150 = vshufps_avx(auVar254,auVar254,0);
  auVar36 = vshufps_avx(auVar254,auVar254,0x55);
  auVar216 = vshufps_avx(auVar254,auVar254,0xaa);
  fVar205 = auVar216._0_4_;
  fVar146 = auVar216._4_4_;
  fVar227 = auVar216._8_4_;
  fVar176 = auVar216._12_4_;
  fVar204 = auVar36._0_4_;
  fVar140 = auVar36._4_4_;
  fVar228 = auVar36._8_4_;
  fVar142 = auVar36._12_4_;
  fVar229 = auVar150._0_4_;
  fVar230 = auVar150._4_4_;
  fVar231 = auVar150._8_4_;
  fVar232 = auVar150._12_4_;
  auVar401._0_4_ = fVar229 * auVar124._0_4_ + fVar204 * auVar173._0_4_ + fVar205 * auVar31._0_4_;
  auVar401._4_4_ = fVar230 * auVar124._4_4_ + fVar140 * auVar173._4_4_ + fVar146 * auVar31._4_4_;
  auVar401._8_4_ = fVar231 * auVar124._8_4_ + fVar228 * auVar173._8_4_ + fVar227 * auVar31._8_4_;
  auVar401._12_4_ = fVar232 * auVar124._12_4_ + fVar142 * auVar173._12_4_ + fVar176 * auVar31._12_4_
  ;
  auVar401._16_4_ = fVar229 * auVar124._16_4_ + fVar204 * auVar173._16_4_ + fVar205 * auVar31._16_4_
  ;
  auVar401._20_4_ = fVar230 * auVar124._20_4_ + fVar140 * auVar173._20_4_ + fVar146 * auVar31._20_4_
  ;
  auVar401._24_4_ = fVar231 * auVar124._24_4_ + fVar228 * auVar173._24_4_ + fVar227 * auVar31._24_4_
  ;
  auVar401._28_4_ = fVar142 + in_register_000015dc + in_register_0000151c;
  auVar390._0_4_ = fVar229 * auVar374._0_4_ + fVar204 * auVar192._0_4_ + auVar32._0_4_ * fVar205;
  auVar390._4_4_ = fVar230 * auVar374._4_4_ + fVar140 * auVar192._4_4_ + auVar32._4_4_ * fVar146;
  auVar390._8_4_ = fVar231 * auVar374._8_4_ + fVar228 * auVar192._8_4_ + auVar32._8_4_ * fVar227;
  auVar390._12_4_ = fVar232 * auVar374._12_4_ + fVar142 * auVar192._12_4_ + auVar32._12_4_ * fVar176
  ;
  auVar390._16_4_ = fVar229 * auVar374._16_4_ + fVar204 * auVar192._16_4_ + auVar32._16_4_ * fVar205
  ;
  auVar390._20_4_ = fVar230 * auVar374._20_4_ + fVar140 * auVar192._20_4_ + auVar32._20_4_ * fVar146
  ;
  auVar390._24_4_ = fVar231 * auVar374._24_4_ + fVar228 * auVar192._24_4_ + auVar32._24_4_ * fVar227
  ;
  auVar390._28_4_ = fVar142 + in_register_000015dc + in_register_0000159c;
  auVar260._0_4_ = fVar229 * auVar33._0_4_ + fVar204 * auVar34._0_4_ + auVar35._0_4_ * fVar205;
  auVar260._4_4_ = fVar230 * auVar33._4_4_ + fVar140 * auVar34._4_4_ + auVar35._4_4_ * fVar146;
  auVar260._8_4_ = fVar231 * auVar33._8_4_ + fVar228 * auVar34._8_4_ + auVar35._8_4_ * fVar227;
  auVar260._12_4_ = fVar232 * auVar33._12_4_ + fVar142 * auVar34._12_4_ + auVar35._12_4_ * fVar176;
  auVar260._16_4_ = fVar229 * auVar33._16_4_ + fVar204 * auVar34._16_4_ + auVar35._16_4_ * fVar205;
  auVar260._20_4_ = fVar230 * auVar33._20_4_ + fVar140 * auVar34._20_4_ + auVar35._20_4_ * fVar146;
  auVar260._24_4_ = fVar231 * auVar33._24_4_ + fVar228 * auVar34._24_4_ + auVar35._24_4_ * fVar227;
  auVar260._28_4_ = fVar232 + fVar142 + fVar176;
  auVar150 = vshufps_avx(auVar147,auVar147,0);
  auVar36 = vshufps_avx(auVar147,auVar147,0x55);
  auVar216 = vshufps_avx(auVar147,auVar147,0xaa);
  fVar205 = auVar216._0_4_;
  fVar146 = auVar216._4_4_;
  fVar227 = auVar216._8_4_;
  fVar176 = auVar216._12_4_;
  fVar230 = auVar36._0_4_;
  fVar231 = auVar36._4_4_;
  fVar232 = auVar36._8_4_;
  fVar246 = auVar36._12_4_;
  fVar204 = auVar173._28_4_ + auVar31._28_4_;
  fVar140 = auVar150._0_4_;
  fVar228 = auVar150._4_4_;
  fVar142 = auVar150._8_4_;
  fVar229 = auVar150._12_4_;
  auVar162._0_4_ = fVar140 * auVar124._0_4_ + fVar230 * auVar173._0_4_ + fVar205 * auVar31._0_4_;
  auVar162._4_4_ = fVar228 * auVar124._4_4_ + fVar231 * auVar173._4_4_ + fVar146 * auVar31._4_4_;
  auVar162._8_4_ = fVar142 * auVar124._8_4_ + fVar232 * auVar173._8_4_ + fVar227 * auVar31._8_4_;
  auVar162._12_4_ = fVar229 * auVar124._12_4_ + fVar246 * auVar173._12_4_ + fVar176 * auVar31._12_4_
  ;
  auVar162._16_4_ = fVar140 * auVar124._16_4_ + fVar230 * auVar173._16_4_ + fVar205 * auVar31._16_4_
  ;
  auVar162._20_4_ = fVar228 * auVar124._20_4_ + fVar231 * auVar173._20_4_ + fVar146 * auVar31._20_4_
  ;
  auVar162._24_4_ = fVar142 * auVar124._24_4_ + fVar232 * auVar173._24_4_ + fVar227 * auVar31._24_4_
  ;
  auVar162._28_4_ = auVar124._28_4_ + fVar204;
  auVar125._0_4_ = fVar140 * auVar374._0_4_ + auVar32._0_4_ * fVar205 + fVar230 * auVar192._0_4_;
  auVar125._4_4_ = fVar228 * auVar374._4_4_ + auVar32._4_4_ * fVar146 + fVar231 * auVar192._4_4_;
  auVar125._8_4_ = fVar142 * auVar374._8_4_ + auVar32._8_4_ * fVar227 + fVar232 * auVar192._8_4_;
  auVar125._12_4_ = fVar229 * auVar374._12_4_ + auVar32._12_4_ * fVar176 + fVar246 * auVar192._12_4_
  ;
  auVar125._16_4_ = fVar140 * auVar374._16_4_ + auVar32._16_4_ * fVar205 + fVar230 * auVar192._16_4_
  ;
  auVar125._20_4_ = fVar228 * auVar374._20_4_ + auVar32._20_4_ * fVar146 + fVar231 * auVar192._20_4_
  ;
  auVar125._24_4_ = fVar142 * auVar374._24_4_ + auVar32._24_4_ * fVar227 + fVar232 * auVar192._24_4_
  ;
  auVar125._28_4_ = auVar124._28_4_ + auVar32._28_4_ + auVar31._28_4_;
  auVar307._8_4_ = 0x7fffffff;
  auVar307._0_8_ = 0x7fffffff7fffffff;
  auVar307._12_4_ = 0x7fffffff;
  auVar307._16_4_ = 0x7fffffff;
  auVar307._20_4_ = 0x7fffffff;
  auVar307._24_4_ = 0x7fffffff;
  auVar307._28_4_ = 0x7fffffff;
  auVar331._8_4_ = 0x219392ef;
  auVar331._0_8_ = 0x219392ef219392ef;
  auVar331._12_4_ = 0x219392ef;
  auVar331._16_4_ = 0x219392ef;
  auVar331._20_4_ = 0x219392ef;
  auVar331._24_4_ = 0x219392ef;
  auVar331._28_4_ = 0x219392ef;
  auVar124 = vandps_avx(auVar401,auVar307);
  auVar124 = vcmpps_avx(auVar124,auVar331,1);
  auVar173 = vblendvps_avx(auVar401,auVar331,auVar124);
  auVar124 = vandps_avx(auVar390,auVar307);
  auVar124 = vcmpps_avx(auVar124,auVar331,1);
  auVar31 = vblendvps_avx(auVar390,auVar331,auVar124);
  auVar124 = vandps_avx(auVar260,auVar307);
  auVar124 = vcmpps_avx(auVar124,auVar331,1);
  auVar124 = vblendvps_avx(auVar260,auVar331,auVar124);
  auVar189._0_4_ = fVar140 * auVar33._0_4_ + fVar230 * auVar34._0_4_ + auVar35._0_4_ * fVar205;
  auVar189._4_4_ = fVar228 * auVar33._4_4_ + fVar231 * auVar34._4_4_ + auVar35._4_4_ * fVar146;
  auVar189._8_4_ = fVar142 * auVar33._8_4_ + fVar232 * auVar34._8_4_ + auVar35._8_4_ * fVar227;
  auVar189._12_4_ = fVar229 * auVar33._12_4_ + fVar246 * auVar34._12_4_ + auVar35._12_4_ * fVar176;
  auVar189._16_4_ = fVar140 * auVar33._16_4_ + fVar230 * auVar34._16_4_ + auVar35._16_4_ * fVar205;
  auVar189._20_4_ = fVar228 * auVar33._20_4_ + fVar231 * auVar34._20_4_ + auVar35._20_4_ * fVar146;
  auVar189._24_4_ = fVar142 * auVar33._24_4_ + fVar232 * auVar34._24_4_ + auVar35._24_4_ * fVar227;
  auVar189._28_4_ = fVar204 + auVar192._28_4_ + fVar176;
  auVar374 = vrcpps_avx(auVar173);
  fVar205 = auVar374._0_4_;
  fVar227 = auVar374._4_4_;
  auVar192._4_4_ = auVar173._4_4_ * fVar227;
  auVar192._0_4_ = auVar173._0_4_ * fVar205;
  fVar204 = auVar374._8_4_;
  auVar192._8_4_ = auVar173._8_4_ * fVar204;
  fVar228 = auVar374._12_4_;
  auVar192._12_4_ = auVar173._12_4_ * fVar228;
  fVar229 = auVar374._16_4_;
  auVar192._16_4_ = auVar173._16_4_ * fVar229;
  fVar230 = auVar374._20_4_;
  auVar192._20_4_ = auVar173._20_4_ * fVar230;
  fVar231 = auVar374._24_4_;
  auVar192._24_4_ = auVar173._24_4_ * fVar231;
  auVar192._28_4_ = auVar173._28_4_;
  auVar332._8_4_ = 0x3f800000;
  auVar332._0_8_ = 0x3f8000003f800000;
  auVar332._12_4_ = 0x3f800000;
  auVar332._16_4_ = 0x3f800000;
  auVar332._20_4_ = 0x3f800000;
  auVar332._24_4_ = 0x3f800000;
  auVar332._28_4_ = 0x3f800000;
  auVar32 = vsubps_avx(auVar332,auVar192);
  auVar192 = vrcpps_avx(auVar31);
  fVar205 = fVar205 + fVar205 * auVar32._0_4_;
  fVar227 = fVar227 + fVar227 * auVar32._4_4_;
  fVar204 = fVar204 + fVar204 * auVar32._8_4_;
  fVar228 = fVar228 + fVar228 * auVar32._12_4_;
  fVar229 = fVar229 + fVar229 * auVar32._16_4_;
  fVar230 = fVar230 + fVar230 * auVar32._20_4_;
  fVar231 = fVar231 + fVar231 * auVar32._24_4_;
  fVar232 = auVar192._0_4_;
  fVar246 = auVar192._4_4_;
  auVar173._4_4_ = fVar246 * auVar31._4_4_;
  auVar173._0_4_ = fVar232 * auVar31._0_4_;
  fVar247 = auVar192._8_4_;
  auVar173._8_4_ = fVar247 * auVar31._8_4_;
  fVar248 = auVar192._12_4_;
  auVar173._12_4_ = fVar248 * auVar31._12_4_;
  fVar249 = auVar192._16_4_;
  auVar173._16_4_ = fVar249 * auVar31._16_4_;
  fVar250 = auVar192._20_4_;
  auVar173._20_4_ = fVar250 * auVar31._20_4_;
  fVar251 = auVar192._24_4_;
  auVar173._24_4_ = fVar251 * auVar31._24_4_;
  auVar173._28_4_ = auVar31._28_4_;
  auVar31 = vsubps_avx(auVar332,auVar173);
  fVar232 = fVar232 + fVar232 * auVar31._0_4_;
  fVar246 = fVar246 + fVar246 * auVar31._4_4_;
  fVar247 = fVar247 + fVar247 * auVar31._8_4_;
  fVar248 = fVar248 + fVar248 * auVar31._12_4_;
  fVar249 = fVar249 + fVar249 * auVar31._16_4_;
  fVar250 = fVar250 + fVar250 * auVar31._20_4_;
  fVar251 = fVar251 + fVar251 * auVar31._24_4_;
  auVar173 = vrcpps_avx(auVar124);
  fVar252 = auVar173._0_4_;
  fVar268 = auVar173._4_4_;
  auVar33._4_4_ = fVar268 * auVar124._4_4_;
  auVar33._0_4_ = fVar252 * auVar124._0_4_;
  fVar270 = auVar173._8_4_;
  auVar33._8_4_ = fVar270 * auVar124._8_4_;
  fVar272 = auVar173._12_4_;
  auVar33._12_4_ = fVar272 * auVar124._12_4_;
  fVar274 = auVar173._16_4_;
  auVar33._16_4_ = fVar274 * auVar124._16_4_;
  fVar276 = auVar173._20_4_;
  auVar33._20_4_ = fVar276 * auVar124._20_4_;
  fVar278 = auVar173._24_4_;
  auVar33._24_4_ = fVar278 * auVar124._24_4_;
  auVar33._28_4_ = auVar124._28_4_;
  auVar124 = vsubps_avx(auVar332,auVar33);
  fVar252 = fVar252 + fVar252 * auVar124._0_4_;
  fVar268 = fVar268 + fVar268 * auVar124._4_4_;
  fVar270 = fVar270 + fVar270 * auVar124._8_4_;
  fVar272 = fVar272 + fVar272 * auVar124._12_4_;
  fVar274 = fVar274 + fVar274 * auVar124._16_4_;
  fVar276 = fVar276 + fVar276 * auVar124._20_4_;
  fVar278 = fVar278 + fVar278 * auVar124._24_4_;
  auVar150 = ZEXT416((uint)((*(float *)(ray + k * 4 + 0x70) - *(float *)(prim + lVar107 + 0x16)) *
                           *(float *)(prim + lVar107 + 0x1a)));
  auVar37 = vshufps_avx(auVar150,auVar150,0);
  auVar150._8_8_ = 0;
  auVar150._0_8_ = *(ulong *)(prim + uVar103 * 7 + 6);
  auVar150 = vpmovsxwd_avx(auVar150);
  auVar36._8_8_ = 0;
  auVar36._0_8_ = *(ulong *)(prim + uVar103 * 7 + 0xe);
  auVar36 = vpmovsxwd_avx(auVar36);
  auVar308._16_16_ = auVar36;
  auVar308._0_16_ = auVar150;
  auVar124 = vcvtdq2ps_avx(auVar308);
  auVar216._8_8_ = 0;
  auVar216._0_8_ = *(ulong *)(prim + uVar103 * 0xb + 6);
  auVar150 = vpmovsxwd_avx(auVar216);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar103 * 0xb + 0xe);
  auVar36 = vpmovsxwd_avx(auVar11);
  auVar333._16_16_ = auVar36;
  auVar333._0_16_ = auVar150;
  auVar173 = vcvtdq2ps_avx(auVar333);
  auVar173 = vsubps_avx(auVar173,auVar124);
  fVar146 = auVar37._0_4_;
  fVar176 = auVar37._4_4_;
  fVar140 = auVar37._8_4_;
  fVar142 = auVar37._12_4_;
  auVar37._8_8_ = 0;
  auVar37._0_8_ = *(ulong *)(prim + uVar103 * 9 + 6);
  auVar150 = vpmovsxwd_avx(auVar37);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar103 * 9 + 0xe);
  auVar36 = vpmovsxwd_avx(auVar12);
  auVar309._0_4_ = auVar173._0_4_ * fVar146 + auVar124._0_4_;
  auVar309._4_4_ = auVar173._4_4_ * fVar176 + auVar124._4_4_;
  auVar309._8_4_ = auVar173._8_4_ * fVar140 + auVar124._8_4_;
  auVar309._12_4_ = auVar173._12_4_ * fVar142 + auVar124._12_4_;
  auVar309._16_4_ = auVar173._16_4_ * fVar146 + auVar124._16_4_;
  auVar309._20_4_ = auVar173._20_4_ * fVar176 + auVar124._20_4_;
  auVar309._24_4_ = auVar173._24_4_ * fVar140 + auVar124._24_4_;
  auVar309._28_4_ = auVar173._28_4_ + auVar124._28_4_;
  auVar334._16_16_ = auVar36;
  auVar334._0_16_ = auVar150;
  auVar124 = vcvtdq2ps_avx(auVar334);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + uVar103 * 0xd + 6);
  auVar150 = vpmovsxwd_avx(auVar13);
  auVar184._8_8_ = 0;
  auVar184._0_8_ = *(ulong *)(prim + uVar103 * 0xd + 0xe);
  auVar36 = vpmovsxwd_avx(auVar184);
  auVar369._16_16_ = auVar36;
  auVar369._0_16_ = auVar150;
  auVar173 = vcvtdq2ps_avx(auVar369);
  auVar173 = vsubps_avx(auVar173,auVar124);
  auVar120._8_8_ = 0;
  auVar120._0_8_ = *(ulong *)(prim + uVar103 * 0x12 + 6);
  auVar150 = vpmovsxwd_avx(auVar120);
  auVar156._8_8_ = 0;
  auVar156._0_8_ = *(ulong *)(prim + uVar103 * 0x12 + 0xe);
  auVar36 = vpmovsxwd_avx(auVar156);
  auVar335._0_4_ = auVar124._0_4_ + auVar173._0_4_ * fVar146;
  auVar335._4_4_ = auVar124._4_4_ + auVar173._4_4_ * fVar176;
  auVar335._8_4_ = auVar124._8_4_ + auVar173._8_4_ * fVar140;
  auVar335._12_4_ = auVar124._12_4_ + auVar173._12_4_ * fVar142;
  auVar335._16_4_ = auVar124._16_4_ + auVar173._16_4_ * fVar146;
  auVar335._20_4_ = auVar124._20_4_ + auVar173._20_4_ * fVar176;
  auVar335._24_4_ = auVar124._24_4_ + auVar173._24_4_ * fVar140;
  auVar335._28_4_ = auVar124._28_4_ + auVar173._28_4_;
  auVar370._16_16_ = auVar36;
  auVar370._0_16_ = auVar150;
  auVar124 = vcvtdq2ps_avx(auVar370);
  uVar106 = (ulong)(uint)((int)lVar28 << 2);
  lVar107 = uVar103 * 2 + uVar106;
  auVar367._8_8_ = 0;
  auVar367._0_8_ = *(ulong *)(prim + lVar107 + 6);
  auVar150 = vpmovsxwd_avx(auVar367);
  auVar119._8_8_ = 0;
  auVar119._0_8_ = *(ulong *)(prim + lVar107 + 0xe);
  auVar36 = vpmovsxwd_avx(auVar119);
  auVar382._16_16_ = auVar36;
  auVar382._0_16_ = auVar150;
  auVar173 = vcvtdq2ps_avx(auVar382);
  auVar173 = vsubps_avx(auVar173,auVar124);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + uVar106 + 6);
  auVar150 = vpmovsxwd_avx(auVar14);
  auVar371._0_4_ = auVar124._0_4_ + auVar173._0_4_ * fVar146;
  auVar371._4_4_ = auVar124._4_4_ + auVar173._4_4_ * fVar176;
  auVar371._8_4_ = auVar124._8_4_ + auVar173._8_4_ * fVar140;
  auVar371._12_4_ = auVar124._12_4_ + auVar173._12_4_ * fVar142;
  auVar371._16_4_ = auVar124._16_4_ + auVar173._16_4_ * fVar146;
  auVar371._20_4_ = auVar124._20_4_ + auVar173._20_4_ * fVar176;
  auVar371._24_4_ = auVar124._24_4_ + auVar173._24_4_ * fVar140;
  auVar371._28_4_ = auVar124._28_4_ + auVar173._28_4_;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar106 + 0xe);
  auVar36 = vpmovsxwd_avx(auVar15);
  auVar383._16_16_ = auVar36;
  auVar383._0_16_ = auVar150;
  auVar122._8_8_ = 0;
  auVar122._0_8_ = *(ulong *)(prim + uVar103 * 0x18 + 6);
  auVar150 = vpmovsxwd_avx(auVar122);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar103 * 0x18 + 0xe);
  auVar36 = vpmovsxwd_avx(auVar16);
  auVar124 = vcvtdq2ps_avx(auVar383);
  auVar391._16_16_ = auVar36;
  auVar391._0_16_ = auVar150;
  auVar173 = vcvtdq2ps_avx(auVar391);
  auVar173 = vsubps_avx(auVar173,auVar124);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar103 * 0x1d + 6);
  auVar150 = vpmovsxwd_avx(auVar17);
  auVar384._0_4_ = auVar124._0_4_ + auVar173._0_4_ * fVar146;
  auVar384._4_4_ = auVar124._4_4_ + auVar173._4_4_ * fVar176;
  auVar384._8_4_ = auVar124._8_4_ + auVar173._8_4_ * fVar140;
  auVar384._12_4_ = auVar124._12_4_ + auVar173._12_4_ * fVar142;
  auVar384._16_4_ = auVar124._16_4_ + auVar173._16_4_ * fVar146;
  auVar384._20_4_ = auVar124._20_4_ + auVar173._20_4_ * fVar176;
  auVar384._24_4_ = auVar124._24_4_ + auVar173._24_4_ * fVar140;
  auVar384._28_4_ = auVar124._28_4_ + auVar173._28_4_;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + uVar103 * 0x1d + 0xe);
  auVar36 = vpmovsxwd_avx(auVar18);
  lVar107 = uVar103 + (ulong)(byte)PVar25 * 0x20;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + lVar107 + 6);
  auVar216 = vpmovsxwd_avx(auVar19);
  auVar392._16_16_ = auVar36;
  auVar392._0_16_ = auVar150;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + lVar107 + 0xe);
  auVar150 = vpmovsxwd_avx(auVar20);
  auVar402._16_16_ = auVar150;
  auVar402._0_16_ = auVar216;
  auVar124 = vcvtdq2ps_avx(auVar392);
  auVar173 = vcvtdq2ps_avx(auVar402);
  auVar173 = vsubps_avx(auVar173,auVar124);
  auVar393._0_4_ = auVar124._0_4_ + auVar173._0_4_ * fVar146;
  auVar393._4_4_ = auVar124._4_4_ + auVar173._4_4_ * fVar176;
  auVar393._8_4_ = auVar124._8_4_ + auVar173._8_4_ * fVar140;
  auVar393._12_4_ = auVar124._12_4_ + auVar173._12_4_ * fVar142;
  auVar393._16_4_ = auVar124._16_4_ + auVar173._16_4_ * fVar146;
  auVar393._20_4_ = auVar124._20_4_ + auVar173._20_4_ * fVar176;
  auVar393._24_4_ = auVar124._24_4_ + auVar173._24_4_ * fVar140;
  auVar393._28_4_ = auVar124._28_4_ + auVar173._28_4_;
  lVar107 = (ulong)(byte)PVar25 * 0x20 - uVar103;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *(ulong *)(prim + lVar107 + 6);
  auVar150 = vpmovsxwd_avx(auVar21);
  auVar22._8_8_ = 0;
  auVar22._0_8_ = *(ulong *)(prim + lVar107 + 0xe);
  auVar36 = vpmovsxwd_avx(auVar22);
  auVar403._16_16_ = auVar36;
  auVar403._0_16_ = auVar150;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = *(ulong *)(prim + uVar103 * 0x23 + 6);
  auVar150 = vpmovsxwd_avx(auVar23);
  auVar24._8_8_ = 0;
  auVar24._0_8_ = *(ulong *)(prim + uVar103 * 0x23 + 0xe);
  auVar36 = vpmovsxwd_avx(auVar24);
  auVar415._16_16_ = auVar36;
  auVar415._0_16_ = auVar150;
  auVar124 = vcvtdq2ps_avx(auVar403);
  auVar173 = vcvtdq2ps_avx(auVar415);
  auVar173 = vsubps_avx(auVar173,auVar124);
  auVar404._0_4_ = auVar124._0_4_ + auVar173._0_4_ * fVar146;
  auVar404._4_4_ = auVar124._4_4_ + auVar173._4_4_ * fVar176;
  auVar404._8_4_ = auVar124._8_4_ + auVar173._8_4_ * fVar140;
  auVar404._12_4_ = auVar124._12_4_ + auVar173._12_4_ * fVar142;
  auVar404._16_4_ = auVar124._16_4_ + auVar173._16_4_ * fVar146;
  auVar404._20_4_ = auVar124._20_4_ + auVar173._20_4_ * fVar176;
  auVar404._24_4_ = auVar124._24_4_ + auVar173._24_4_ * fVar140;
  auVar404._28_4_ = auVar124._28_4_ + fVar142;
  auVar124 = vsubps_avx(auVar309,auVar162);
  auVar281._0_4_ = fVar205 * auVar124._0_4_;
  auVar281._4_4_ = fVar227 * auVar124._4_4_;
  auVar281._8_4_ = fVar204 * auVar124._8_4_;
  auVar281._12_4_ = fVar228 * auVar124._12_4_;
  auVar34._16_4_ = fVar229 * auVar124._16_4_;
  auVar34._0_16_ = auVar281;
  auVar34._20_4_ = fVar230 * auVar124._20_4_;
  auVar34._24_4_ = fVar231 * auVar124._24_4_;
  auVar34._28_4_ = auVar124._28_4_;
  auVar124 = vsubps_avx(auVar335,auVar162);
  auVar206._0_4_ = fVar205 * auVar124._0_4_;
  auVar206._4_4_ = fVar227 * auVar124._4_4_;
  auVar206._8_4_ = fVar204 * auVar124._8_4_;
  auVar206._12_4_ = fVar228 * auVar124._12_4_;
  auVar35._16_4_ = fVar229 * auVar124._16_4_;
  auVar35._0_16_ = auVar206;
  auVar35._20_4_ = fVar230 * auVar124._20_4_;
  auVar35._24_4_ = fVar231 * auVar124._24_4_;
  auVar35._28_4_ = auVar374._28_4_ + auVar32._28_4_;
  auVar124 = vsubps_avx(auVar371,auVar125);
  auVar148._0_4_ = fVar232 * auVar124._0_4_;
  auVar148._4_4_ = fVar246 * auVar124._4_4_;
  auVar148._8_4_ = fVar247 * auVar124._8_4_;
  auVar148._12_4_ = fVar248 * auVar124._12_4_;
  auVar374._16_4_ = fVar249 * auVar124._16_4_;
  auVar374._0_16_ = auVar148;
  auVar374._20_4_ = fVar250 * auVar124._20_4_;
  auVar374._24_4_ = fVar251 * auVar124._24_4_;
  auVar374._28_4_ = auVar124._28_4_;
  auVar124 = vsubps_avx(auVar384,auVar125);
  auVar233._0_4_ = fVar232 * auVar124._0_4_;
  auVar233._4_4_ = fVar246 * auVar124._4_4_;
  auVar233._8_4_ = fVar247 * auVar124._8_4_;
  auVar233._12_4_ = fVar248 * auVar124._12_4_;
  auVar32._16_4_ = fVar249 * auVar124._16_4_;
  auVar32._0_16_ = auVar233;
  auVar32._20_4_ = fVar250 * auVar124._20_4_;
  auVar32._24_4_ = fVar251 * auVar124._24_4_;
  auVar32._28_4_ = auVar192._28_4_ + auVar31._28_4_;
  auVar124 = vsubps_avx(auVar393,auVar189);
  auVar112._0_4_ = fVar252 * auVar124._0_4_;
  auVar112._4_4_ = fVar268 * auVar124._4_4_;
  auVar112._8_4_ = fVar270 * auVar124._8_4_;
  auVar112._12_4_ = fVar272 * auVar124._12_4_;
  auVar31._16_4_ = fVar274 * auVar124._16_4_;
  auVar31._0_16_ = auVar112;
  auVar31._20_4_ = fVar276 * auVar124._20_4_;
  auVar31._24_4_ = fVar278 * auVar124._24_4_;
  auVar31._28_4_ = auVar124._28_4_;
  auVar124 = vsubps_avx(auVar404,auVar189);
  auVar179._0_4_ = fVar252 * auVar124._0_4_;
  auVar179._4_4_ = fVar268 * auVar124._4_4_;
  auVar179._8_4_ = fVar270 * auVar124._8_4_;
  auVar179._12_4_ = fVar272 * auVar124._12_4_;
  auVar38._16_4_ = fVar274 * auVar124._16_4_;
  auVar38._0_16_ = auVar179;
  auVar38._20_4_ = fVar276 * auVar124._20_4_;
  auVar38._24_4_ = fVar278 * auVar124._24_4_;
  auVar38._28_4_ = auVar124._28_4_;
  auVar150 = vpminsd_avx(auVar34._16_16_,auVar35._16_16_);
  auVar36 = vpminsd_avx(auVar281,auVar206);
  auVar336._16_16_ = auVar150;
  auVar336._0_16_ = auVar36;
  auVar150 = vpminsd_avx(auVar374._16_16_,auVar32._16_16_);
  auVar36 = vpminsd_avx(auVar148,auVar233);
  auVar394._16_16_ = auVar150;
  auVar394._0_16_ = auVar36;
  auVar124 = vmaxps_avx(auVar336,auVar394);
  auVar150 = vpminsd_avx(auVar31._16_16_,auVar38._16_16_);
  auVar36 = vpminsd_avx(auVar112,auVar179);
  auVar416._16_16_ = auVar150;
  auVar416._0_16_ = auVar36;
  uVar8 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar433._4_4_ = uVar8;
  auVar433._0_4_ = uVar8;
  auVar433._8_4_ = uVar8;
  auVar433._12_4_ = uVar8;
  auVar433._16_4_ = uVar8;
  auVar433._20_4_ = uVar8;
  auVar433._24_4_ = uVar8;
  auVar433._28_4_ = uVar8;
  auVar173 = vmaxps_avx(auVar416,auVar433);
  auVar124 = vmaxps_avx(auVar124,auVar173);
  local_300._4_4_ = auVar124._4_4_ * 0.99999964;
  local_300._0_4_ = auVar124._0_4_ * 0.99999964;
  local_300._8_4_ = auVar124._8_4_ * 0.99999964;
  local_300._12_4_ = auVar124._12_4_ * 0.99999964;
  local_300._16_4_ = auVar124._16_4_ * 0.99999964;
  local_300._20_4_ = auVar124._20_4_ * 0.99999964;
  local_300._24_4_ = auVar124._24_4_ * 0.99999964;
  local_300._28_4_ = auVar124._28_4_;
  auVar150 = vpmaxsd_avx(auVar34._16_16_,auVar35._16_16_);
  auVar36 = vpmaxsd_avx(auVar281,auVar206);
  auVar222._16_16_ = auVar150;
  auVar222._0_16_ = auVar36;
  auVar150 = vpmaxsd_avx(auVar374._16_16_,auVar32._16_16_);
  auVar36 = vpmaxsd_avx(auVar148,auVar233);
  auVar163._16_16_ = auVar150;
  auVar163._0_16_ = auVar36;
  auVar124 = vminps_avx(auVar222,auVar163);
  auVar150 = vpmaxsd_avx(auVar31._16_16_,auVar38._16_16_);
  auVar36 = vpmaxsd_avx(auVar112,auVar179);
  uVar8 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar190._4_4_ = uVar8;
  auVar190._0_4_ = uVar8;
  auVar190._8_4_ = uVar8;
  auVar190._12_4_ = uVar8;
  auVar190._16_4_ = uVar8;
  auVar190._20_4_ = uVar8;
  auVar190._24_4_ = uVar8;
  auVar190._28_4_ = uVar8;
  auVar126._16_16_ = auVar150;
  auVar126._0_16_ = auVar36;
  auVar173 = vminps_avx(auVar126,auVar190);
  auVar124 = vminps_avx(auVar124,auVar173);
  auVar373._4_4_ = auVar124._4_4_ * 1.0000004;
  auVar373._0_4_ = auVar124._0_4_ * 1.0000004;
  auVar373._8_4_ = auVar124._8_4_ * 1.0000004;
  auVar373._12_4_ = auVar124._12_4_ * 1.0000004;
  auVar373._16_4_ = auVar124._16_4_ * 1.0000004;
  auVar373._20_4_ = auVar124._20_4_ * 1.0000004;
  auVar373._24_4_ = auVar124._24_4_ * 1.0000004;
  auVar373._28_4_ = auVar124._28_4_;
  auVar124 = vcmpps_avx(local_300,auVar373,2);
  auVar150 = vpshufd_avx(ZEXT116((byte)PVar25),0);
  auVar164._16_16_ = auVar150;
  auVar164._0_16_ = auVar150;
  auVar173 = vcvtdq2ps_avx(auVar164);
  auVar173 = vcmpps_avx(_DAT_01faff40,auVar173,1);
  auVar124 = vandps_avx(auVar124,auVar173);
  uVar101 = vmovmskps_avx(auVar124);
  if (uVar101 == 0) {
    return;
  }
  auVar127._16_16_ = mm_lookupmask_ps._240_16_;
  auVar127._0_16_ = mm_lookupmask_ps._240_16_;
  uVar101 = uVar101 & 0xff;
  local_520 = vblendps_avx(auVar127,ZEXT832(0) << 0x20,0x80);
  local_a30 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  local_8b0 = prim;
LAB_011403d4:
  local_8a8 = (ulong)uVar101;
  lVar107 = 0;
  if (local_8a8 != 0) {
    for (; (uVar101 >> lVar107 & 1) == 0; lVar107 = lVar107 + 1) {
    }
  }
  uVar101 = *(uint *)(local_8b0 + 2);
  local_a28 = (ulong)*(uint *)(local_8b0 + lVar107 * 4 + 6);
  pGVar26 = (context->scene->geometries).items[uVar101].ptr;
  uVar103 = (ulong)*(uint *)(*(long *)&pGVar26->field_0x58 +
                            local_a28 *
                            pGVar26[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                            _M_i);
  fVar205 = (pGVar26->time_range).lower;
  fVar205 = pGVar26->fnumTimeSegments *
            ((*(float *)(ray + k * 4 + 0x70) - fVar205) / ((pGVar26->time_range).upper - fVar205));
  auVar150 = vroundss_avx(ZEXT416((uint)fVar205),ZEXT416((uint)fVar205),9);
  auVar150 = vminss_avx(auVar150,ZEXT416((uint)(pGVar26->fnumTimeSegments + -1.0)));
  auVar150 = vmaxss_avx(ZEXT816(0) << 0x20,auVar150);
  fVar205 = fVar205 - auVar150._0_4_;
  _Var27 = pGVar26[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar109 = (long)(int)auVar150._0_4_ * 0x38;
  lVar28 = *(long *)(_Var27 + 0x10 + lVar109);
  lVar108 = *(long *)(_Var27 + 0x38 + lVar109);
  lVar29 = *(long *)(_Var27 + 0x48 + lVar109);
  auVar150 = vshufps_avx(ZEXT416((uint)fVar205),ZEXT416((uint)fVar205),0);
  pfVar1 = (float *)(lVar108 + uVar103 * lVar29);
  fVar140 = auVar150._0_4_;
  fVar228 = auVar150._4_4_;
  fVar142 = auVar150._8_4_;
  fVar229 = auVar150._12_4_;
  pfVar2 = (float *)(lVar108 + (uVar103 + 1) * lVar29);
  pfVar3 = (float *)(lVar108 + (uVar103 + 2) * lVar29);
  pfVar4 = (float *)(lVar108 + lVar29 * (uVar103 + 3));
  lVar108 = *(long *)(_Var27 + lVar109);
  auVar150 = vshufps_avx(ZEXT416((uint)(1.0 - fVar205)),ZEXT416((uint)(1.0 - fVar205)),0);
  pfVar5 = (float *)(lVar108 + lVar28 * uVar103);
  fVar146 = auVar150._0_4_;
  fVar227 = auVar150._4_4_;
  fVar176 = auVar150._8_4_;
  fVar204 = auVar150._12_4_;
  pfVar6 = (float *)(lVar108 + lVar28 * (uVar103 + 1));
  pfVar7 = (float *)(lVar108 + lVar28 * (uVar103 + 2));
  auVar180._0_4_ = fVar140 * *pfVar1 + fVar146 * *pfVar5;
  auVar180._4_4_ = fVar228 * pfVar1[1] + fVar227 * pfVar5[1];
  auVar180._8_4_ = fVar142 * pfVar1[2] + fVar176 * pfVar5[2];
  auVar180._12_4_ = fVar229 * pfVar1[3] + fVar204 * pfVar5[3];
  auVar149._0_4_ = fVar146 * *pfVar6 + fVar140 * *pfVar2;
  auVar149._4_4_ = fVar227 * pfVar6[1] + fVar228 * pfVar2[1];
  auVar149._8_4_ = fVar176 * pfVar6[2] + fVar142 * pfVar2[2];
  auVar149._12_4_ = fVar204 * pfVar6[3] + fVar229 * pfVar2[3];
  pfVar1 = (float *)(lVar108 + lVar28 * (uVar103 + 3));
  auVar207._0_4_ = fVar146 * *pfVar7 + fVar140 * *pfVar3;
  auVar207._4_4_ = fVar227 * pfVar7[1] + fVar228 * pfVar3[1];
  auVar207._8_4_ = fVar176 * pfVar7[2] + fVar142 * pfVar3[2];
  auVar207._12_4_ = fVar204 * pfVar7[3] + fVar229 * pfVar3[3];
  auVar150 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                           0x1c);
  auVar36 = vinsertps_avx(auVar150,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  fVar205 = *(float *)(ray + k * 4 + 0x40);
  auVar389._4_4_ = fVar205;
  auVar389._0_4_ = fVar205;
  auVar389._8_4_ = fVar205;
  auVar389._12_4_ = fVar205;
  fStack_810 = fVar205;
  _local_820 = auVar389;
  fStack_80c = fVar205;
  fStack_808 = fVar205;
  fStack_804 = fVar205;
  auVar397 = ZEXT3264(_local_820);
  auVar255._0_4_ = fVar146 * *pfVar1 + fVar140 * *pfVar4;
  auVar255._4_4_ = fVar227 * pfVar1[1] + fVar228 * pfVar4[1];
  auVar255._8_4_ = fVar176 * pfVar1[2] + fVar142 * pfVar4[2];
  auVar255._12_4_ = fVar204 * pfVar1[3] + fVar229 * pfVar4[3];
  fVar146 = *(float *)(ray + k * 4 + 0x50);
  auVar400._4_4_ = fVar146;
  auVar400._0_4_ = fVar146;
  auVar400._8_4_ = fVar146;
  auVar400._12_4_ = fVar146;
  fStack_7f0 = fVar146;
  _local_800 = auVar400;
  fStack_7ec = fVar146;
  fStack_7e8 = fVar146;
  fStack_7e4 = fVar146;
  auVar405 = ZEXT3264(_local_800);
  auVar150 = vunpcklps_avx(auVar389,auVar400);
  fVar227 = *(float *)(ray + k * 4 + 0x60);
  auVar414._4_4_ = fVar227;
  auVar414._0_4_ = fVar227;
  auVar414._8_4_ = fVar227;
  auVar414._12_4_ = fVar227;
  fStack_830 = fVar227;
  _local_840 = auVar414;
  fStack_82c = fVar227;
  fStack_828 = fVar227;
  register0x0000155c = fVar227;
  _local_9b0 = vinsertps_avx(auVar150,auVar414,0x28);
  auVar375 = ZEXT1664(_local_9b0);
  auVar113._0_4_ = (auVar180._0_4_ + auVar149._0_4_ + auVar207._0_4_ + auVar255._0_4_) * 0.25;
  auVar113._4_4_ = (auVar180._4_4_ + auVar149._4_4_ + auVar207._4_4_ + auVar255._4_4_) * 0.25;
  auVar113._8_4_ = (auVar180._8_4_ + auVar149._8_4_ + auVar207._8_4_ + auVar255._8_4_) * 0.25;
  auVar113._12_4_ = (auVar180._12_4_ + auVar149._12_4_ + auVar207._12_4_ + auVar255._12_4_) * 0.25;
  auVar150 = vsubps_avx(auVar113,auVar36);
  auVar150 = vdpps_avx(auVar150,_local_9b0,0x7f);
  local_9c0 = vdpps_avx(_local_9b0,_local_9b0,0x7f);
  auVar388 = ZEXT1664(local_9c0);
  auVar216 = vrcpss_avx(local_9c0,local_9c0);
  fVar176 = auVar150._0_4_ * auVar216._0_4_ * (2.0 - local_9c0._0_4_ * auVar216._0_4_);
  auVar313 = ZEXT464((uint)fVar176);
  auVar216 = vshufps_avx(ZEXT416((uint)fVar176),ZEXT416((uint)fVar176),0);
  auVar234._0_4_ = auVar36._0_4_ + local_9b0._0_4_ * auVar216._0_4_;
  auVar234._4_4_ = auVar36._4_4_ + local_9b0._4_4_ * auVar216._4_4_;
  auVar234._8_4_ = auVar36._8_4_ + local_9b0._8_4_ * auVar216._8_4_;
  auVar234._12_4_ = auVar36._12_4_ + local_9b0._12_4_ * auVar216._12_4_;
  auVar150 = vblendps_avx(auVar234,_DAT_01f7aa10,8);
  auVar11 = vsubps_avx(auVar180,auVar150);
  auVar293 = ZEXT1664(auVar11);
  auVar37 = vsubps_avx(auVar207,auVar150);
  auVar12 = vsubps_avx(auVar149,auVar150);
  auVar13 = vsubps_avx(auVar255,auVar150);
  auVar150 = vshufps_avx(auVar11,auVar11,0);
  register0x00001250 = auVar150;
  _local_1e0 = auVar150;
  auVar150 = vshufps_avx(auVar11,auVar11,0x55);
  register0x00001250 = auVar150;
  _local_200 = auVar150;
  auVar150 = vshufps_avx(auVar11,auVar11,0xaa);
  register0x00001250 = auVar150;
  _local_220 = auVar150;
  auVar150 = vshufps_avx(auVar11,auVar11,0xff);
  register0x00001290 = auVar150;
  _local_240 = auVar150;
  auVar150 = vshufps_avx(auVar12,auVar12,0);
  register0x00001290 = auVar150;
  _local_400 = auVar150;
  auVar150 = vshufps_avx(auVar12,auVar12,0x55);
  register0x00001290 = auVar150;
  _local_260 = auVar150;
  auVar150 = vshufps_avx(auVar12,auVar12,0xaa);
  register0x00001290 = auVar150;
  _local_280 = auVar150;
  auVar150 = vshufps_avx(auVar12,auVar12,0xff);
  register0x00001290 = auVar150;
  _local_2a0 = auVar150;
  auVar150 = vshufps_avx(auVar37,auVar37,0);
  register0x00001290 = auVar150;
  _local_420 = auVar150;
  auVar150 = vshufps_avx(auVar37,auVar37,0x55);
  register0x00001290 = auVar150;
  _local_440 = auVar150;
  auVar150 = vshufps_avx(auVar37,auVar37,0xaa);
  register0x00001290 = auVar150;
  _local_460 = auVar150;
  auVar150 = vshufps_avx(auVar37,auVar37,0xff);
  register0x00001290 = auVar150;
  _local_480 = auVar150;
  auVar150 = vshufps_avx(auVar13,auVar13,0);
  register0x00001290 = auVar150;
  _local_4a0 = auVar150;
  auVar150 = vshufps_avx(auVar13,auVar13,0x55);
  register0x00001290 = auVar150;
  _local_4c0 = auVar150;
  auVar150 = vshufps_avx(auVar13,auVar13,0xaa);
  register0x00001290 = auVar150;
  _local_4e0 = auVar150;
  auVar150 = vshufps_avx(auVar13,auVar13,0xff);
  local_500._16_16_ = auVar150;
  local_500._0_16_ = auVar150;
  auVar150 = ZEXT416((uint)(fVar205 * fVar205 + fVar146 * fVar146 + fVar227 * fVar227));
  auVar150 = vshufps_avx(auVar150,auVar150,0);
  local_2c0._16_16_ = auVar150;
  local_2c0._0_16_ = auVar150;
  auVar267 = ZEXT3264(local_2c0);
  fVar205 = *(float *)(ray + k * 4 + 0x30);
  local_8d0 = ZEXT416((uint)fVar176);
  auVar150 = vshufps_avx(ZEXT416((uint)(fVar205 - fVar176)),ZEXT416((uint)(fVar205 - fVar176)),0);
  local_2e0._16_16_ = auVar150;
  local_2e0._0_16_ = auVar150;
  local_790 = vpshufd_avx(ZEXT416(uVar101),0);
  local_7a0 = vpshufd_avx(ZEXT416(*(uint *)(local_8b0 + lVar107 * 4 + 6)),0);
  register0x00001210 = auVar216;
  _local_a60 = auVar216;
  uVar111 = 0;
  uVar110 = 1;
  auVar128._8_4_ = 0x7fffffff;
  auVar128._0_8_ = 0x7fffffff7fffffff;
  auVar128._12_4_ = 0x7fffffff;
  auVar128._16_4_ = 0x7fffffff;
  auVar128._20_4_ = 0x7fffffff;
  auVar128._24_4_ = 0x7fffffff;
  auVar128._28_4_ = 0x7fffffff;
  local_540 = vandps_avx(local_2c0,auVar128);
  auVar150 = vsqrtss_avx(local_9c0,local_9c0);
  auVar36 = vsqrtss_avx(local_9c0,local_9c0);
  local_590 = ZEXT816(0x3f80000000000000);
  do {
    auVar243._8_4_ = 0x3f800000;
    auVar243._0_8_ = 0x3f8000003f800000;
    auVar243._12_4_ = 0x3f800000;
    auVar243._16_4_ = 0x3f800000;
    auVar243._20_4_ = 0x3f800000;
    auVar243._24_4_ = 0x3f800000;
    auVar243._28_4_ = 0x3f800000;
    auVar216 = vmovshdup_avx(local_590);
    auVar120 = vsubps_avx(auVar216,local_590);
    auVar216 = vshufps_avx(local_590,local_590,0);
    local_7e0._16_16_ = auVar216;
    local_7e0._0_16_ = auVar216;
    auVar184 = vshufps_avx(auVar120,auVar120,0);
    fVar145 = auVar184._0_4_;
    fVar174 = auVar184._4_4_;
    fVar175 = auVar184._8_4_;
    fVar177 = auVar184._12_4_;
    fVar178 = auVar216._0_4_;
    auVar223._0_4_ = fVar178 + fVar145 * 0.0;
    fVar201 = auVar216._4_4_;
    auVar223._4_4_ = fVar201 + fVar174 * 0.14285715;
    fVar202 = auVar216._8_4_;
    auVar223._8_4_ = fVar202 + fVar175 * 0.2857143;
    fVar203 = auVar216._12_4_;
    auVar223._12_4_ = fVar203 + fVar177 * 0.42857146;
    auVar223._16_4_ = fVar178 + fVar145 * 0.5714286;
    auVar223._20_4_ = fVar201 + fVar174 * 0.71428573;
    auVar223._24_4_ = fVar202 + fVar175 * 0.8571429;
    auVar223._28_4_ = fVar203 + fVar177;
    auVar124 = vsubps_avx(auVar243,auVar223);
    fVar146 = auVar124._0_4_;
    fVar227 = auVar124._4_4_;
    fVar176 = auVar124._8_4_;
    fVar204 = auVar124._12_4_;
    fVar140 = auVar124._16_4_;
    fVar228 = auVar124._20_4_;
    fVar142 = auVar124._24_4_;
    fVar232 = fVar146 * fVar146 * fVar146;
    fVar248 = fVar227 * fVar227 * fVar227;
    fVar252 = fVar176 * fVar176 * fVar176;
    fVar272 = fVar204 * fVar204 * fVar204;
    fVar276 = fVar140 * fVar140 * fVar140;
    fVar298 = fVar228 * fVar228 * fVar228;
    fVar301 = fVar142 * fVar142 * fVar142;
    fVar304 = auVar223._0_4_ * auVar223._0_4_ * auVar223._0_4_;
    fVar314 = auVar223._4_4_ * auVar223._4_4_ * auVar223._4_4_;
    fVar315 = auVar223._8_4_ * auVar223._8_4_ * auVar223._8_4_;
    fVar317 = auVar223._12_4_ * auVar223._12_4_ * auVar223._12_4_;
    fVar319 = auVar223._16_4_ * auVar223._16_4_ * auVar223._16_4_;
    fVar321 = auVar223._20_4_ * auVar223._20_4_ * auVar223._20_4_;
    fVar323 = auVar223._24_4_ * auVar223._24_4_ * auVar223._24_4_;
    fVar229 = auVar223._0_4_ * fVar146;
    fVar230 = auVar223._4_4_ * fVar227;
    fVar231 = auVar223._8_4_ * fVar176;
    fVar246 = auVar223._12_4_ * fVar204;
    fVar250 = auVar223._16_4_ * fVar140;
    fVar251 = auVar223._20_4_ * fVar228;
    fVar270 = auVar223._24_4_ * fVar142;
    fVar247 = auVar388._28_4_ + auVar405._28_4_;
    fVar365 = auVar313._28_4_ + auVar267._28_4_ + fVar247;
    fVar379 = fVar247 + auVar293._28_4_ + auVar397._28_4_ + auVar375._28_4_;
    fVar247 = fVar232 * 0.16666667;
    fVar249 = fVar248 * 0.16666667;
    fVar268 = fVar252 * 0.16666667;
    fVar274 = fVar272 * 0.16666667;
    fVar278 = fVar276 * 0.16666667;
    fVar299 = fVar298 * 0.16666667;
    fVar302 = fVar301 * 0.16666667;
    fVar325 = (fVar304 + fVar232 * 4.0 + fVar146 * fVar229 * 12.0 + auVar223._0_4_ * fVar229 * 6.0)
              * 0.16666667;
    fVar341 = (fVar314 + fVar248 * 4.0 + fVar227 * fVar230 * 12.0 + auVar223._4_4_ * fVar230 * 6.0)
              * 0.16666667;
    fVar345 = (fVar315 + fVar252 * 4.0 + fVar176 * fVar231 * 12.0 + auVar223._8_4_ * fVar231 * 6.0)
              * 0.16666667;
    fVar349 = (fVar317 + fVar272 * 4.0 + fVar204 * fVar246 * 12.0 + auVar223._12_4_ * fVar246 * 6.0)
              * 0.16666667;
    fVar353 = (fVar319 + fVar276 * 4.0 + fVar140 * fVar250 * 12.0 + auVar223._16_4_ * fVar250 * 6.0)
              * 0.16666667;
    fVar357 = (fVar321 + fVar298 * 4.0 + fVar228 * fVar251 * 12.0 + auVar223._20_4_ * fVar251 * 6.0)
              * 0.16666667;
    fVar361 = (fVar323 + fVar301 * 4.0 + fVar142 * fVar270 * 12.0 + auVar223._24_4_ * fVar270 * 6.0)
              * 0.16666667;
    fVar232 = (fVar304 * 4.0 + fVar232 + auVar223._0_4_ * fVar229 * 12.0 + fVar146 * fVar229 * 6.0)
              * 0.16666667;
    fVar248 = (fVar314 * 4.0 + fVar248 + auVar223._4_4_ * fVar230 * 12.0 + fVar227 * fVar230 * 6.0)
              * 0.16666667;
    fVar252 = (fVar315 * 4.0 + fVar252 + auVar223._8_4_ * fVar231 * 12.0 + fVar176 * fVar231 * 6.0)
              * 0.16666667;
    fVar272 = (fVar317 * 4.0 + fVar272 + auVar223._12_4_ * fVar246 * 12.0 + fVar204 * fVar246 * 6.0)
              * 0.16666667;
    fVar276 = (fVar319 * 4.0 + fVar276 + auVar223._16_4_ * fVar250 * 12.0 + fVar140 * fVar250 * 6.0)
              * 0.16666667;
    fVar298 = (fVar321 * 4.0 + fVar298 + auVar223._20_4_ * fVar251 * 12.0 + fVar228 * fVar251 * 6.0)
              * 0.16666667;
    fVar301 = (fVar323 * 4.0 + fVar301 + auVar223._24_4_ * fVar270 * 12.0 + fVar142 * fVar270 * 6.0)
              * 0.16666667;
    fVar304 = fVar304 * 0.16666667;
    fVar314 = fVar314 * 0.16666667;
    fVar315 = fVar315 * 0.16666667;
    fVar317 = fVar317 * 0.16666667;
    fVar319 = fVar319 * 0.16666667;
    fVar321 = fVar321 * 0.16666667;
    fVar323 = fVar323 * 0.16666667;
    fVar398 = auVar397._28_4_ + 12.0;
    fVar380 = fVar379 + 12.166667;
    fVar326 = (float)local_1e0._0_4_ * fVar247 +
              fVar325 * (float)local_400._0_4_ +
              fVar304 * (float)local_4a0._0_4_ + fVar232 * (float)local_420._0_4_;
    fVar342 = (float)local_1e0._4_4_ * fVar249 +
              fVar341 * (float)local_400._4_4_ +
              fVar314 * (float)local_4a0._4_4_ + fVar248 * (float)local_420._4_4_;
    fVar346 = fStack_1d8 * fVar268 +
              fVar345 * fStack_3f8 + fVar315 * fStack_498 + fVar252 * fStack_418;
    fVar350 = fStack_1d4 * fVar274 +
              fVar349 * fStack_3f4 + fVar317 * fStack_494 + fVar272 * fStack_414;
    fVar354 = fStack_1d0 * fVar278 +
              fVar353 * fStack_3f0 + fVar319 * fStack_490 + fVar276 * fStack_410;
    fVar358 = fStack_1cc * fVar299 +
              fVar357 * fStack_3ec + fVar321 * fStack_48c + fVar298 * fStack_40c;
    fVar362 = fStack_1c8 * fVar302 +
              fVar361 * fStack_3e8 + fVar323 * fStack_488 + fVar301 * fStack_408;
    fVar366 = fVar365 + fVar380;
    local_960 = (float)local_200._0_4_ * fVar247 +
                (float)local_260._0_4_ * fVar325 +
                fVar304 * (float)local_4c0._0_4_ + fVar232 * (float)local_440._0_4_;
    fStack_95c = (float)local_200._4_4_ * fVar249 +
                 (float)local_260._4_4_ * fVar341 +
                 fVar314 * (float)local_4c0._4_4_ + fVar248 * (float)local_440._4_4_;
    fStack_958 = fStack_1f8 * fVar268 +
                 fStack_258 * fVar345 + fVar315 * fStack_4b8 + fVar252 * fStack_438;
    fStack_954 = fStack_1f4 * fVar274 +
                 fStack_254 * fVar349 + fVar317 * fStack_4b4 + fVar272 * fStack_434;
    fStack_950 = fStack_1f0 * fVar278 +
                 fStack_250 * fVar353 + fVar319 * fStack_4b0 + fVar276 * fStack_430;
    fStack_94c = fStack_1ec * fVar299 +
                 fStack_24c * fVar357 + fVar321 * fStack_4ac + fVar298 * fStack_42c;
    fStack_948 = fStack_1e8 * fVar302 +
                 fStack_248 * fVar361 + fVar323 * fStack_4a8 + fVar301 * fStack_428;
    fStack_944 = fVar366 + fVar398 + 12.166667;
    local_940 = (float)local_220._0_4_ * fVar247 +
                (float)local_280._0_4_ * fVar325 +
                fVar304 * (float)local_4e0._0_4_ + fVar232 * (float)local_460._0_4_;
    fStack_93c = (float)local_220._4_4_ * fVar249 +
                 (float)local_280._4_4_ * fVar341 +
                 fVar314 * (float)local_4e0._4_4_ + fVar248 * (float)local_460._4_4_;
    fStack_938 = fStack_218 * fVar268 +
                 fStack_278 * fVar345 + fVar315 * fStack_4d8 + fVar252 * fStack_458;
    fStack_934 = fStack_214 * fVar274 +
                 fStack_274 * fVar349 + fVar317 * fStack_4d4 + fVar272 * fStack_454;
    fStack_930 = fStack_210 * fVar278 +
                 fStack_270 * fVar353 + fVar319 * fStack_4d0 + fVar276 * fStack_450;
    fStack_92c = fStack_20c * fVar299 +
                 fStack_26c * fVar357 + fVar321 * fStack_4cc + fVar298 * fStack_44c;
    fStack_928 = fStack_208 * fVar302 +
                 fStack_268 * fVar361 + fVar323 * fStack_4c8 + fVar301 * fStack_448;
    fStack_924 = fStack_944 + fVar398 + auVar405._28_4_ + 12.0;
    local_bc0._0_4_ =
         (float)local_240._0_4_ * fVar247 +
         (float)local_2a0._0_4_ * fVar325 +
         fVar232 * (float)local_480._0_4_ + local_500._0_4_ * fVar304;
    local_bc0._4_4_ =
         (float)local_240._4_4_ * fVar249 +
         (float)local_2a0._4_4_ * fVar341 +
         fVar248 * (float)local_480._4_4_ + local_500._4_4_ * fVar314;
    fStack_bb8 = fStack_238 * fVar268 +
                 fStack_298 * fVar345 + fVar252 * fStack_478 + local_500._8_4_ * fVar315;
    fStack_bb4 = fStack_234 * fVar274 +
                 fStack_294 * fVar349 + fVar272 * fStack_474 + local_500._12_4_ * fVar317;
    fStack_bb0 = fStack_230 * fVar278 +
                 fStack_290 * fVar353 + fVar276 * fStack_470 + local_500._16_4_ * fVar319;
    fStack_bac = fStack_22c * fVar299 +
                 fStack_28c * fVar357 + fVar298 * fStack_46c + local_500._20_4_ * fVar321;
    fStack_ba8 = fStack_228 * fVar302 +
                 fStack_288 * fVar361 + fVar301 * fStack_468 + local_500._24_4_ * fVar323;
    fStack_ba4 = auVar293._28_4_ + fVar365 + fVar379 + auVar313._28_4_;
    auVar39._4_4_ = auVar223._4_4_ * -auVar223._4_4_;
    auVar39._0_4_ = auVar223._0_4_ * -auVar223._0_4_;
    auVar39._8_4_ = auVar223._8_4_ * -auVar223._8_4_;
    auVar39._12_4_ = auVar223._12_4_ * -auVar223._12_4_;
    auVar39._16_4_ = auVar223._16_4_ * -auVar223._16_4_;
    auVar39._20_4_ = auVar223._20_4_ * -auVar223._20_4_;
    auVar39._24_4_ = auVar223._24_4_ * -auVar223._24_4_;
    auVar39._28_4_ = auVar223._28_4_;
    auVar40._4_4_ = fVar230 * 4.0;
    auVar40._0_4_ = fVar229 * 4.0;
    auVar40._8_4_ = fVar231 * 4.0;
    auVar40._12_4_ = fVar246 * 4.0;
    auVar40._16_4_ = fVar250 * 4.0;
    auVar40._20_4_ = fVar251 * 4.0;
    auVar40._24_4_ = fVar270 * 4.0;
    auVar40._28_4_ = auVar267._28_4_;
    auVar124 = vsubps_avx(auVar39,auVar40);
    fVar301 = fVar146 * -fVar146 * 0.5;
    fVar302 = fVar227 * -fVar227 * 0.5;
    fVar304 = fVar176 * -fVar176 * 0.5;
    fVar314 = fVar204 * -fVar204 * 0.5;
    fVar315 = fVar140 * -fVar140 * 0.5;
    fVar317 = fVar228 * -fVar228 * 0.5;
    fVar319 = fVar142 * -fVar142 * 0.5;
    fVar252 = auVar124._0_4_ * 0.5;
    fVar272 = auVar124._4_4_ * 0.5;
    fVar274 = auVar124._8_4_ * 0.5;
    fVar276 = auVar124._12_4_ * 0.5;
    fVar278 = auVar124._16_4_ * 0.5;
    fVar298 = auVar124._20_4_ * 0.5;
    fVar299 = auVar124._24_4_ * 0.5;
    fVar232 = (fVar146 * fVar146 + fVar229 * 4.0) * 0.5;
    fVar247 = (fVar227 * fVar227 + fVar230 * 4.0) * 0.5;
    fVar248 = (fVar176 * fVar176 + fVar231 * 4.0) * 0.5;
    fVar249 = (fVar204 * fVar204 + fVar246 * 4.0) * 0.5;
    fVar250 = (fVar140 * fVar140 + fVar250 * 4.0) * 0.5;
    fVar268 = (fVar228 * fVar228 + fVar251 * 4.0) * 0.5;
    fVar270 = (fVar142 * fVar142 + fVar270 * 4.0) * 0.5;
    fVar146 = auVar223._0_4_ * auVar223._0_4_ * 0.5;
    fVar227 = auVar223._4_4_ * auVar223._4_4_ * 0.5;
    fVar176 = auVar223._8_4_ * auVar223._8_4_ * 0.5;
    fVar204 = auVar223._12_4_ * auVar223._12_4_ * 0.5;
    fVar229 = auVar223._16_4_ * auVar223._16_4_ * 0.5;
    fVar230 = auVar223._20_4_ * auVar223._20_4_ * 0.5;
    fVar231 = auVar223._24_4_ * auVar223._24_4_ * 0.5;
    fVar380 = fStack_944 + fVar380;
    auVar216 = vpermilps_avx(ZEXT416((uint)(auVar120._0_4_ * 0.04761905)),0);
    fVar140 = auVar216._0_4_;
    fVar327 = fVar140 * ((float)local_1e0._0_4_ * fVar301 +
                        fVar252 * (float)local_400._0_4_ +
                        fVar232 * (float)local_420._0_4_ + fVar146 * (float)local_4a0._0_4_);
    fVar142 = auVar216._4_4_;
    fVar343 = fVar142 * ((float)local_1e0._4_4_ * fVar302 +
                        fVar272 * (float)local_400._4_4_ +
                        fVar247 * (float)local_420._4_4_ + fVar227 * (float)local_4a0._4_4_);
    auVar41._4_4_ = fVar343;
    auVar41._0_4_ = fVar327;
    fVar246 = auVar216._8_4_;
    fVar347 = fVar246 * (fStack_1d8 * fVar304 +
                        fVar274 * fStack_3f8 + fVar248 * fStack_418 + fVar176 * fStack_498);
    auVar41._8_4_ = fVar347;
    fVar251 = auVar216._12_4_;
    fVar351 = fVar251 * (fStack_1d4 * fVar314 +
                        fVar276 * fStack_3f4 + fVar249 * fStack_414 + fVar204 * fStack_494);
    auVar41._12_4_ = fVar351;
    fVar355 = fVar140 * (fStack_1d0 * fVar315 +
                        fVar278 * fStack_3f0 + fVar250 * fStack_410 + fVar229 * fStack_490);
    auVar41._16_4_ = fVar355;
    fVar359 = fVar142 * (fStack_1cc * fVar317 +
                        fVar298 * fStack_3ec + fVar268 * fStack_40c + fVar230 * fStack_48c);
    auVar41._20_4_ = fVar359;
    fVar363 = fVar246 * (fStack_1c8 * fVar319 +
                        fVar299 * fStack_3e8 + fVar270 * fStack_408 + fVar231 * fStack_488);
    auVar41._24_4_ = fVar363;
    auVar41._28_4_ = fVar380;
    fVar399 = fVar140 * ((float)local_200._0_4_ * fVar301 +
                        (float)local_260._0_4_ * fVar252 +
                        fVar232 * (float)local_440._0_4_ + fVar146 * (float)local_4c0._0_4_);
    fVar406 = fVar142 * ((float)local_200._4_4_ * fVar302 +
                        (float)local_260._4_4_ * fVar272 +
                        fVar247 * (float)local_440._4_4_ + fVar227 * (float)local_4c0._4_4_);
    auVar42._4_4_ = fVar406;
    auVar42._0_4_ = fVar399;
    fVar407 = fVar246 * (fStack_1f8 * fVar304 +
                        fStack_258 * fVar274 + fVar248 * fStack_438 + fVar176 * fStack_4b8);
    auVar42._8_4_ = fVar407;
    fVar408 = fVar251 * (fStack_1f4 * fVar314 +
                        fStack_254 * fVar276 + fVar249 * fStack_434 + fVar204 * fStack_4b4);
    auVar42._12_4_ = fVar408;
    fVar409 = fVar140 * (fStack_1f0 * fVar315 +
                        fStack_250 * fVar278 + fVar250 * fStack_430 + fVar229 * fStack_4b0);
    auVar42._16_4_ = fVar409;
    fVar410 = fVar142 * (fStack_1ec * fVar317 +
                        fStack_24c * fVar298 + fVar268 * fStack_42c + fVar230 * fStack_4ac);
    auVar42._20_4_ = fVar410;
    fVar411 = fVar246 * (fStack_1e8 * fVar319 +
                        fStack_248 * fVar299 + fVar270 * fStack_428 + fVar231 * fStack_4a8);
    auVar42._24_4_ = fVar411;
    auVar42._28_4_ = uStack_1c4;
    fVar412 = fVar140 * ((float)local_220._0_4_ * fVar301 +
                        fVar146 * (float)local_4e0._0_4_ + fVar232 * (float)local_460._0_4_ +
                        (float)local_280._0_4_ * fVar252);
    fVar420 = fVar142 * ((float)local_220._4_4_ * fVar302 +
                        fVar227 * (float)local_4e0._4_4_ + fVar247 * (float)local_460._4_4_ +
                        (float)local_280._4_4_ * fVar272);
    auVar43._4_4_ = fVar420;
    auVar43._0_4_ = fVar412;
    fVar422 = fVar246 * (fStack_218 * fVar304 +
                        fVar176 * fStack_4d8 + fVar248 * fStack_458 + fStack_278 * fVar274);
    auVar43._8_4_ = fVar422;
    fVar424 = fVar251 * (fStack_214 * fVar314 +
                        fVar204 * fStack_4d4 + fVar249 * fStack_454 + fStack_274 * fVar276);
    auVar43._12_4_ = fVar424;
    fVar426 = fVar140 * (fStack_210 * fVar315 +
                        fVar229 * fStack_4d0 + fVar250 * fStack_450 + fStack_270 * fVar278);
    auVar43._16_4_ = fVar426;
    fVar428 = fVar142 * (fStack_20c * fVar317 +
                        fVar230 * fStack_4cc + fVar268 * fStack_44c + fStack_26c * fVar298);
    auVar43._20_4_ = fVar428;
    fVar430 = fVar246 * (fStack_208 * fVar319 +
                        fVar231 * fStack_4c8 + fVar270 * fStack_448 + fStack_268 * fVar299);
    auVar43._24_4_ = fVar430;
    auVar43._28_4_ = uStack_1e4;
    fVar228 = fVar140 * ((float)local_240._0_4_ * fVar301 +
                        (float)local_2a0._0_4_ * fVar252 +
                        fVar146 * local_500._0_4_ + fVar232 * (float)local_480._0_4_);
    fVar232 = fVar142 * ((float)local_240._4_4_ * fVar302 +
                        (float)local_2a0._4_4_ * fVar272 +
                        fVar227 * local_500._4_4_ + fVar247 * (float)local_480._4_4_);
    auVar44._4_4_ = fVar232;
    auVar44._0_4_ = fVar228;
    fVar247 = fVar246 * (fStack_238 * fVar304 +
                        fStack_298 * fVar274 + fVar176 * local_500._8_4_ + fVar248 * fStack_478);
    auVar44._8_4_ = fVar247;
    fVar252 = fVar251 * (fStack_234 * fVar314 +
                        fStack_294 * fVar276 + fVar204 * local_500._12_4_ + fVar249 * fStack_474);
    auVar44._12_4_ = fVar252;
    fVar140 = fVar140 * (fStack_230 * fVar315 +
                        fStack_290 * fVar278 + fVar229 * local_500._16_4_ + fVar250 * fStack_470);
    auVar44._16_4_ = fVar140;
    fVar142 = fVar142 * (fStack_22c * fVar317 +
                        fStack_28c * fVar298 + fVar230 * local_500._20_4_ + fVar268 * fStack_46c);
    auVar44._20_4_ = fVar142;
    fVar246 = fVar246 * (fStack_228 * fVar319 +
                        fStack_288 * fVar299 + fVar231 * local_500._24_4_ + fVar270 * fStack_468);
    auVar44._24_4_ = fVar246;
    auVar44._28_4_ = fVar251;
    auVar97._4_4_ = fStack_95c;
    auVar97._0_4_ = local_960;
    auVar97._8_4_ = fStack_958;
    auVar97._12_4_ = fStack_954;
    auVar97._16_4_ = fStack_950;
    auVar97._20_4_ = fStack_94c;
    auVar97._24_4_ = fStack_948;
    auVar97._28_4_ = fStack_944;
    auVar124 = vperm2f128_avx(auVar97,auVar97,1);
    auVar124 = vshufps_avx(auVar124,auVar97,0x30);
    auVar374 = vshufps_avx(auVar97,auVar124,0x29);
    auVar98._4_4_ = fStack_93c;
    auVar98._0_4_ = local_940;
    auVar98._8_4_ = fStack_938;
    auVar98._12_4_ = fStack_934;
    auVar98._16_4_ = fStack_930;
    auVar98._20_4_ = fStack_92c;
    auVar98._24_4_ = fStack_928;
    auVar98._28_4_ = fStack_924;
    auVar124 = vperm2f128_avx(auVar98,auVar98,1);
    auVar124 = vshufps_avx(auVar124,auVar98,0x30);
    local_a20 = vshufps_avx(auVar98,auVar124,0x29);
    auVar173 = vsubps_avx(_local_bc0,auVar44);
    auVar124 = vperm2f128_avx(auVar173,auVar173,1);
    auVar124 = vshufps_avx(auVar124,auVar173,0x30);
    auVar192 = vshufps_avx(auVar173,auVar124,0x29);
    local_660 = vsubps_avx(auVar374,auVar97);
    local_640 = vsubps_avx(local_a20,auVar98);
    fVar227 = local_660._0_4_;
    fVar229 = local_660._4_4_;
    auVar45._4_4_ = fVar420 * fVar229;
    auVar45._0_4_ = fVar412 * fVar227;
    fVar248 = local_660._8_4_;
    auVar45._8_4_ = fVar422 * fVar248;
    fVar270 = local_660._12_4_;
    auVar45._12_4_ = fVar424 * fVar270;
    fVar299 = local_660._16_4_;
    auVar45._16_4_ = fVar426 * fVar299;
    fVar317 = local_660._20_4_;
    auVar45._20_4_ = fVar428 * fVar317;
    fVar345 = local_660._24_4_;
    auVar45._24_4_ = fVar430 * fVar345;
    auVar45._28_4_ = auVar173._28_4_;
    fVar176 = local_640._0_4_;
    fVar230 = local_640._4_4_;
    auVar46._4_4_ = fVar406 * fVar230;
    auVar46._0_4_ = fVar399 * fVar176;
    fVar249 = local_640._8_4_;
    auVar46._8_4_ = fVar407 * fVar249;
    fVar272 = local_640._12_4_;
    auVar46._12_4_ = fVar408 * fVar272;
    fVar301 = local_640._16_4_;
    auVar46._16_4_ = fVar409 * fVar301;
    fVar319 = local_640._20_4_;
    auVar46._20_4_ = fVar410 * fVar319;
    fVar349 = local_640._24_4_;
    auVar46._24_4_ = fVar411 * fVar349;
    auVar46._28_4_ = auVar124._28_4_;
    auVar31 = vsubps_avx(auVar46,auVar45);
    auVar93._4_4_ = fVar342;
    auVar93._0_4_ = fVar326;
    auVar93._8_4_ = fVar346;
    auVar93._12_4_ = fVar350;
    auVar93._16_4_ = fVar354;
    auVar93._20_4_ = fVar358;
    auVar93._24_4_ = fVar362;
    auVar93._28_4_ = fVar366;
    auVar124 = vperm2f128_avx(auVar93,auVar93,1);
    auVar124 = vshufps_avx(auVar124,auVar93,0x30);
    auVar32 = vshufps_avx(auVar93,auVar124,0x29);
    local_6e0 = vsubps_avx(auVar32,auVar93);
    auVar47._4_4_ = fVar343 * fVar230;
    auVar47._0_4_ = fVar327 * fVar176;
    auVar47._8_4_ = fVar347 * fVar249;
    auVar47._12_4_ = fVar351 * fVar272;
    auVar47._16_4_ = fVar355 * fVar301;
    auVar47._20_4_ = fVar359 * fVar319;
    auVar47._24_4_ = fVar363 * fVar349;
    auVar47._28_4_ = auVar32._28_4_;
    fVar204 = local_6e0._0_4_;
    fVar231 = local_6e0._4_4_;
    auVar48._4_4_ = fVar420 * fVar231;
    auVar48._0_4_ = fVar412 * fVar204;
    fVar250 = local_6e0._8_4_;
    auVar48._8_4_ = fVar422 * fVar250;
    fVar274 = local_6e0._12_4_;
    auVar48._12_4_ = fVar424 * fVar274;
    fVar302 = local_6e0._16_4_;
    auVar48._16_4_ = fVar426 * fVar302;
    fVar321 = local_6e0._20_4_;
    auVar48._20_4_ = fVar428 * fVar321;
    fVar353 = local_6e0._24_4_;
    auVar48._24_4_ = fVar430 * fVar353;
    auVar48._28_4_ = fVar366;
    auVar34 = vsubps_avx(auVar48,auVar47);
    auVar49._4_4_ = fVar406 * fVar231;
    auVar49._0_4_ = fVar399 * fVar204;
    auVar49._8_4_ = fVar407 * fVar250;
    auVar49._12_4_ = fVar408 * fVar274;
    auVar49._16_4_ = fVar409 * fVar302;
    auVar49._20_4_ = fVar410 * fVar321;
    auVar49._24_4_ = fVar411 * fVar353;
    auVar49._28_4_ = fVar366;
    auVar50._4_4_ = fVar343 * fVar229;
    auVar50._0_4_ = fVar327 * fVar227;
    auVar50._8_4_ = fVar347 * fVar248;
    auVar50._12_4_ = fVar351 * fVar270;
    auVar50._16_4_ = fVar355 * fVar299;
    auVar50._20_4_ = fVar359 * fVar317;
    auVar50._24_4_ = fVar363 * fVar345;
    auVar50._28_4_ = uStack_204;
    auVar35 = vsubps_avx(auVar50,auVar49);
    fVar146 = auVar35._28_4_;
    auVar165._0_4_ = fVar204 * fVar204 + fVar227 * fVar227 + fVar176 * fVar176;
    auVar165._4_4_ = fVar231 * fVar231 + fVar229 * fVar229 + fVar230 * fVar230;
    auVar165._8_4_ = fVar250 * fVar250 + fVar248 * fVar248 + fVar249 * fVar249;
    auVar165._12_4_ = fVar274 * fVar274 + fVar270 * fVar270 + fVar272 * fVar272;
    auVar165._16_4_ = fVar302 * fVar302 + fVar299 * fVar299 + fVar301 * fVar301;
    auVar165._20_4_ = fVar321 * fVar321 + fVar317 * fVar317 + fVar319 * fVar319;
    auVar165._24_4_ = fVar353 * fVar353 + fVar345 * fVar345 + fVar349 * fVar349;
    auVar165._28_4_ = fVar146 + fVar146 + auVar31._28_4_;
    auVar124 = vrcpps_avx(auVar165);
    fVar268 = auVar124._0_4_;
    fVar276 = auVar124._4_4_;
    auVar51._4_4_ = fVar276 * auVar165._4_4_;
    auVar51._0_4_ = fVar268 * auVar165._0_4_;
    fVar278 = auVar124._8_4_;
    auVar51._8_4_ = fVar278 * auVar165._8_4_;
    fVar298 = auVar124._12_4_;
    auVar51._12_4_ = fVar298 * auVar165._12_4_;
    fVar304 = auVar124._16_4_;
    auVar51._16_4_ = fVar304 * auVar165._16_4_;
    fVar314 = auVar124._20_4_;
    auVar51._20_4_ = fVar314 * auVar165._20_4_;
    fVar315 = auVar124._24_4_;
    auVar51._24_4_ = fVar315 * auVar165._24_4_;
    auVar51._28_4_ = uStack_204;
    auVar434._8_4_ = 0x3f800000;
    auVar434._0_8_ = 0x3f8000003f800000;
    auVar434._12_4_ = 0x3f800000;
    auVar434._16_4_ = 0x3f800000;
    auVar434._20_4_ = 0x3f800000;
    auVar434._24_4_ = 0x3f800000;
    auVar434._28_4_ = 0x3f800000;
    auVar38 = vsubps_avx(auVar434,auVar51);
    fVar268 = auVar38._0_4_ * fVar268 + fVar268;
    fVar276 = auVar38._4_4_ * fVar276 + fVar276;
    fVar278 = auVar38._8_4_ * fVar278 + fVar278;
    fVar298 = auVar38._12_4_ * fVar298 + fVar298;
    fVar304 = auVar38._16_4_ * fVar304 + fVar304;
    fVar314 = auVar38._20_4_ * fVar314 + fVar314;
    fVar315 = auVar38._24_4_ * fVar315 + fVar315;
    auVar173 = vperm2f128_avx(auVar42,auVar42,1);
    auVar173 = vshufps_avx(auVar173,auVar42,0x30);
    auVar33 = vshufps_avx(auVar42,auVar173,0x29);
    auVar173 = vperm2f128_avx(auVar43,auVar43,1);
    auVar173 = vshufps_avx(auVar173,auVar43,0x30);
    local_7c0 = vshufps_avx(auVar43,auVar173,0x29);
    fVar413 = local_7c0._0_4_;
    fVar421 = local_7c0._4_4_;
    auVar52._4_4_ = fVar421 * fVar229;
    auVar52._0_4_ = fVar413 * fVar227;
    fVar423 = local_7c0._8_4_;
    auVar52._8_4_ = fVar423 * fVar248;
    fVar425 = local_7c0._12_4_;
    auVar52._12_4_ = fVar425 * fVar270;
    fVar427 = local_7c0._16_4_;
    auVar52._16_4_ = fVar427 * fVar299;
    fVar429 = local_7c0._20_4_;
    auVar52._20_4_ = fVar429 * fVar317;
    fVar431 = local_7c0._24_4_;
    auVar52._24_4_ = fVar431 * fVar345;
    auVar52._28_4_ = auVar173._28_4_;
    fVar432 = auVar33._0_4_;
    fVar438 = auVar33._4_4_;
    auVar53._4_4_ = fVar438 * fVar230;
    auVar53._0_4_ = fVar432 * fVar176;
    fVar439 = auVar33._8_4_;
    auVar53._8_4_ = fVar439 * fVar249;
    fVar440 = auVar33._12_4_;
    auVar53._12_4_ = fVar440 * fVar272;
    fVar441 = auVar33._16_4_;
    auVar53._16_4_ = fVar441 * fVar301;
    fVar442 = auVar33._20_4_;
    auVar53._20_4_ = fVar442 * fVar319;
    fVar443 = auVar33._24_4_;
    auVar53._24_4_ = fVar443 * fVar349;
    auVar53._28_4_ = uStack_1c4;
    auVar373 = vsubps_avx(auVar53,auVar52);
    auVar173 = vperm2f128_avx(auVar41,auVar41,1);
    auVar173 = vshufps_avx(auVar173,auVar41,0x30);
    local_9e0 = vshufps_avx(auVar41,auVar173,0x29);
    fVar328 = local_9e0._0_4_;
    fVar344 = local_9e0._4_4_;
    auVar54._4_4_ = fVar344 * fVar230;
    auVar54._0_4_ = fVar328 * fVar176;
    fVar348 = local_9e0._8_4_;
    auVar54._8_4_ = fVar348 * fVar249;
    fVar352 = local_9e0._12_4_;
    auVar54._12_4_ = fVar352 * fVar272;
    fVar356 = local_9e0._16_4_;
    auVar54._16_4_ = fVar356 * fVar301;
    fVar360 = local_9e0._20_4_;
    auVar54._20_4_ = fVar360 * fVar319;
    fVar364 = local_9e0._24_4_;
    auVar54._24_4_ = fVar364 * fVar349;
    auVar54._28_4_ = auVar173._28_4_;
    auVar55._4_4_ = fVar421 * fVar231;
    auVar55._0_4_ = fVar413 * fVar204;
    auVar55._8_4_ = fVar423 * fVar250;
    auVar55._12_4_ = fVar425 * fVar274;
    auVar55._16_4_ = fVar427 * fVar302;
    auVar55._20_4_ = fVar429 * fVar321;
    uVar105 = local_7c0._28_4_;
    auVar55._24_4_ = fVar431 * fVar353;
    auVar55._28_4_ = uVar105;
    auVar173 = vsubps_avx(auVar55,auVar54);
    auVar56._4_4_ = fVar438 * fVar231;
    auVar56._0_4_ = fVar432 * fVar204;
    auVar56._8_4_ = fVar439 * fVar250;
    auVar56._12_4_ = fVar440 * fVar274;
    auVar56._16_4_ = fVar441 * fVar302;
    auVar56._20_4_ = fVar442 * fVar321;
    auVar56._24_4_ = fVar443 * fVar353;
    auVar56._28_4_ = uVar105;
    auVar57._4_4_ = fVar344 * fVar229;
    auVar57._0_4_ = fVar328 * fVar227;
    auVar57._8_4_ = fVar348 * fVar248;
    auVar57._12_4_ = fVar352 * fVar270;
    auVar57._16_4_ = fVar356 * fVar299;
    auVar57._20_4_ = fVar360 * fVar317;
    fVar379 = auVar33._28_4_;
    auVar57._24_4_ = fVar364 * fVar345;
    auVar57._28_4_ = fVar379;
    auVar125 = vsubps_avx(auVar57,auVar56);
    auVar58._4_4_ =
         (auVar31._4_4_ * auVar31._4_4_ +
         auVar34._4_4_ * auVar34._4_4_ + auVar35._4_4_ * auVar35._4_4_) * fVar276;
    auVar58._0_4_ =
         (auVar31._0_4_ * auVar31._0_4_ +
         auVar34._0_4_ * auVar34._0_4_ + auVar35._0_4_ * auVar35._0_4_) * fVar268;
    auVar58._8_4_ =
         (auVar31._8_4_ * auVar31._8_4_ +
         auVar34._8_4_ * auVar34._8_4_ + auVar35._8_4_ * auVar35._8_4_) * fVar278;
    auVar58._12_4_ =
         (auVar31._12_4_ * auVar31._12_4_ +
         auVar34._12_4_ * auVar34._12_4_ + auVar35._12_4_ * auVar35._12_4_) * fVar298;
    auVar58._16_4_ =
         (auVar31._16_4_ * auVar31._16_4_ +
         auVar34._16_4_ * auVar34._16_4_ + auVar35._16_4_ * auVar35._16_4_) * fVar304;
    auVar58._20_4_ =
         (auVar31._20_4_ * auVar31._20_4_ +
         auVar34._20_4_ * auVar34._20_4_ + auVar35._20_4_ * auVar35._20_4_) * fVar314;
    auVar58._24_4_ =
         (auVar31._24_4_ * auVar31._24_4_ +
         auVar34._24_4_ * auVar34._24_4_ + auVar35._24_4_ * auVar35._24_4_) * fVar315;
    auVar58._28_4_ = auVar31._28_4_ + auVar34._28_4_ + fVar146;
    auVar59._4_4_ =
         (auVar373._4_4_ * auVar373._4_4_ +
         auVar173._4_4_ * auVar173._4_4_ + auVar125._4_4_ * auVar125._4_4_) * fVar276;
    auVar59._0_4_ =
         (auVar373._0_4_ * auVar373._0_4_ +
         auVar173._0_4_ * auVar173._0_4_ + auVar125._0_4_ * auVar125._0_4_) * fVar268;
    auVar59._8_4_ =
         (auVar373._8_4_ * auVar373._8_4_ +
         auVar173._8_4_ * auVar173._8_4_ + auVar125._8_4_ * auVar125._8_4_) * fVar278;
    auVar59._12_4_ =
         (auVar373._12_4_ * auVar373._12_4_ +
         auVar173._12_4_ * auVar173._12_4_ + auVar125._12_4_ * auVar125._12_4_) * fVar298;
    auVar59._16_4_ =
         (auVar373._16_4_ * auVar373._16_4_ +
         auVar173._16_4_ * auVar173._16_4_ + auVar125._16_4_ * auVar125._16_4_) * fVar304;
    auVar59._20_4_ =
         (auVar373._20_4_ * auVar373._20_4_ +
         auVar173._20_4_ * auVar173._20_4_ + auVar125._20_4_ * auVar125._20_4_) * fVar314;
    auVar59._24_4_ =
         (auVar373._24_4_ * auVar373._24_4_ +
         auVar173._24_4_ * auVar173._24_4_ + auVar125._24_4_ * auVar125._24_4_) * fVar315;
    auVar59._28_4_ = auVar38._28_4_ + auVar124._28_4_;
    auVar173 = vmaxps_avx(auVar58,auVar59);
    auVar124 = vperm2f128_avx(_local_bc0,_local_bc0,1);
    auVar124 = vshufps_avx(auVar124,_local_bc0,0x30);
    auVar34 = vshufps_avx(_local_bc0,auVar124,0x29);
    auVar129._0_4_ = (float)local_bc0._0_4_ + fVar228;
    auVar129._4_4_ = (float)local_bc0._4_4_ + fVar232;
    auVar129._8_4_ = fStack_bb8 + fVar247;
    auVar129._12_4_ = fStack_bb4 + fVar252;
    auVar129._16_4_ = fStack_bb0 + fVar140;
    auVar129._20_4_ = fStack_bac + fVar142;
    auVar129._24_4_ = fStack_ba8 + fVar246;
    auVar129._28_4_ = fStack_ba4 + fVar251;
    auVar124 = vmaxps_avx(_local_bc0,auVar129);
    auVar31 = vmaxps_avx(auVar192,auVar34);
    auVar124 = vmaxps_avx(auVar124,auVar31);
    auVar31 = vrsqrtps_avx(auVar165);
    fVar146 = auVar31._0_4_;
    fVar140 = auVar31._4_4_;
    fVar228 = auVar31._8_4_;
    fVar142 = auVar31._12_4_;
    fVar232 = auVar31._16_4_;
    fVar246 = auVar31._20_4_;
    fVar247 = auVar31._24_4_;
    auVar60._4_4_ = fVar140 * fVar140 * fVar140 * auVar165._4_4_ * 0.5;
    auVar60._0_4_ = fVar146 * fVar146 * fVar146 * auVar165._0_4_ * 0.5;
    auVar60._8_4_ = fVar228 * fVar228 * fVar228 * auVar165._8_4_ * 0.5;
    auVar60._12_4_ = fVar142 * fVar142 * fVar142 * auVar165._12_4_ * 0.5;
    auVar60._16_4_ = fVar232 * fVar232 * fVar232 * auVar165._16_4_ * 0.5;
    auVar60._20_4_ = fVar246 * fVar246 * fVar246 * auVar165._20_4_ * 0.5;
    auVar60._24_4_ = fVar247 * fVar247 * fVar247 * auVar165._24_4_ * 0.5;
    auVar60._28_4_ = auVar165._28_4_;
    auVar61._4_4_ = fVar140 * 1.5;
    auVar61._0_4_ = fVar146 * 1.5;
    auVar61._8_4_ = fVar228 * 1.5;
    auVar61._12_4_ = fVar142 * 1.5;
    auVar61._16_4_ = fVar232 * 1.5;
    auVar61._20_4_ = fVar246 * 1.5;
    auVar61._24_4_ = fVar247 * 1.5;
    auVar61._28_4_ = auVar31._28_4_;
    local_560 = vsubps_avx(auVar61,auVar60);
    auVar35 = vsubps_avx(ZEXT832(0) << 0x20,auVar97);
    auVar38 = vsubps_avx(ZEXT832(0) << 0x20,auVar98);
    fVar140 = auVar38._0_4_;
    fVar232 = auVar38._4_4_;
    fVar251 = auVar38._8_4_;
    fVar276 = auVar38._12_4_;
    fVar304 = auVar38._16_4_;
    fVar323 = auVar38._20_4_;
    fVar357 = auVar38._24_4_;
    fVar228 = auVar35._0_4_;
    fVar246 = auVar35._4_4_;
    fVar252 = auVar35._8_4_;
    fVar278 = auVar35._12_4_;
    fVar314 = auVar35._16_4_;
    fVar325 = auVar35._20_4_;
    fVar361 = auVar35._24_4_;
    auVar94._4_4_ = fVar342;
    auVar94._0_4_ = fVar326;
    auVar94._8_4_ = fVar346;
    auVar94._12_4_ = fVar350;
    auVar94._16_4_ = fVar354;
    auVar94._20_4_ = fVar358;
    auVar94._24_4_ = fVar362;
    auVar94._28_4_ = fVar366;
    auVar126 = ZEXT832(0) << 0x20;
    auVar373 = vsubps_avx(auVar126,auVar94);
    fVar142 = auVar373._0_4_;
    fVar247 = auVar373._4_4_;
    fVar268 = auVar373._8_4_;
    fVar298 = auVar373._12_4_;
    fVar315 = auVar373._16_4_;
    fVar341 = auVar373._20_4_;
    fVar365 = auVar373._24_4_;
    auVar417._0_4_ =
         (float)local_820._0_4_ * fVar142 +
         (float)local_800._0_4_ * fVar228 + (float)local_840._0_4_ * fVar140;
    auVar417._4_4_ =
         (float)local_820._4_4_ * fVar247 +
         (float)local_800._4_4_ * fVar246 + (float)local_840._4_4_ * fVar232;
    auVar417._8_4_ = fStack_818 * fVar268 + fStack_7f8 * fVar252 + fStack_838 * fVar251;
    auVar417._12_4_ = fStack_814 * fVar298 + fStack_7f4 * fVar278 + fStack_834 * fVar276;
    auVar417._16_4_ = fStack_810 * fVar315 + fStack_7f0 * fVar314 + fStack_830 * fVar304;
    auVar417._20_4_ = fStack_80c * fVar341 + fStack_7ec * fVar325 + fStack_82c * fVar323;
    auVar417._24_4_ = fStack_808 * fVar365 + fStack_7e8 * fVar361 + fStack_828 * fVar357;
    auVar417._28_4_ = fVar379 + auVar125._28_4_ + auVar31._28_4_;
    auVar435._0_4_ = fVar142 * fVar142 + fVar228 * fVar228 + fVar140 * fVar140;
    auVar435._4_4_ = fVar247 * fVar247 + fVar246 * fVar246 + fVar232 * fVar232;
    auVar435._8_4_ = fVar268 * fVar268 + fVar252 * fVar252 + fVar251 * fVar251;
    auVar435._12_4_ = fVar298 * fVar298 + fVar278 * fVar278 + fVar276 * fVar276;
    auVar435._16_4_ = fVar315 * fVar315 + fVar314 * fVar314 + fVar304 * fVar304;
    auVar435._20_4_ = fVar341 * fVar341 + fVar325 * fVar325 + fVar323 * fVar323;
    auVar435._24_4_ = fVar365 * fVar365 + fVar361 * fVar361 + fVar357 * fVar357;
    auVar435._28_4_ = fStack_924 + fStack_924 + fVar379;
    fVar253 = local_560._0_4_;
    fVar269 = local_560._4_4_;
    fVar271 = local_560._8_4_;
    fVar273 = local_560._12_4_;
    fVar275 = local_560._16_4_;
    fVar277 = local_560._20_4_;
    fVar279 = local_560._24_4_;
    fVar280 = fStack_7e4 + local_640._28_4_;
    local_6c0._0_4_ =
         (float)local_820._0_4_ * fVar204 * fVar253 +
         fVar253 * fVar227 * (float)local_800._0_4_ + (float)local_840._0_4_ * fVar253 * fVar176;
    local_6c0._4_4_ =
         (float)local_820._4_4_ * fVar231 * fVar269 +
         fVar269 * fVar229 * (float)local_800._4_4_ + (float)local_840._4_4_ * fVar269 * fVar230;
    fStack_6b8 = fStack_818 * fVar250 * fVar271 +
                 fVar271 * fVar248 * fStack_7f8 + fStack_838 * fVar271 * fVar249;
    fStack_6b4 = fStack_814 * fVar274 * fVar273 +
                 fVar273 * fVar270 * fStack_7f4 + fStack_834 * fVar273 * fVar272;
    fStack_6b0 = fStack_810 * fVar302 * fVar275 +
                 fVar275 * fVar299 * fStack_7f0 + fStack_830 * fVar275 * fVar301;
    fStack_6ac = fStack_80c * fVar321 * fVar277 +
                 fVar277 * fVar317 * fStack_7ec + fStack_82c * fVar277 * fVar319;
    fStack_6a8 = fStack_808 * fVar353 * fVar279 +
                 fVar279 * fVar345 * fStack_7e8 + fStack_828 * fVar279 * fVar349;
    fVar146 = fStack_804 + fVar280;
    local_a00._0_4_ =
         fVar142 * fVar204 * fVar253 + fVar253 * fVar227 * fVar228 + fVar253 * fVar176 * fVar140;
    local_a00._4_4_ =
         fVar247 * fVar231 * fVar269 + fVar269 * fVar229 * fVar246 + fVar269 * fVar230 * fVar232;
    local_a00._8_4_ =
         fVar268 * fVar250 * fVar271 + fVar271 * fVar248 * fVar252 + fVar271 * fVar249 * fVar251;
    local_a00._12_4_ =
         fVar298 * fVar274 * fVar273 + fVar273 * fVar270 * fVar278 + fVar273 * fVar272 * fVar276;
    local_a00._16_4_ =
         fVar315 * fVar302 * fVar275 + fVar275 * fVar299 * fVar314 + fVar275 * fVar301 * fVar304;
    local_a00._20_4_ =
         fVar341 * fVar321 * fVar277 + fVar277 * fVar317 * fVar325 + fVar277 * fVar319 * fVar323;
    local_a00._24_4_ =
         fVar365 * fVar353 * fVar279 + fVar279 * fVar345 * fVar361 + fVar279 * fVar349 * fVar357;
    local_a00._28_4_ = fStack_7e4 + fVar146;
    auVar62._4_4_ = (float)local_6c0._4_4_ * local_a00._4_4_;
    auVar62._0_4_ = (float)local_6c0._0_4_ * (float)local_a00._0_4_;
    auVar62._8_4_ = fStack_6b8 * local_a00._8_4_;
    auVar62._12_4_ = fStack_6b4 * local_a00._12_4_;
    auVar62._16_4_ = fStack_6b0 * local_a00._16_4_;
    auVar62._20_4_ = fStack_6ac * local_a00._20_4_;
    auVar62._24_4_ = fStack_6a8 * local_a00._24_4_;
    auVar62._28_4_ = fVar146;
    auVar31 = vsubps_avx(auVar417,auVar62);
    auVar63._4_4_ = local_a00._4_4_ * local_a00._4_4_;
    auVar63._0_4_ = (float)local_a00._0_4_ * (float)local_a00._0_4_;
    auVar63._8_4_ = local_a00._8_4_ * local_a00._8_4_;
    auVar63._12_4_ = local_a00._12_4_ * local_a00._12_4_;
    auVar63._16_4_ = local_a00._16_4_ * local_a00._16_4_;
    auVar63._20_4_ = local_a00._20_4_ * local_a00._20_4_;
    auVar63._24_4_ = local_a00._24_4_ * local_a00._24_4_;
    auVar63._28_4_ = fStack_7e4;
    local_5e0 = vsubps_avx(auVar435,auVar63);
    local_620 = vsqrtps_avx(auVar173);
    fVar146 = (local_620._0_4_ + auVar124._0_4_) * 1.0000002;
    fVar379 = (local_620._4_4_ + auVar124._4_4_) * 1.0000002;
    fVar398 = (local_620._8_4_ + auVar124._8_4_) * 1.0000002;
    fVar139 = (local_620._12_4_ + auVar124._12_4_) * 1.0000002;
    fVar141 = (local_620._16_4_ + auVar124._16_4_) * 1.0000002;
    fVar143 = (local_620._20_4_ + auVar124._20_4_) * 1.0000002;
    fVar144 = (local_620._24_4_ + auVar124._24_4_) * 1.0000002;
    auVar64._4_4_ = fVar379 * fVar379;
    auVar64._0_4_ = fVar146 * fVar146;
    auVar64._8_4_ = fVar398 * fVar398;
    auVar64._12_4_ = fVar139 * fVar139;
    auVar64._16_4_ = fVar141 * fVar141;
    auVar64._20_4_ = fVar143 * fVar143;
    auVar64._24_4_ = fVar144 * fVar144;
    auVar64._28_4_ = local_620._28_4_ + auVar124._28_4_;
    fVar379 = auVar31._0_4_ + auVar31._0_4_;
    fVar398 = auVar31._4_4_ + auVar31._4_4_;
    local_980._0_8_ = CONCAT44(fVar398,fVar379);
    local_980._8_4_ = auVar31._8_4_ + auVar31._8_4_;
    local_980._12_4_ = auVar31._12_4_ + auVar31._12_4_;
    local_980._16_4_ = auVar31._16_4_ + auVar31._16_4_;
    local_980._20_4_ = auVar31._20_4_ + auVar31._20_4_;
    local_980._24_4_ = auVar31._24_4_ + auVar31._24_4_;
    fVar146 = auVar31._28_4_;
    local_980._28_4_ = fVar146 + fVar146;
    auVar31 = vsubps_avx(local_5e0,auVar64);
    local_360._4_4_ = (float)local_6c0._4_4_ * (float)local_6c0._4_4_;
    local_360._0_4_ = (float)local_6c0._0_4_ * (float)local_6c0._0_4_;
    local_360._8_4_ = fStack_6b8 * fStack_6b8;
    local_360._12_4_ = fStack_6b4 * fStack_6b4;
    local_360._16_4_ = fStack_6b0 * fStack_6b0;
    local_360._20_4_ = fStack_6ac * fStack_6ac;
    local_360._24_4_ = fStack_6a8 * fStack_6a8;
    local_360._28_4_ = local_5e0._28_4_;
    auVar397 = ZEXT3264(local_360);
    local_580 = vsubps_avx(local_2c0,local_360);
    auVar375 = ZEXT3264(local_580);
    local_600._4_4_ = fVar398 * fVar398;
    local_600._0_4_ = fVar379 * fVar379;
    local_600._8_4_ = local_980._8_4_ * local_980._8_4_;
    local_600._12_4_ = local_980._12_4_ * local_980._12_4_;
    local_600._16_4_ = local_980._16_4_ * local_980._16_4_;
    local_600._20_4_ = local_980._20_4_ * local_980._20_4_;
    local_600._24_4_ = local_980._24_4_ * local_980._24_4_;
    local_600._28_4_ = fVar146;
    fVar139 = local_580._0_4_;
    local_6a0._0_4_ = fVar139 * 4.0;
    fVar141 = local_580._4_4_;
    local_6a0._4_4_ = fVar141 * 4.0;
    fVar143 = local_580._8_4_;
    fStack_698 = fVar143 * 4.0;
    fVar144 = local_580._12_4_;
    fStack_694 = fVar144 * 4.0;
    fVar376 = local_580._16_4_;
    fStack_690 = fVar376 * 4.0;
    fVar377 = local_580._20_4_;
    fStack_68c = fVar377 * 4.0;
    fVar378 = local_580._24_4_;
    fStack_688 = fVar378 * 4.0;
    fStack_684 = 4.0;
    auVar65._4_4_ = auVar31._4_4_ * (float)local_6a0._4_4_;
    auVar65._0_4_ = auVar31._0_4_ * (float)local_6a0._0_4_;
    auVar65._8_4_ = auVar31._8_4_ * fStack_698;
    auVar65._12_4_ = auVar31._12_4_ * fStack_694;
    auVar65._16_4_ = auVar31._16_4_ * fStack_690;
    auVar65._20_4_ = auVar31._20_4_ * fStack_68c;
    auVar65._24_4_ = auVar31._24_4_ * fStack_688;
    auVar65._28_4_ = 0x40800000;
    auVar125 = vsubps_avx(local_600,auVar65);
    auVar124 = vcmpps_avx(auVar125,auVar126,5);
    fStack_6a4 = fStack_804 + fVar280;
    fVar146 = local_580._28_4_;
    if ((((((((auVar124 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar124 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar124 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar124 >> 0x7f,0) == '\0') &&
          (auVar124 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar124 >> 0xbf,0) == '\0') &&
        (auVar124 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar124[0x1f])
    {
      auVar337._8_4_ = 0x7f800000;
      auVar337._0_8_ = 0x7f8000007f800000;
      auVar337._12_4_ = 0x7f800000;
      auVar337._16_4_ = 0x7f800000;
      auVar337._20_4_ = 0x7f800000;
      auVar337._24_4_ = 0x7f800000;
      auVar337._28_4_ = 0x7f800000;
      auVar436._8_4_ = 0xff800000;
      auVar436._0_8_ = 0xff800000ff800000;
      auVar436._12_4_ = 0xff800000;
      auVar436._16_4_ = 0xff800000;
      auVar436._20_4_ = 0xff800000;
      auVar436._24_4_ = 0xff800000;
      auVar436._28_4_ = 0xff800000;
    }
    else {
      auVar173 = vcmpps_avx(auVar125,auVar126,5);
      auVar126 = vsqrtps_avx(auVar125);
      auVar285._0_4_ = fVar139 + fVar139;
      auVar285._4_4_ = fVar141 + fVar141;
      auVar285._8_4_ = fVar143 + fVar143;
      auVar285._12_4_ = fVar144 + fVar144;
      auVar285._16_4_ = fVar376 + fVar376;
      auVar285._20_4_ = fVar377 + fVar377;
      auVar285._24_4_ = fVar378 + fVar378;
      auVar285._28_4_ = fVar146 + fVar146;
      auVar125 = vrcpps_avx(auVar285);
      fVar280 = auVar125._0_4_;
      fVar294 = auVar125._4_4_;
      auVar66._4_4_ = auVar285._4_4_ * fVar294;
      auVar66._0_4_ = auVar285._0_4_ * fVar280;
      fVar295 = auVar125._8_4_;
      auVar66._8_4_ = auVar285._8_4_ * fVar295;
      fVar296 = auVar125._12_4_;
      auVar66._12_4_ = auVar285._12_4_ * fVar296;
      fVar297 = auVar125._16_4_;
      auVar66._16_4_ = auVar285._16_4_ * fVar297;
      fVar300 = auVar125._20_4_;
      auVar66._20_4_ = auVar285._20_4_ * fVar300;
      fVar303 = auVar125._24_4_;
      auVar66._24_4_ = auVar285._24_4_ * fVar303;
      auVar66._28_4_ = auVar285._28_4_;
      auVar338._8_4_ = 0x3f800000;
      auVar338._0_8_ = 0x3f8000003f800000;
      auVar338._12_4_ = 0x3f800000;
      auVar338._16_4_ = 0x3f800000;
      auVar338._20_4_ = 0x3f800000;
      auVar338._24_4_ = 0x3f800000;
      auVar338._28_4_ = 0x3f800000;
      auVar162 = vsubps_avx(auVar338,auVar66);
      fVar280 = fVar280 + fVar280 * auVar162._0_4_;
      fVar294 = fVar294 + fVar294 * auVar162._4_4_;
      fVar295 = fVar295 + fVar295 * auVar162._8_4_;
      fVar296 = fVar296 + fVar296 * auVar162._12_4_;
      fVar297 = fVar297 + fVar297 * auVar162._16_4_;
      fVar300 = fVar300 + fVar300 * auVar162._20_4_;
      fVar303 = fVar303 + fVar303 * auVar162._24_4_;
      auVar310._0_8_ = CONCAT44(fVar398,fVar379) ^ 0x8000000080000000;
      auVar310._8_4_ = -local_980._8_4_;
      auVar310._12_4_ = -local_980._12_4_;
      auVar310._16_4_ = -local_980._16_4_;
      auVar310._20_4_ = -local_980._20_4_;
      auVar310._24_4_ = -local_980._24_4_;
      auVar310._28_4_ = -local_980._28_4_;
      auVar163 = vsubps_avx(auVar310,auVar126);
      fVar379 = auVar163._0_4_ * fVar280;
      fVar398 = auVar163._4_4_ * fVar294;
      auVar67._4_4_ = fVar398;
      auVar67._0_4_ = fVar379;
      fVar316 = auVar163._8_4_ * fVar295;
      auVar67._8_4_ = fVar316;
      fVar318 = auVar163._12_4_ * fVar296;
      auVar67._12_4_ = fVar318;
      fVar320 = auVar163._16_4_ * fVar297;
      auVar67._16_4_ = fVar320;
      fVar322 = auVar163._20_4_ * fVar300;
      auVar67._20_4_ = fVar322;
      fVar324 = auVar163._24_4_ * fVar303;
      auVar67._24_4_ = fVar324;
      auVar67._28_4_ = auVar163._28_4_;
      auVar126 = vsubps_avx(auVar126,local_980);
      fVar280 = auVar126._0_4_ * fVar280;
      fVar294 = auVar126._4_4_ * fVar294;
      auVar68._4_4_ = fVar294;
      auVar68._0_4_ = fVar280;
      fVar295 = auVar126._8_4_ * fVar295;
      auVar68._8_4_ = fVar295;
      fVar296 = auVar126._12_4_ * fVar296;
      auVar68._12_4_ = fVar296;
      fVar297 = auVar126._16_4_ * fVar297;
      auVar68._16_4_ = fVar297;
      fVar300 = auVar126._20_4_ * fVar300;
      auVar68._20_4_ = fVar300;
      fVar303 = auVar126._24_4_ * fVar303;
      auVar68._24_4_ = fVar303;
      auVar68._28_4_ = auVar126._28_4_;
      local_320 = fVar253 * ((float)local_a00._0_4_ + (float)local_6c0._0_4_ * fVar379);
      fStack_31c = fVar269 * (local_a00._4_4_ + (float)local_6c0._4_4_ * fVar398);
      fStack_318 = fVar271 * (local_a00._8_4_ + fStack_6b8 * fVar316);
      fStack_314 = fVar273 * (local_a00._12_4_ + fStack_6b4 * fVar318);
      fStack_310 = fVar275 * (local_a00._16_4_ + fStack_6b0 * fVar320);
      fStack_30c = fVar277 * (local_a00._20_4_ + fStack_6ac * fVar322);
      fStack_308 = fVar279 * (local_a00._24_4_ + fStack_6a8 * fVar324);
      fStack_304 = local_a00._28_4_ + auVar125._28_4_ + auVar162._28_4_;
      auVar286._8_4_ = 0x7fffffff;
      auVar286._0_8_ = 0x7fffffff7fffffff;
      auVar286._12_4_ = 0x7fffffff;
      auVar286._16_4_ = 0x7fffffff;
      auVar286._20_4_ = 0x7fffffff;
      auVar286._24_4_ = 0x7fffffff;
      auVar286._28_4_ = 0x7fffffff;
      auVar125 = vandps_avx(local_360,auVar286);
      auVar126 = vmaxps_avx(local_540,auVar125);
      auVar69._4_4_ = auVar126._4_4_ * 1.9073486e-06;
      auVar69._0_4_ = auVar126._0_4_ * 1.9073486e-06;
      auVar69._8_4_ = auVar126._8_4_ * 1.9073486e-06;
      auVar69._12_4_ = auVar126._12_4_ * 1.9073486e-06;
      auVar69._16_4_ = auVar126._16_4_ * 1.9073486e-06;
      auVar69._20_4_ = auVar126._20_4_ * 1.9073486e-06;
      auVar69._24_4_ = auVar126._24_4_ * 1.9073486e-06;
      auVar69._28_4_ = auVar126._28_4_;
      auVar125 = vandps_avx(local_580,auVar286);
      auVar125 = vcmpps_avx(auVar125,auVar69,1);
      auVar339._8_4_ = 0x7f800000;
      auVar339._0_8_ = 0x7f8000007f800000;
      auVar339._12_4_ = 0x7f800000;
      auVar339._16_4_ = 0x7f800000;
      auVar339._20_4_ = 0x7f800000;
      auVar339._24_4_ = 0x7f800000;
      auVar339._28_4_ = 0x7f800000;
      auVar337 = vblendvps_avx(auVar339,auVar67,auVar173);
      local_340 = fVar253 * ((float)local_a00._0_4_ + (float)local_6c0._0_4_ * fVar280);
      fStack_33c = fVar269 * (local_a00._4_4_ + (float)local_6c0._4_4_ * fVar294);
      fStack_338 = fVar271 * (local_a00._8_4_ + fStack_6b8 * fVar295);
      fStack_334 = fVar273 * (local_a00._12_4_ + fStack_6b4 * fVar296);
      fStack_330 = fVar275 * (local_a00._16_4_ + fStack_6b0 * fVar297);
      fStack_32c = fVar277 * (local_a00._20_4_ + fStack_6ac * fVar300);
      fStack_328 = fVar279 * (local_a00._24_4_ + fStack_6a8 * fVar303);
      fStack_324 = local_a00._28_4_ + auVar126._28_4_;
      auVar287._8_4_ = 0xff800000;
      auVar287._0_8_ = 0xff800000ff800000;
      auVar287._12_4_ = 0xff800000;
      auVar287._16_4_ = 0xff800000;
      auVar287._20_4_ = 0xff800000;
      auVar287._24_4_ = 0xff800000;
      auVar287._28_4_ = 0xff800000;
      auVar436 = vblendvps_avx(auVar287,auVar68,auVar173);
      auVar126 = auVar173 & auVar125;
      if ((((((((auVar126 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar126 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar126 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar126 >> 0x7f,0) != '\0') ||
            (auVar126 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar126 >> 0xbf,0) != '\0') ||
          (auVar126 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar126[0x1f] < '\0') {
        auVar124 = vandps_avx(auVar125,auVar173);
        auVar216 = vpackssdw_avx(auVar124._0_16_,auVar124._16_16_);
        auVar125 = vcmpps_avx(auVar31,ZEXT832(0) << 0x20,2);
        auVar418._8_4_ = 0xff800000;
        auVar418._0_8_ = 0xff800000ff800000;
        auVar418._12_4_ = 0xff800000;
        auVar418._16_4_ = 0xff800000;
        auVar418._20_4_ = 0xff800000;
        auVar418._24_4_ = 0xff800000;
        auVar418._28_4_ = 0xff800000;
        auVar444._8_4_ = 0x7f800000;
        auVar444._0_8_ = 0x7f8000007f800000;
        auVar444._12_4_ = 0x7f800000;
        auVar444._16_4_ = 0x7f800000;
        auVar444._20_4_ = 0x7f800000;
        auVar444._24_4_ = 0x7f800000;
        auVar444._28_4_ = 0x7f800000;
        auVar31 = vblendvps_avx(auVar444,auVar418,auVar125);
        auVar184 = vpmovsxwd_avx(auVar216);
        auVar216 = vpunpckhwd_avx(auVar216,auVar216);
        auVar266._16_16_ = auVar216;
        auVar266._0_16_ = auVar184;
        auVar337 = vblendvps_avx(auVar337,auVar31,auVar266);
        auVar31 = vblendvps_avx(auVar418,auVar444,auVar125);
        auVar436 = vblendvps_avx(auVar436,auVar31,auVar266);
        auVar31 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
        auVar136._0_4_ = auVar124._0_4_ ^ auVar31._0_4_;
        auVar136._4_4_ = auVar124._4_4_ ^ auVar31._4_4_;
        auVar136._8_4_ = auVar124._8_4_ ^ auVar31._8_4_;
        auVar136._12_4_ = auVar124._12_4_ ^ auVar31._12_4_;
        auVar136._16_4_ = auVar124._16_4_ ^ auVar31._16_4_;
        auVar136._20_4_ = auVar124._20_4_ ^ auVar31._20_4_;
        auVar136._24_4_ = auVar124._24_4_ ^ auVar31._24_4_;
        auVar136._28_4_ = auVar124._28_4_ ^ auVar31._28_4_;
        auVar124 = vorps_avx(auVar125,auVar136);
        auVar124 = vandps_avx(auVar173,auVar124);
      }
    }
    auVar405 = ZEXT3264(auVar173);
    auVar388 = ZEXT3264(local_a00);
    auVar313 = ZEXT3264(local_980);
    auVar267 = ZEXT3264(local_520);
    auVar173 = local_520 & auVar124;
    auVar293 = ZEXT3264(_local_800);
    if ((((((((auVar173 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar173 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar173 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar173 >> 0x7f,0) == '\0') &&
          (auVar173 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar173 >> 0xbf,0) == '\0') &&
        (auVar173 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar173[0x1f])
    {
LAB_011411ea:
    }
    else {
      local_8e0 = ZEXT416((uint)*(float *)(ray + k * 4 + 0x80));
      auVar216 = ZEXT416((uint)(*(float *)(ray + k * 4 + 0x80) - (float)local_8d0._0_4_));
      auVar216 = vshufps_avx(auVar216,auVar216,0);
      auVar261._16_16_ = auVar216;
      auVar261._0_16_ = auVar216;
      auVar125 = vminps_avx(auVar261,auVar436);
      fVar300 = auVar38._28_4_;
      auVar191._0_4_ =
           (float)local_820._0_4_ * fVar327 +
           (float)local_800._0_4_ * fVar399 + (float)local_840._0_4_ * fVar412;
      auVar191._4_4_ =
           (float)local_820._4_4_ * fVar343 +
           (float)local_800._4_4_ * fVar406 + (float)local_840._4_4_ * fVar420;
      auVar191._8_4_ = fStack_818 * fVar347 + fStack_7f8 * fVar407 + fStack_838 * fVar422;
      auVar191._12_4_ = fStack_814 * fVar351 + fStack_7f4 * fVar408 + fStack_834 * fVar424;
      auVar191._16_4_ = fStack_810 * fVar355 + fStack_7f0 * fVar409 + fStack_830 * fVar426;
      auVar191._20_4_ = fStack_80c * fVar359 + fStack_7ec * fVar410 + fStack_82c * fVar428;
      auVar191._24_4_ = fStack_808 * fVar363 + fStack_7e8 * fVar411 + fStack_828 * fVar430;
      auVar191._28_4_ = fVar300 + fVar300 + auVar373._28_4_;
      auVar173 = vrcpps_avx(auVar191);
      fVar379 = auVar173._0_4_;
      fVar398 = auVar173._4_4_;
      auVar70._4_4_ = auVar191._4_4_ * fVar398;
      auVar70._0_4_ = auVar191._0_4_ * fVar379;
      fVar280 = auVar173._8_4_;
      auVar70._8_4_ = auVar191._8_4_ * fVar280;
      fVar294 = auVar173._12_4_;
      auVar70._12_4_ = auVar191._12_4_ * fVar294;
      fVar295 = auVar173._16_4_;
      auVar70._16_4_ = auVar191._16_4_ * fVar295;
      fVar296 = auVar173._20_4_;
      auVar70._20_4_ = auVar191._20_4_ * fVar296;
      fVar297 = auVar173._24_4_;
      auVar70._24_4_ = auVar191._24_4_ * fVar297;
      auVar70._28_4_ = fVar380;
      auVar385._8_4_ = 0x3f800000;
      auVar385._0_8_ = 0x3f8000003f800000;
      auVar385._12_4_ = 0x3f800000;
      auVar385._16_4_ = 0x3f800000;
      auVar385._20_4_ = 0x3f800000;
      auVar385._24_4_ = 0x3f800000;
      auVar385._28_4_ = 0x3f800000;
      auVar388 = ZEXT3264(auVar385);
      auVar38 = vsubps_avx(auVar385,auVar70);
      auVar311._8_4_ = 0x7fffffff;
      auVar311._0_8_ = 0x7fffffff7fffffff;
      auVar311._12_4_ = 0x7fffffff;
      auVar311._16_4_ = 0x7fffffff;
      auVar311._20_4_ = 0x7fffffff;
      auVar311._24_4_ = 0x7fffffff;
      auVar311._28_4_ = 0x7fffffff;
      auVar173 = vandps_avx(auVar191,auVar311);
      auVar372._8_4_ = 0x219392ef;
      auVar372._0_8_ = 0x219392ef219392ef;
      auVar372._12_4_ = 0x219392ef;
      auVar372._16_4_ = 0x219392ef;
      auVar372._20_4_ = 0x219392ef;
      auVar372._24_4_ = 0x219392ef;
      auVar372._28_4_ = 0x219392ef;
      auVar31 = vcmpps_avx(auVar173,auVar372,1);
      auVar71._4_4_ =
           (fVar398 + fVar398 * auVar38._4_4_) *
           -(fVar343 * fVar247 + fVar406 * fVar246 + fVar420 * fVar232);
      auVar71._0_4_ =
           (fVar379 + fVar379 * auVar38._0_4_) *
           -(fVar327 * fVar142 + fVar399 * fVar228 + fVar412 * fVar140);
      auVar71._8_4_ =
           (fVar280 + fVar280 * auVar38._8_4_) *
           -(fVar347 * fVar268 + fVar407 * fVar252 + fVar422 * fVar251);
      auVar71._12_4_ =
           (fVar294 + fVar294 * auVar38._12_4_) *
           -(fVar351 * fVar298 + fVar408 * fVar278 + fVar424 * fVar276);
      auVar71._16_4_ =
           (fVar295 + fVar295 * auVar38._16_4_) *
           -(fVar355 * fVar315 + fVar409 * fVar314 + fVar426 * fVar304);
      auVar71._20_4_ =
           (fVar296 + fVar296 * auVar38._20_4_) *
           -(fVar359 * fVar341 + fVar410 * fVar325 + fVar428 * fVar323);
      auVar71._24_4_ =
           (fVar297 + fVar297 * auVar38._24_4_) *
           -(fVar363 * fVar365 + fVar411 * fVar361 + fVar430 * fVar357);
      auVar71._28_4_ = -(auVar373._28_4_ + auVar35._28_4_ + fVar300);
      auVar92 = ZEXT812(0);
      auVar375 = ZEXT1264(auVar92) << 0x20;
      auVar173 = vcmpps_avx(auVar191,ZEXT1232(auVar92) << 0x20,1);
      auVar173 = vorps_avx(auVar31,auVar173);
      auVar340._8_4_ = 0xff800000;
      auVar340._0_8_ = 0xff800000ff800000;
      auVar340._12_4_ = 0xff800000;
      auVar340._16_4_ = 0xff800000;
      auVar340._20_4_ = 0xff800000;
      auVar340._24_4_ = 0xff800000;
      auVar340._28_4_ = 0xff800000;
      auVar173 = vblendvps_avx(auVar71,auVar340,auVar173);
      auVar35 = vcmpps_avx(auVar191,ZEXT1232(auVar92) << 0x20,6);
      auVar31 = vorps_avx(auVar31,auVar35);
      auVar395._8_4_ = 0x7f800000;
      auVar395._0_8_ = 0x7f8000007f800000;
      auVar395._12_4_ = 0x7f800000;
      auVar395._16_4_ = 0x7f800000;
      auVar395._20_4_ = 0x7f800000;
      auVar395._24_4_ = 0x7f800000;
      auVar395._28_4_ = 0x7f800000;
      auVar397 = ZEXT3264(auVar395);
      auVar31 = vblendvps_avx(auVar71,auVar395,auVar31);
      auVar35 = vmaxps_avx(local_2e0,auVar337);
      auVar35 = vmaxps_avx(auVar35,auVar173);
      auVar38 = vminps_avx(auVar125,auVar31);
      auVar373 = ZEXT1232(auVar92) << 0x20;
      auVar173 = vsubps_avx(auVar373,auVar374);
      auVar31 = vsubps_avx(auVar373,local_a20);
      auVar72._4_4_ = auVar31._4_4_ * -fVar421;
      auVar72._0_4_ = auVar31._0_4_ * -fVar413;
      auVar72._8_4_ = auVar31._8_4_ * -fVar423;
      auVar72._12_4_ = auVar31._12_4_ * -fVar425;
      auVar72._16_4_ = auVar31._16_4_ * -fVar427;
      auVar72._20_4_ = auVar31._20_4_ * -fVar429;
      auVar72._24_4_ = auVar31._24_4_ * -fVar431;
      auVar72._28_4_ = auVar31._28_4_;
      auVar405 = ZEXT3264(auVar33);
      auVar73._4_4_ = fVar438 * auVar173._4_4_;
      auVar73._0_4_ = fVar432 * auVar173._0_4_;
      auVar73._8_4_ = fVar439 * auVar173._8_4_;
      auVar73._12_4_ = fVar440 * auVar173._12_4_;
      auVar73._16_4_ = fVar441 * auVar173._16_4_;
      auVar73._20_4_ = fVar442 * auVar173._20_4_;
      auVar73._24_4_ = fVar443 * auVar173._24_4_;
      auVar73._28_4_ = auVar173._28_4_;
      auVar173 = vsubps_avx(auVar72,auVar73);
      auVar31 = vsubps_avx(auVar373,auVar32);
      auVar74._4_4_ = fVar344 * auVar31._4_4_;
      auVar74._0_4_ = fVar328 * auVar31._0_4_;
      auVar74._8_4_ = fVar348 * auVar31._8_4_;
      auVar74._12_4_ = fVar352 * auVar31._12_4_;
      auVar74._16_4_ = fVar356 * auVar31._16_4_;
      auVar74._20_4_ = fVar360 * auVar31._20_4_;
      uVar8 = auVar31._28_4_;
      auVar74._24_4_ = fVar364 * auVar31._24_4_;
      auVar74._28_4_ = uVar8;
      auVar374 = vsubps_avx(auVar173,auVar74);
      auVar75._4_4_ = (float)local_840._4_4_ * -fVar421;
      auVar75._0_4_ = (float)local_840._0_4_ * -fVar413;
      auVar75._8_4_ = fStack_838 * -fVar423;
      auVar75._12_4_ = fStack_834 * -fVar425;
      auVar75._16_4_ = fStack_830 * -fVar427;
      auVar75._20_4_ = fStack_82c * -fVar429;
      auVar75._24_4_ = fStack_828 * -fVar431;
      auVar75._28_4_ = uVar105 ^ 0x80000000;
      auVar76._4_4_ = (float)local_800._4_4_ * fVar438;
      auVar76._0_4_ = (float)local_800._0_4_ * fVar432;
      auVar76._8_4_ = fStack_7f8 * fVar439;
      auVar76._12_4_ = fStack_7f4 * fVar440;
      auVar76._16_4_ = fStack_7f0 * fVar441;
      auVar76._20_4_ = fStack_7ec * fVar442;
      auVar76._24_4_ = fStack_7e8 * fVar443;
      auVar76._28_4_ = uVar8;
      auVar173 = vsubps_avx(auVar75,auVar76);
      auVar77._4_4_ = fVar344 * (float)local_820._4_4_;
      auVar77._0_4_ = fVar328 * (float)local_820._0_4_;
      auVar77._8_4_ = fVar348 * fStack_818;
      auVar77._12_4_ = fVar352 * fStack_814;
      auVar77._16_4_ = fVar356 * fStack_810;
      auVar77._20_4_ = fVar360 * fStack_80c;
      auVar77._24_4_ = fVar364 * fStack_808;
      auVar77._28_4_ = uVar8;
      auVar32 = vsubps_avx(auVar173,auVar77);
      auVar173 = vrcpps_avx(auVar32);
      fVar140 = auVar173._0_4_;
      fVar228 = auVar173._4_4_;
      auVar78._4_4_ = auVar32._4_4_ * fVar228;
      auVar78._0_4_ = auVar32._0_4_ * fVar140;
      fVar142 = auVar173._8_4_;
      auVar78._8_4_ = auVar32._8_4_ * fVar142;
      fVar232 = auVar173._12_4_;
      auVar78._12_4_ = auVar32._12_4_ * fVar232;
      fVar246 = auVar173._16_4_;
      auVar78._16_4_ = auVar32._16_4_ * fVar246;
      fVar247 = auVar173._20_4_;
      auVar78._20_4_ = auVar32._20_4_ * fVar247;
      fVar251 = auVar173._24_4_;
      auVar78._24_4_ = auVar32._24_4_ * fVar251;
      auVar78._28_4_ = fStack_804;
      auVar33 = vsubps_avx(auVar385,auVar78);
      auVar288._8_4_ = 0x7fffffff;
      auVar288._0_8_ = 0x7fffffff7fffffff;
      auVar288._12_4_ = 0x7fffffff;
      auVar288._16_4_ = 0x7fffffff;
      auVar288._20_4_ = 0x7fffffff;
      auVar288._24_4_ = 0x7fffffff;
      auVar288._28_4_ = 0x7fffffff;
      auVar173 = vandps_avx(auVar32,auVar288);
      auVar312._8_4_ = 0x219392ef;
      auVar312._0_8_ = 0x219392ef219392ef;
      auVar312._12_4_ = 0x219392ef;
      auVar312._16_4_ = 0x219392ef;
      auVar312._20_4_ = 0x219392ef;
      auVar312._24_4_ = 0x219392ef;
      auVar312._28_4_ = 0x219392ef;
      auVar31 = vcmpps_avx(auVar173,auVar312,1);
      auVar293 = ZEXT3264(auVar31);
      auVar79._4_4_ = (fVar228 + fVar228 * auVar33._4_4_) * -auVar374._4_4_;
      auVar79._0_4_ = (fVar140 + fVar140 * auVar33._0_4_) * -auVar374._0_4_;
      auVar79._8_4_ = (fVar142 + fVar142 * auVar33._8_4_) * -auVar374._8_4_;
      auVar79._12_4_ = (fVar232 + fVar232 * auVar33._12_4_) * -auVar374._12_4_;
      auVar79._16_4_ = (fVar246 + fVar246 * auVar33._16_4_) * -auVar374._16_4_;
      auVar79._20_4_ = (fVar247 + fVar247 * auVar33._20_4_) * -auVar374._20_4_;
      auVar79._24_4_ = (fVar251 + fVar251 * auVar33._24_4_) * -auVar374._24_4_;
      auVar79._28_4_ = auVar374._28_4_ ^ 0x80000000;
      auVar173 = vcmpps_avx(auVar32,auVar373,1);
      auVar173 = vorps_avx(auVar31,auVar173);
      auVar173 = vblendvps_avx(auVar79,auVar340,auVar173);
      _local_680 = vmaxps_avx(auVar35,auVar173);
      auVar313 = ZEXT3264(_local_680);
      auVar267 = ZEXT3264(local_520);
      auVar374 = ZEXT1232(auVar92) << 0x20;
      auVar173 = vcmpps_avx(auVar32,auVar374,6);
      auVar173 = vorps_avx(auVar31,auVar173);
      auVar173 = vblendvps_avx(auVar79,auVar395,auVar173);
      auVar124 = vandps_avx(auVar124,local_520);
      local_380 = vminps_avx(auVar38,auVar173);
      auVar173 = vcmpps_avx(_local_680,local_380,2);
      auVar31 = auVar124 & auVar173;
      if ((((((((auVar31 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar31 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar31 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar31 >> 0x7f,0) == '\0') &&
            (auVar31 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar31 >> 0xbf,0) == '\0') &&
          (auVar31 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar31[0x1f])
      goto LAB_011411ea;
      auVar32 = _local_680;
      auVar31 = vminps_avx(_local_bc0,auVar129);
      auVar192 = vminps_avx(auVar192,auVar34);
      auVar31 = vminps_avx(auVar31,auVar192);
      auVar31 = vsubps_avx(auVar31,local_620);
      auVar124 = vandps_avx(auVar173,auVar124);
      auVar100._4_4_ = fStack_31c;
      auVar100._0_4_ = local_320;
      auVar100._8_4_ = fStack_318;
      auVar100._12_4_ = fStack_314;
      auVar100._16_4_ = fStack_310;
      auVar100._20_4_ = fStack_30c;
      auVar100._24_4_ = fStack_308;
      auVar100._28_4_ = fStack_304;
      auVar173 = vminps_avx(auVar100,auVar385);
      auVar173 = vmaxps_avx(auVar173,ZEXT832(0) << 0x20);
      local_1a0[0] = fVar178 + fVar145 * (auVar173._0_4_ + 0.0) * 0.125;
      local_1a0[1] = fVar201 + fVar174 * (auVar173._4_4_ + 1.0) * 0.125;
      local_1a0[2] = fVar202 + fVar175 * (auVar173._8_4_ + 2.0) * 0.125;
      local_1a0[3] = fVar203 + fVar177 * (auVar173._12_4_ + 3.0) * 0.125;
      fStack_190 = fVar178 + fVar145 * (auVar173._16_4_ + 4.0) * 0.125;
      fStack_18c = fVar201 + fVar174 * (auVar173._20_4_ + 5.0) * 0.125;
      fStack_188 = fVar202 + fVar175 * (auVar173._24_4_ + 6.0) * 0.125;
      fStack_184 = fVar203 + auVar173._28_4_ + 7.0;
      auVar99._4_4_ = fStack_33c;
      auVar99._0_4_ = local_340;
      auVar99._8_4_ = fStack_338;
      auVar99._12_4_ = fStack_334;
      auVar99._16_4_ = fStack_330;
      auVar99._20_4_ = fStack_32c;
      auVar99._24_4_ = fStack_328;
      auVar99._28_4_ = fStack_324;
      auVar173 = vminps_avx(auVar99,auVar385);
      auVar173 = vmaxps_avx(auVar173,ZEXT832(0) << 0x20);
      local_1c0[0] = fVar178 + fVar145 * (auVar173._0_4_ + 0.0) * 0.125;
      local_1c0[1] = fVar201 + fVar174 * (auVar173._4_4_ + 1.0) * 0.125;
      local_1c0[2] = fVar202 + fVar175 * (auVar173._8_4_ + 2.0) * 0.125;
      local_1c0[3] = fVar203 + fVar177 * (auVar173._12_4_ + 3.0) * 0.125;
      fStack_1b0 = fVar178 + fVar145 * (auVar173._16_4_ + 4.0) * 0.125;
      fStack_1ac = fVar201 + fVar174 * (auVar173._20_4_ + 5.0) * 0.125;
      fStack_1a8 = fVar202 + fVar175 * (auVar173._24_4_ + 6.0) * 0.125;
      fStack_1a4 = fVar203 + auVar173._28_4_ + 7.0;
      auVar80._4_4_ = auVar31._4_4_ * 0.99999976;
      auVar80._0_4_ = auVar31._0_4_ * 0.99999976;
      auVar80._8_4_ = auVar31._8_4_ * 0.99999976;
      auVar80._12_4_ = auVar31._12_4_ * 0.99999976;
      auVar80._16_4_ = auVar31._16_4_ * 0.99999976;
      auVar80._20_4_ = auVar31._20_4_ * 0.99999976;
      auVar80._24_4_ = auVar31._24_4_ * 0.99999976;
      auVar80._28_4_ = 0x3f7ffffc;
      auVar173 = vmaxps_avx(auVar374,auVar80);
      auVar81._4_4_ = auVar173._4_4_ * auVar173._4_4_;
      auVar81._0_4_ = auVar173._0_4_ * auVar173._0_4_;
      auVar81._8_4_ = auVar173._8_4_ * auVar173._8_4_;
      auVar81._12_4_ = auVar173._12_4_ * auVar173._12_4_;
      auVar81._16_4_ = auVar173._16_4_ * auVar173._16_4_;
      auVar81._20_4_ = auVar173._20_4_ * auVar173._20_4_;
      auVar81._24_4_ = auVar173._24_4_ * auVar173._24_4_;
      auVar81._28_4_ = auVar173._28_4_;
      local_920 = vsubps_avx(local_5e0,auVar81);
      auVar82._4_4_ = local_920._4_4_ * (float)local_6a0._4_4_;
      auVar82._0_4_ = local_920._0_4_ * (float)local_6a0._0_4_;
      auVar82._8_4_ = local_920._8_4_ * fStack_698;
      auVar82._12_4_ = local_920._12_4_ * fStack_694;
      auVar82._16_4_ = local_920._16_4_ * fStack_690;
      auVar82._20_4_ = local_920._20_4_ * fStack_68c;
      auVar82._24_4_ = local_920._24_4_ * fStack_688;
      auVar82._28_4_ = auVar173._28_4_;
      auVar396 = vsubps_avx(local_600,auVar82);
      auVar173 = vcmpps_avx(auVar396,ZEXT832(0) << 0x20,5);
      if ((((((((auVar173 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar173 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar173 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar173 >> 0x7f,0) == '\0') &&
            (auVar173 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar173 >> 0xbf,0) == '\0') &&
          (auVar173 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar173[0x1f]) {
        _local_880 = ZEXT832(0) << 0x20;
        _local_8a0 = ZEXT832(0) << 0x20;
        auVar192 = SUB6432(ZEXT864(0),0) << 0x20;
        auVar388 = ZEXT864(0) << 0x20;
        auVar219 = ZEXT828(0) << 0x20;
        auVar262._8_4_ = 0x7f800000;
        auVar262._0_8_ = 0x7f8000007f800000;
        auVar262._12_4_ = 0x7f800000;
        auVar262._16_4_ = 0x7f800000;
        auVar262._20_4_ = 0x7f800000;
        auVar262._24_4_ = 0x7f800000;
        auVar262._28_4_ = 0x7f800000;
        auVar289._8_4_ = 0xff800000;
        auVar289._0_8_ = 0xff800000ff800000;
        auVar289._12_4_ = 0xff800000;
        auVar289._16_4_ = 0xff800000;
        auVar289._20_4_ = 0xff800000;
        auVar289._24_4_ = 0xff800000;
        auVar289._28_4_ = 0xff800000;
        local_920 = auVar42;
        _local_860 = _local_880;
      }
      else {
        auVar192 = vsqrtps_avx(auVar396);
        auVar193._0_4_ = fVar139 + fVar139;
        auVar193._4_4_ = fVar141 + fVar141;
        auVar193._8_4_ = fVar143 + fVar143;
        auVar193._12_4_ = fVar144 + fVar144;
        auVar193._16_4_ = fVar376 + fVar376;
        auVar193._20_4_ = fVar377 + fVar377;
        auVar193._24_4_ = fVar378 + fVar378;
        auVar193._28_4_ = fVar146 + fVar146;
        auVar31 = vrcpps_avx(auVar193);
        fVar146 = auVar31._0_4_;
        fVar140 = auVar31._4_4_;
        auVar83._4_4_ = auVar193._4_4_ * fVar140;
        auVar83._0_4_ = auVar193._0_4_ * fVar146;
        fVar228 = auVar31._8_4_;
        auVar83._8_4_ = auVar193._8_4_ * fVar228;
        fVar142 = auVar31._12_4_;
        auVar83._12_4_ = auVar193._12_4_ * fVar142;
        fVar232 = auVar31._16_4_;
        auVar83._16_4_ = auVar193._16_4_ * fVar232;
        fVar246 = auVar31._20_4_;
        auVar83._20_4_ = auVar193._20_4_ * fVar246;
        fVar247 = auVar31._24_4_;
        auVar83._24_4_ = auVar193._24_4_ * fVar247;
        auVar83._28_4_ = auVar193._28_4_;
        auVar33 = vsubps_avx(auVar385,auVar83);
        fVar146 = fVar146 + fVar146 * auVar33._0_4_;
        fVar140 = fVar140 + fVar140 * auVar33._4_4_;
        fVar228 = fVar228 + fVar228 * auVar33._8_4_;
        fVar142 = fVar142 + fVar142 * auVar33._12_4_;
        fVar232 = fVar232 + fVar232 * auVar33._16_4_;
        fVar246 = fVar246 + fVar246 * auVar33._20_4_;
        fVar247 = fVar247 + fVar247 * auVar33._24_4_;
        fVar251 = auVar31._28_4_ + auVar33._28_4_;
        auVar224._0_8_ = local_980._0_8_ ^ 0x8000000080000000;
        auVar224._8_4_ = -local_980._8_4_;
        auVar224._12_4_ = -local_980._12_4_;
        auVar224._16_4_ = -local_980._16_4_;
        auVar224._20_4_ = -local_980._20_4_;
        auVar224._24_4_ = -local_980._24_4_;
        auVar224._28_4_ = -local_980._28_4_;
        auVar31 = vsubps_avx(auVar224,auVar192);
        fVar315 = auVar31._0_4_ * fVar146;
        fVar323 = auVar31._4_4_ * fVar140;
        auVar84._4_4_ = fVar323;
        auVar84._0_4_ = fVar315;
        fVar325 = auVar31._8_4_ * fVar228;
        auVar84._8_4_ = fVar325;
        fVar341 = auVar31._12_4_ * fVar142;
        auVar84._12_4_ = fVar341;
        fVar357 = auVar31._16_4_ * fVar232;
        auVar84._16_4_ = fVar357;
        fVar361 = auVar31._20_4_ * fVar246;
        auVar84._20_4_ = fVar361;
        fVar365 = auVar31._24_4_ * fVar247;
        auVar84._24_4_ = fVar365;
        auVar84._28_4_ = 0x80000000;
        auVar192 = vsubps_avx(auVar192,local_980);
        fVar146 = auVar192._0_4_ * fVar146;
        fVar140 = auVar192._4_4_ * fVar140;
        auVar85._4_4_ = fVar140;
        auVar85._0_4_ = fVar146;
        fVar228 = auVar192._8_4_ * fVar228;
        auVar85._8_4_ = fVar228;
        fVar142 = auVar192._12_4_ * fVar142;
        auVar85._12_4_ = fVar142;
        fVar232 = auVar192._16_4_ * fVar232;
        auVar85._16_4_ = fVar232;
        fVar246 = auVar192._20_4_ * fVar246;
        auVar85._20_4_ = fVar246;
        fVar247 = auVar192._24_4_ * fVar247;
        auVar85._24_4_ = fVar247;
        auVar85._28_4_ = auVar124._28_4_;
        fVar252 = (fVar315 * (float)local_6c0._0_4_ + (float)local_a00._0_4_) * fVar253;
        fVar268 = (fVar323 * (float)local_6c0._4_4_ + local_a00._4_4_) * fVar269;
        fVar276 = (fVar325 * fStack_6b8 + local_a00._8_4_) * fVar271;
        fVar278 = (fVar341 * fStack_6b4 + local_a00._12_4_) * fVar273;
        fVar298 = (fVar357 * fStack_6b0 + local_a00._16_4_) * fVar275;
        fVar304 = (fVar361 * fStack_6ac + local_a00._20_4_) * fVar277;
        fVar314 = (fVar365 * fStack_6a8 + local_a00._24_4_) * fVar279;
        auVar167._0_4_ = fVar326 + fVar204 * fVar252;
        auVar167._4_4_ = fVar342 + fVar231 * fVar268;
        auVar167._8_4_ = fVar346 + fVar250 * fVar276;
        auVar167._12_4_ = fVar350 + fVar274 * fVar278;
        auVar167._16_4_ = fVar354 + fVar302 * fVar298;
        auVar167._20_4_ = fVar358 + fVar321 * fVar304;
        auVar167._24_4_ = fVar362 + fVar353 * fVar314;
        auVar167._28_4_ = fVar366 + auVar192._28_4_ + local_a00._28_4_;
        auVar86._4_4_ = (float)local_820._4_4_ * fVar323;
        auVar86._0_4_ = (float)local_820._0_4_ * fVar315;
        auVar86._8_4_ = fStack_818 * fVar325;
        auVar86._12_4_ = fStack_814 * fVar341;
        auVar86._16_4_ = fStack_810 * fVar357;
        auVar86._20_4_ = fStack_80c * fVar361;
        auVar86._24_4_ = fStack_808 * fVar365;
        auVar86._28_4_ = fVar251;
        auVar192 = vsubps_avx(auVar86,auVar167);
        auVar194._0_4_ = local_960 + fVar227 * fVar252;
        auVar194._4_4_ = fStack_95c + fVar229 * fVar268;
        auVar194._8_4_ = fStack_958 + fVar248 * fVar276;
        auVar194._12_4_ = fStack_954 + fVar270 * fVar278;
        auVar194._16_4_ = fStack_950 + fVar299 * fVar298;
        auVar194._20_4_ = fStack_94c + fVar317 * fVar304;
        auVar194._24_4_ = fStack_948 + fVar345 * fVar314;
        auVar194._28_4_ = fStack_944 + fVar251;
        auVar263._0_4_ = (float)local_800._0_4_ * fVar315;
        auVar263._4_4_ = (float)local_800._4_4_ * fVar323;
        auVar263._8_4_ = fStack_7f8 * fVar325;
        auVar263._12_4_ = fStack_7f4 * fVar341;
        auVar263._16_4_ = fStack_7f0 * fVar357;
        auVar263._20_4_ = fStack_7ec * fVar361;
        auVar263._24_4_ = fStack_7e8 * fVar365;
        auVar263._28_4_ = 0;
        local_a20 = vsubps_avx(auVar263,auVar194);
        auVar225._0_4_ = local_940 + fVar176 * fVar252;
        auVar225._4_4_ = fStack_93c + fVar230 * fVar268;
        auVar225._8_4_ = fStack_938 + fVar249 * fVar276;
        auVar225._12_4_ = fStack_934 + fVar272 * fVar278;
        auVar225._16_4_ = fStack_930 + fVar301 * fVar298;
        auVar225._20_4_ = fStack_92c + fVar319 * fVar304;
        auVar225._24_4_ = fStack_928 + fVar349 * fVar314;
        auVar225._28_4_ = fStack_924 + auVar31._28_4_;
        auVar87._4_4_ = fVar323 * (float)local_840._4_4_;
        auVar87._0_4_ = fVar315 * (float)local_840._0_4_;
        auVar87._8_4_ = fVar325 * fStack_838;
        auVar87._12_4_ = fVar341 * fStack_834;
        auVar87._16_4_ = fVar357 * fStack_830;
        auVar87._20_4_ = fVar361 * fStack_82c;
        auVar87._24_4_ = fVar365 * fStack_828;
        auVar87._28_4_ = 0;
        auVar31 = vsubps_avx(auVar87,auVar225);
        auVar219 = auVar31._0_28_;
        fVar253 = (fVar146 * (float)local_6c0._0_4_ + (float)local_a00._0_4_) * fVar253;
        fVar269 = (fVar140 * (float)local_6c0._4_4_ + local_a00._4_4_) * fVar269;
        fVar271 = (fVar228 * fStack_6b8 + local_a00._8_4_) * fVar271;
        fVar273 = (fVar142 * fStack_6b4 + local_a00._12_4_) * fVar273;
        fVar275 = (fVar232 * fStack_6b0 + local_a00._16_4_) * fVar275;
        fVar277 = (fVar246 * fStack_6ac + local_a00._20_4_) * fVar277;
        fVar279 = (fVar247 * fStack_6a8 + local_a00._24_4_) * fVar279;
        auVar290._0_4_ = fVar326 + fVar204 * fVar253;
        auVar290._4_4_ = fVar342 + fVar231 * fVar269;
        auVar290._8_4_ = fVar346 + fVar250 * fVar271;
        auVar290._12_4_ = fVar350 + fVar274 * fVar273;
        auVar290._16_4_ = fVar354 + fVar302 * fVar275;
        auVar290._20_4_ = fVar358 + fVar321 * fVar277;
        auVar290._24_4_ = fVar362 + fVar353 * fVar279;
        auVar290._28_4_ = fVar366 + (float)local_6e0._28_4_;
        auVar88._4_4_ = (float)local_820._4_4_ * fVar140;
        auVar88._0_4_ = (float)local_820._0_4_ * fVar146;
        auVar88._8_4_ = fStack_818 * fVar228;
        auVar88._12_4_ = fStack_814 * fVar142;
        auVar88._16_4_ = fStack_810 * fVar232;
        auVar88._20_4_ = fStack_80c * fVar246;
        auVar88._24_4_ = fStack_808 * fVar247;
        auVar88._28_4_ = fStack_804;
        _local_860 = vsubps_avx(auVar88,auVar290);
        auVar291._0_4_ = local_960 + fVar227 * fVar253;
        auVar291._4_4_ = fStack_95c + fVar229 * fVar269;
        auVar291._8_4_ = fStack_958 + fVar248 * fVar271;
        auVar291._12_4_ = fStack_954 + fVar270 * fVar273;
        auVar291._16_4_ = fStack_950 + fVar299 * fVar275;
        auVar291._20_4_ = fStack_94c + fVar317 * fVar277;
        auVar291._24_4_ = fStack_948 + fVar345 * fVar279;
        auVar291._28_4_ = fStack_944 + local_860._28_4_;
        auVar89._4_4_ = (float)local_800._4_4_ * fVar140;
        auVar89._0_4_ = (float)local_800._0_4_ * fVar146;
        auVar89._8_4_ = fStack_7f8 * fVar228;
        auVar89._12_4_ = fStack_7f4 * fVar142;
        auVar89._16_4_ = fStack_7f0 * fVar232;
        auVar89._20_4_ = fStack_7ec * fVar246;
        auVar89._24_4_ = fStack_7e8 * fVar247;
        auVar89._28_4_ = fStack_804;
        _local_880 = vsubps_avx(auVar89,auVar291);
        auVar264._0_4_ = local_940 + fVar176 * fVar253;
        auVar264._4_4_ = fStack_93c + fVar230 * fVar269;
        auVar264._8_4_ = fStack_938 + fVar249 * fVar271;
        auVar264._12_4_ = fStack_934 + fVar272 * fVar273;
        auVar264._16_4_ = fStack_930 + fVar301 * fVar275;
        auVar264._20_4_ = fStack_92c + fVar319 * fVar277;
        auVar264._24_4_ = fStack_928 + fVar349 * fVar279;
        auVar264._28_4_ = fStack_924 + local_a00._28_4_ + 0.0;
        auVar90._4_4_ = fVar140 * (float)local_840._4_4_;
        auVar90._0_4_ = fVar146 * (float)local_840._0_4_;
        auVar90._8_4_ = fVar228 * fStack_838;
        auVar90._12_4_ = fVar142 * fStack_834;
        auVar90._16_4_ = fVar232 * fStack_830;
        auVar90._20_4_ = fVar246 * fStack_82c;
        auVar90._24_4_ = fVar247 * fStack_828;
        auVar90._28_4_ = local_880._28_4_;
        _local_8a0 = vsubps_avx(auVar90,auVar264);
        auVar374 = vcmpps_avx(auVar396,auVar374,5);
        auVar265._8_4_ = 0x7f800000;
        auVar265._0_8_ = 0x7f8000007f800000;
        auVar265._12_4_ = 0x7f800000;
        auVar265._16_4_ = 0x7f800000;
        auVar265._20_4_ = 0x7f800000;
        auVar265._24_4_ = 0x7f800000;
        auVar265._28_4_ = 0x7f800000;
        auVar262 = vblendvps_avx(auVar265,auVar84,auVar374);
        auVar386._8_4_ = 0x7fffffff;
        auVar386._0_8_ = 0x7fffffff7fffffff;
        auVar386._12_4_ = 0x7fffffff;
        auVar386._16_4_ = 0x7fffffff;
        auVar386._20_4_ = 0x7fffffff;
        auVar386._24_4_ = 0x7fffffff;
        auVar386._28_4_ = 0x7fffffff;
        auVar31 = vandps_avx(auVar386,local_360);
        auVar31 = vmaxps_avx(local_540,auVar31);
        auVar396._8_4_ = 0x36000000;
        auVar396._0_8_ = 0x3600000036000000;
        auVar396._12_4_ = 0x36000000;
        auVar396._16_4_ = 0x36000000;
        auVar396._20_4_ = 0x36000000;
        auVar396._24_4_ = 0x36000000;
        auVar396._28_4_ = 0x36000000;
        auVar91._4_4_ = auVar31._4_4_ * 1.9073486e-06;
        auVar91._0_4_ = auVar31._0_4_ * 1.9073486e-06;
        auVar91._8_4_ = auVar31._8_4_ * 1.9073486e-06;
        auVar91._12_4_ = auVar31._12_4_ * 1.9073486e-06;
        auVar91._16_4_ = auVar31._16_4_ * 1.9073486e-06;
        auVar91._20_4_ = auVar31._20_4_ * 1.9073486e-06;
        auVar91._24_4_ = auVar31._24_4_ * 1.9073486e-06;
        auVar91._28_4_ = auVar31._28_4_;
        auVar31 = vandps_avx(auVar386,local_580);
        auVar31 = vcmpps_avx(auVar31,auVar91,1);
        auVar292._8_4_ = 0xff800000;
        auVar292._0_8_ = 0xff800000ff800000;
        auVar292._12_4_ = 0xff800000;
        auVar292._16_4_ = 0xff800000;
        auVar292._20_4_ = 0xff800000;
        auVar292._24_4_ = 0xff800000;
        auVar292._28_4_ = 0xff800000;
        auVar289 = vblendvps_avx(auVar292,auVar85,auVar374);
        auVar33 = auVar374 & auVar31;
        if ((((((((auVar33 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar33 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar33 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar33 >> 0x7f,0) != '\0') ||
              (auVar33 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar33 >> 0xbf,0) != '\0') ||
            (auVar33 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar33[0x1f] < '\0') {
          auVar173 = vandps_avx(auVar31,auVar374);
          auVar216 = vpackssdw_avx(auVar173._0_16_,auVar173._16_16_);
          auVar33 = vcmpps_avx(local_920,ZEXT832(0) << 0x20,2);
          auVar437._8_4_ = 0xff800000;
          auVar437._0_8_ = 0xff800000ff800000;
          auVar437._12_4_ = 0xff800000;
          auVar437._16_4_ = 0xff800000;
          auVar437._20_4_ = 0xff800000;
          auVar437._24_4_ = 0xff800000;
          auVar437._28_4_ = 0xff800000;
          auVar419._8_4_ = 0x7f800000;
          auVar419._0_8_ = 0x7f8000007f800000;
          auVar419._12_4_ = 0x7f800000;
          auVar419._16_4_ = 0x7f800000;
          auVar419._20_4_ = 0x7f800000;
          auVar419._24_4_ = 0x7f800000;
          auVar419._28_4_ = 0x7f800000;
          auVar31 = vblendvps_avx(auVar419,auVar437,auVar33);
          auVar184 = vpmovsxwd_avx(auVar216);
          auVar216 = vpunpckhwd_avx(auVar216,auVar216);
          auVar387._16_16_ = auVar216;
          auVar387._0_16_ = auVar184;
          auVar262 = vblendvps_avx(auVar262,auVar31,auVar387);
          auVar396 = vblendvps_avx(auVar437,auVar419,auVar33);
          auVar289 = vblendvps_avx(auVar289,auVar396,auVar387);
          auVar31 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
          auVar137._0_4_ = auVar31._0_4_ ^ auVar173._0_4_;
          auVar137._4_4_ = auVar31._4_4_ ^ auVar173._4_4_;
          auVar137._8_4_ = auVar31._8_4_ ^ auVar173._8_4_;
          auVar137._12_4_ = auVar31._12_4_ ^ auVar173._12_4_;
          auVar137._16_4_ = auVar31._16_4_ ^ auVar173._16_4_;
          auVar137._20_4_ = auVar31._20_4_ ^ auVar173._20_4_;
          auVar137._24_4_ = auVar31._24_4_ ^ auVar173._24_4_;
          auVar137._28_4_ = auVar31._28_4_ ^ auVar173._28_4_;
          auVar173 = vorps_avx(auVar33,auVar137);
          auVar173 = vandps_avx(auVar374,auVar173);
        }
        auVar388 = ZEXT3264(local_a20);
      }
      auVar397 = ZEXT3264(auVar396);
      auVar405 = ZEXT3264(auVar124);
      auVar375 = ZEXT1664(local_8e0);
      _local_3e0 = _local_680;
      local_3c0 = vminps_avx(local_380,auVar262);
      local_3a0 = vmaxps_avx(_local_680,auVar289);
      auVar293 = ZEXT3264(local_3a0);
      auVar31 = vcmpps_avx(_local_680,local_3c0,2);
      local_5e0 = vandps_avx(auVar124,auVar31);
      auVar267 = ZEXT3264(local_5e0);
      auVar31 = vcmpps_avx(local_3a0,local_380,2);
      local_620 = vandps_avx(auVar124,auVar31);
      auVar313 = ZEXT3264(local_620);
      auVar124 = vorps_avx(local_620,local_5e0);
      if ((((((((auVar124 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar124 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar124 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar124 >> 0x7f,0) != '\0') ||
            (auVar124 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar124 >> 0xbf,0) != '\0') ||
          (auVar124 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar124[0x1f] < '\0') {
        _local_6a0 = local_3a0;
        auVar31 = _local_6a0;
        local_6e0 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
        local_6c0._0_4_ = auVar173._0_4_ ^ local_6e0._0_4_;
        local_6c0._4_4_ = auVar173._4_4_ ^ local_6e0._4_4_;
        fStack_6b8 = (float)(auVar173._8_4_ ^ local_6e0._8_4_);
        fStack_6b4 = (float)(auVar173._12_4_ ^ local_6e0._12_4_);
        fStack_6b0 = (float)(auVar173._16_4_ ^ local_6e0._16_4_);
        fStack_6ac = (float)(auVar173._20_4_ ^ local_6e0._20_4_);
        fStack_6a8 = (float)(auVar173._24_4_ ^ local_6e0._24_4_);
        fStack_6a4 = (float)((uint)auVar173._28_4_ ^ (uint)local_6e0._28_4_);
        auVar10 = local_840._0_28_;
        auVar267 = ZEXT3264(_local_840);
        auVar132._0_4_ =
             (float)local_820._0_4_ * auVar192._0_4_ +
             auVar388._0_4_ * (float)local_800._0_4_ + (float)local_840._0_4_ * auVar219._0_4_;
        auVar132._4_4_ =
             (float)local_820._4_4_ * auVar192._4_4_ +
             auVar388._4_4_ * (float)local_800._4_4_ + (float)local_840._4_4_ * auVar219._4_4_;
        auVar132._8_4_ =
             fStack_818 * auVar192._8_4_ + auVar388._8_4_ * fStack_7f8 + fStack_838 * auVar219._8_4_
        ;
        auVar132._12_4_ =
             fStack_814 * auVar192._12_4_ +
             auVar388._12_4_ * fStack_7f4 + fStack_834 * auVar219._12_4_;
        auVar132._16_4_ =
             fStack_810 * auVar192._16_4_ +
             auVar388._16_4_ * fStack_7f0 + fStack_830 * auVar219._16_4_;
        auVar132._20_4_ =
             fStack_80c * auVar192._20_4_ +
             auVar388._20_4_ * fStack_7ec + fStack_82c * auVar219._20_4_;
        auVar132._24_4_ =
             fStack_808 * auVar192._24_4_ +
             auVar388._24_4_ * fStack_7e8 + fStack_828 * auVar219._24_4_;
        auVar132._28_4_ = auVar173._28_4_ + local_6e0._28_4_ + auVar192._28_4_;
        auVar168._8_4_ = 0x7fffffff;
        auVar168._0_8_ = 0x7fffffff7fffffff;
        auVar168._12_4_ = 0x7fffffff;
        auVar168._16_4_ = 0x7fffffff;
        auVar168._20_4_ = 0x7fffffff;
        auVar168._24_4_ = 0x7fffffff;
        auVar168._28_4_ = 0x7fffffff;
        auVar124 = vandps_avx(auVar132,auVar168);
        auVar169._8_4_ = 0x3e99999a;
        auVar169._0_8_ = 0x3e99999a3e99999a;
        auVar169._12_4_ = 0x3e99999a;
        auVar169._16_4_ = 0x3e99999a;
        auVar169._20_4_ = 0x3e99999a;
        auVar169._24_4_ = 0x3e99999a;
        auVar169._28_4_ = 0x3e99999a;
        auVar124 = vcmpps_avx(auVar124,auVar169,1);
        auVar124 = vorps_avx(_local_6c0,auVar124);
        auVar170._8_4_ = 3;
        auVar170._0_8_ = 0x300000003;
        auVar170._12_4_ = 3;
        auVar170._16_4_ = 3;
        auVar170._20_4_ = 3;
        auVar170._24_4_ = 3;
        auVar170._28_4_ = 3;
        auVar195._8_4_ = 2;
        auVar195._0_8_ = 0x200000002;
        auVar195._12_4_ = 2;
        auVar195._16_4_ = 2;
        auVar195._20_4_ = 2;
        auVar195._24_4_ = 2;
        auVar195._28_4_ = 2;
        auVar124 = vblendvps_avx(auVar195,auVar170,auVar124);
        local_640 = ZEXT432(uVar110);
        auVar184 = vpshufd_avx(ZEXT416(uVar110),0);
        fVar146 = 0.0;
        auVar216 = vpcmpgtd_avx(auVar124._16_16_,auVar184);
        local_660._0_16_ = auVar184;
        auVar184 = vpcmpgtd_avx(auVar124._0_16_,auVar184);
        auVar171._16_16_ = auVar216;
        auVar171._0_16_ = auVar184;
        local_600 = vblendps_avx(ZEXT1632(auVar184),auVar171,0xf0);
        local_5c0 = vandnps_avx(local_600,local_5e0);
        auVar313 = ZEXT3264(local_5c0);
        auVar124 = local_5e0 & ~local_600;
        local_ad0 = auVar13._0_4_;
        fStack_acc = auVar13._4_4_;
        fStack_ac8 = auVar13._8_4_;
        fStack_ac4 = auVar13._12_4_;
        local_ab0 = auVar37._0_4_;
        fStack_aac = auVar37._4_4_;
        fStack_aa8 = auVar37._8_4_;
        fStack_aa4 = auVar37._12_4_;
        local_ac0 = auVar12._0_4_;
        fStack_abc = auVar12._4_4_;
        fStack_ab8 = auVar12._8_4_;
        fStack_ab4 = auVar12._12_4_;
        local_aa0 = auVar11._0_4_;
        fStack_a9c = auVar11._4_4_;
        fStack_a98 = auVar11._8_4_;
        fStack_a94 = auVar11._12_4_;
        if ((((((((auVar124 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar124 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar124 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar124 >> 0x7f,0) == '\0') &&
              (auVar124 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar124 >> 0xbf,0) == '\0') &&
            (auVar124 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar124[0x1f]) {
          auVar216 = vshufps_avx(local_8e0,local_8e0,0);
          auVar133._16_16_ = auVar216;
          auVar133._0_16_ = auVar216;
          local_6a0._0_4_ = local_3a0._0_4_;
          local_6a0._4_4_ = local_3a0._4_4_;
          fStack_698 = local_3a0._8_4_;
          fStack_694 = local_3a0._12_4_;
          fStack_690 = local_3a0._16_4_;
          fStack_68c = local_3a0._20_4_;
          fStack_688 = local_3a0._24_4_;
          fStack_684 = local_3a0._28_4_;
          fVar227 = (float)local_6a0._0_4_;
          fVar176 = (float)local_6a0._4_4_;
          fVar204 = fStack_698;
          fVar140 = fStack_694;
          fVar228 = fStack_690;
          fVar142 = fStack_68c;
          fVar229 = fStack_688;
          fVar230 = fStack_684;
          _local_6a0 = auVar31;
        }
        else {
          local_9a0._4_4_ = (float)local_680._4_4_ + (float)local_a60._4_4_;
          local_9a0._0_4_ = (float)local_680._0_4_ + (float)local_a60._0_4_;
          fStack_998 = fStack_678 + fStack_a58;
          fStack_994 = fStack_674 + fStack_a54;
          fStack_990 = fStack_670 + fStack_a50;
          fStack_98c = fStack_66c + fStack_a4c;
          fStack_988 = fStack_668 + fStack_a48;
          fStack_984 = fStack_664 + fStack_a44;
          _local_680 = auVar32;
          do {
            auVar134._8_4_ = 0x7f800000;
            auVar134._0_8_ = 0x7f8000007f800000;
            auVar134._12_4_ = 0x7f800000;
            auVar134._16_4_ = 0x7f800000;
            auVar134._20_4_ = 0x7f800000;
            auVar134._24_4_ = 0x7f800000;
            auVar134._28_4_ = 0x7f800000;
            auVar124 = auVar313._0_32_;
            auVar173 = vblendvps_avx(auVar134,_local_680,auVar124);
            auVar31 = vshufps_avx(auVar173,auVar173,0xb1);
            auVar31 = vminps_avx(auVar173,auVar31);
            auVar374 = vshufpd_avx(auVar31,auVar31,5);
            auVar31 = vminps_avx(auVar31,auVar374);
            auVar374 = vperm2f128_avx(auVar31,auVar31,1);
            auVar31 = vminps_avx(auVar31,auVar374);
            auVar173 = vcmpps_avx(auVar173,auVar31,0);
            auVar31 = auVar124 & auVar173;
            if ((((((((auVar31 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar31 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar31 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar31 >> 0x7f,0) != '\0') ||
                  (auVar31 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar31 >> 0xbf,0) != '\0') ||
                (auVar31 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar31[0x1f] < '\0') {
              auVar124 = vandps_avx(auVar173,auVar124);
            }
            uVar102 = vmovmskps_avx(auVar124);
            uVar105 = 0;
            if (uVar102 != 0) {
              for (; (uVar102 >> uVar105 & 1) == 0; uVar105 = uVar105 + 1) {
              }
            }
            uVar103 = (ulong)uVar105;
            *(undefined4 *)(local_5c0 + uVar103 * 4) = 0;
            fVar146 = local_1a0[uVar103];
            uVar105 = *(uint *)(local_3e0 + uVar103 * 4);
            fVar227 = auVar150._0_4_;
            if ((float)local_9c0._0_4_ < 0.0) {
              fVar227 = sqrtf((float)local_9c0._0_4_);
            }
            auVar184 = vminps_avx(auVar11,auVar12);
            auVar216 = vmaxps_avx(auVar11,auVar12);
            auVar120 = vminps_avx(auVar37,auVar13);
            auVar156 = vminps_avx(auVar184,auVar120);
            auVar184 = vmaxps_avx(auVar37,auVar13);
            auVar120 = vmaxps_avx(auVar216,auVar184);
            auVar208._8_4_ = 0x7fffffff;
            auVar208._0_8_ = 0x7fffffff7fffffff;
            auVar208._12_4_ = 0x7fffffff;
            auVar216 = vandps_avx(auVar156,auVar208);
            auVar184 = vandps_avx(auVar120,auVar208);
            auVar216 = vmaxps_avx(auVar216,auVar184);
            auVar184 = vmovshdup_avx(auVar216);
            auVar184 = vmaxss_avx(auVar184,auVar216);
            auVar216 = vshufpd_avx(auVar216,auVar216,1);
            auVar216 = vmaxss_avx(auVar216,auVar184);
            local_940 = auVar216._0_4_ * 1.9073486e-06;
            local_920._0_4_ = fVar227 * 1.9073486e-06;
            local_7e0._0_16_ = vshufps_avx(auVar120,auVar120,0xff);
            auVar216 = vinsertps_avx(ZEXT416(uVar105),ZEXT416((uint)fVar146),0x10);
            auVar375 = ZEXT1664(auVar216);
            lVar107 = 5;
            do {
              auVar367 = auVar375._0_16_;
              auVar216 = vmovshdup_avx(auVar367);
              fVar146 = auVar216._0_4_;
              fVar140 = 1.0 - fVar146;
              fVar227 = fVar140 * fVar140 * fVar140;
              fVar176 = fVar146 * fVar146 * fVar146;
              fVar204 = fVar146 * fVar140;
              auVar216 = vshufps_avx(ZEXT416((uint)(fVar176 * 0.16666667)),
                                     ZEXT416((uint)(fVar176 * 0.16666667)),0);
              auVar184 = ZEXT416((uint)((fVar176 * 4.0 + fVar227 +
                                        fVar146 * fVar204 * 12.0 + fVar140 * fVar204 * 6.0) *
                                       0.16666667));
              auVar184 = vshufps_avx(auVar184,auVar184,0);
              auVar120 = ZEXT416((uint)((fVar227 * 4.0 + fVar176 +
                                        fVar140 * fVar204 * 12.0 + fVar146 * fVar204 * 6.0) *
                                       0.16666667));
              auVar120 = vshufps_avx(auVar120,auVar120,0);
              auVar156 = vshufps_avx(auVar367,auVar367,0);
              auVar181._0_4_ = auVar156._0_4_ * (float)local_9b0._0_4_ + 0.0;
              auVar181._4_4_ = auVar156._4_4_ * (float)local_9b0._4_4_ + 0.0;
              auVar181._8_4_ = auVar156._8_4_ * fStack_9a8 + 0.0;
              auVar181._12_4_ = auVar156._12_4_ * fStack_9a4 + 0.0;
              auVar156 = vshufps_avx(ZEXT416((uint)(fVar227 * 0.16666667)),
                                     ZEXT416((uint)(fVar227 * 0.16666667)),0);
              auVar115._0_4_ =
                   auVar156._0_4_ * local_aa0 +
                   auVar120._0_4_ * local_ac0 +
                   auVar216._0_4_ * local_ad0 + auVar184._0_4_ * local_ab0;
              auVar115._4_4_ =
                   auVar156._4_4_ * fStack_a9c +
                   auVar120._4_4_ * fStack_abc +
                   auVar216._4_4_ * fStack_acc + auVar184._4_4_ * fStack_aac;
              auVar115._8_4_ =
                   auVar156._8_4_ * fStack_a98 +
                   auVar120._8_4_ * fStack_ab8 +
                   auVar216._8_4_ * fStack_ac8 + auVar184._8_4_ * fStack_aa8;
              auVar115._12_4_ =
                   auVar156._12_4_ * fStack_a94 +
                   auVar120._12_4_ * fStack_ab4 +
                   auVar216._12_4_ * fStack_ac4 + auVar184._12_4_ * fStack_aa4;
              local_a20._0_16_ = auVar115;
              auVar216 = vsubps_avx(auVar181,auVar115);
              local_960 = auVar216._0_4_;
              fStack_95c = auVar216._4_4_;
              fStack_958 = auVar216._8_4_;
              fStack_954 = auVar216._12_4_;
              auVar216 = vdpps_avx(auVar216,auVar216,0x7f);
              fVar227 = auVar216._0_4_;
              local_c00 = auVar375._0_4_;
              if (fVar227 < 0.0) {
                fVar176 = sqrtf(fVar227);
              }
              else {
                auVar184 = vsqrtss_avx(auVar216,auVar216);
                fVar176 = auVar184._0_4_;
              }
              auVar184 = ZEXT416((uint)(fVar146 * fVar146 * 0.5));
              auVar184 = vshufps_avx(auVar184,auVar184,0);
              auVar120 = ZEXT416((uint)((fVar140 * fVar140 + fVar204 * 4.0) * 0.5));
              auVar120 = vshufps_avx(auVar120,auVar120,0);
              auVar156 = ZEXT416((uint)((fVar146 * -fVar146 - fVar204 * 4.0) * 0.5));
              auVar156 = vshufps_avx(auVar156,auVar156,0);
              auVar119 = ZEXT416((uint)(fVar140 * -fVar140 * 0.5));
              auVar119 = vshufps_avx(auVar119,auVar119,0);
              auVar329._0_4_ =
                   local_aa0 * auVar119._0_4_ +
                   local_ac0 * auVar156._0_4_ +
                   local_ad0 * auVar184._0_4_ + local_ab0 * auVar120._0_4_;
              auVar329._4_4_ =
                   fStack_a9c * auVar119._4_4_ +
                   fStack_abc * auVar156._4_4_ +
                   fStack_acc * auVar184._4_4_ + fStack_aac * auVar120._4_4_;
              auVar329._8_4_ =
                   fStack_a98 * auVar119._8_4_ +
                   fStack_ab8 * auVar156._8_4_ +
                   fStack_ac8 * auVar184._8_4_ + fStack_aa8 * auVar120._8_4_;
              auVar329._12_4_ =
                   fStack_a94 * auVar119._12_4_ +
                   fStack_ab4 * auVar156._12_4_ +
                   fStack_ac4 * auVar184._12_4_ + fStack_aa4 * auVar120._12_4_;
              auVar184 = vshufps_avx(auVar367,auVar367,0x55);
              auVar120 = ZEXT416((uint)(fVar140 - (fVar146 + fVar146)));
              auVar156 = vshufps_avx(auVar120,auVar120,0);
              auVar120 = ZEXT416((uint)(fVar146 - (fVar140 + fVar140)));
              auVar119 = vshufps_avx(auVar120,auVar120,0);
              auVar14 = vshufps_avx(ZEXT416((uint)fVar140),ZEXT416((uint)fVar140),0);
              auVar120 = vdpps_avx(auVar329,auVar329,0x7f);
              auVar151._0_4_ =
                   local_aa0 * auVar14._0_4_ +
                   local_ac0 * auVar119._0_4_ +
                   local_ad0 * auVar184._0_4_ + local_ab0 * auVar156._0_4_;
              auVar151._4_4_ =
                   fStack_a9c * auVar14._4_4_ +
                   fStack_abc * auVar119._4_4_ +
                   fStack_acc * auVar184._4_4_ + fStack_aac * auVar156._4_4_;
              auVar151._8_4_ =
                   fStack_a98 * auVar14._8_4_ +
                   fStack_ab8 * auVar119._8_4_ +
                   fStack_ac8 * auVar184._8_4_ + fStack_aa8 * auVar156._8_4_;
              auVar151._12_4_ =
                   fStack_a94 * auVar14._12_4_ +
                   fStack_ab4 * auVar119._12_4_ +
                   fStack_ac4 * auVar184._12_4_ + fStack_aa4 * auVar156._12_4_;
              auVar184 = vblendps_avx(auVar120,_DAT_01f7aa10,0xe);
              auVar156 = vrsqrtss_avx(auVar184,auVar184);
              fVar204 = auVar156._0_4_;
              fVar146 = auVar120._0_4_;
              auVar156 = vdpps_avx(auVar329,auVar151,0x7f);
              auVar119 = vshufps_avx(auVar120,auVar120,0);
              auVar152._0_4_ = auVar151._0_4_ * auVar119._0_4_;
              auVar152._4_4_ = auVar151._4_4_ * auVar119._4_4_;
              auVar152._8_4_ = auVar151._8_4_ * auVar119._8_4_;
              auVar152._12_4_ = auVar151._12_4_ * auVar119._12_4_;
              auVar156 = vshufps_avx(auVar156,auVar156,0);
              auVar235._0_4_ = auVar329._0_4_ * auVar156._0_4_;
              auVar235._4_4_ = auVar329._4_4_ * auVar156._4_4_;
              auVar235._8_4_ = auVar329._8_4_ * auVar156._8_4_;
              auVar235._12_4_ = auVar329._12_4_ * auVar156._12_4_;
              auVar14 = vsubps_avx(auVar152,auVar235);
              auVar156 = vrcpss_avx(auVar184,auVar184);
              auVar184 = vmaxss_avx(ZEXT416((uint)local_940),
                                    ZEXT416((uint)(local_c00 * (float)local_920._0_4_)));
              auVar388 = ZEXT1664(auVar184);
              auVar156 = ZEXT416((uint)(auVar156._0_4_ * (2.0 - fVar146 * auVar156._0_4_)));
              auVar156 = vshufps_avx(auVar156,auVar156,0);
              uVar103 = CONCAT44(auVar329._4_4_,auVar329._0_4_);
              auVar256._0_8_ = uVar103 ^ 0x8000000080000000;
              auVar256._8_4_ = -auVar329._8_4_;
              auVar256._12_4_ = -auVar329._12_4_;
              auVar119 = ZEXT416((uint)(fVar204 * 1.5 + fVar146 * -0.5 * fVar204 * fVar204 * fVar204
                                       ));
              auVar119 = vshufps_avx(auVar119,auVar119,0);
              auVar209._0_4_ = auVar119._0_4_ * auVar14._0_4_ * auVar156._0_4_;
              auVar209._4_4_ = auVar119._4_4_ * auVar14._4_4_ * auVar156._4_4_;
              auVar209._8_4_ = auVar119._8_4_ * auVar14._8_4_ * auVar156._8_4_;
              auVar209._12_4_ = auVar119._12_4_ * auVar14._12_4_ * auVar156._12_4_;
              auVar282._0_4_ = auVar329._0_4_ * auVar119._0_4_;
              auVar282._4_4_ = auVar329._4_4_ * auVar119._4_4_;
              auVar282._8_4_ = auVar329._8_4_ * auVar119._8_4_;
              auVar282._12_4_ = auVar329._12_4_ * auVar119._12_4_;
              if (fVar146 < 0.0) {
                local_9e0._0_16_ = auVar209;
                fVar146 = sqrtf(fVar146);
                auVar388 = ZEXT464(auVar184._0_4_);
                auVar209 = local_9e0._0_16_;
              }
              else {
                auVar120 = vsqrtss_avx(auVar120,auVar120);
                fVar146 = auVar120._0_4_;
              }
              auVar95._4_4_ = fStack_95c;
              auVar95._0_4_ = local_960;
              auVar95._8_4_ = fStack_958;
              auVar95._12_4_ = fStack_954;
              auVar120 = vdpps_avx(auVar95,auVar282,0x7f);
              fVar146 = (local_940 / fVar146) * (fVar176 + 1.0) +
                        auVar388._0_4_ + fVar176 * local_940;
              auVar156 = vdpps_avx(auVar256,auVar282,0x7f);
              auVar119 = vdpps_avx(auVar95,auVar209,0x7f);
              auVar14 = vdpps_avx(_local_9b0,auVar282,0x7f);
              auVar15 = vdpps_avx(auVar95,auVar256,0x7f);
              fVar176 = auVar156._0_4_ + auVar119._0_4_;
              fVar204 = auVar120._0_4_;
              auVar116._0_4_ = fVar204 * fVar204;
              auVar116._4_4_ = auVar120._4_4_ * auVar120._4_4_;
              auVar116._8_4_ = auVar120._8_4_ * auVar120._8_4_;
              auVar116._12_4_ = auVar120._12_4_ * auVar120._12_4_;
              auVar119 = vsubps_avx(auVar216,auVar116);
              auVar156 = vdpps_avx(auVar95,_local_9b0,0x7f);
              fVar140 = auVar15._0_4_ - fVar204 * fVar176;
              fVar228 = auVar156._0_4_ - fVar204 * auVar14._0_4_;
              auVar156 = vrsqrtss_avx(auVar119,auVar119);
              fVar142 = auVar119._0_4_;
              fVar204 = auVar156._0_4_;
              fVar204 = fVar204 * 1.5 + fVar142 * -0.5 * fVar204 * fVar204 * fVar204;
              if (fVar142 < 0.0) {
                local_9e0._0_16_ = ZEXT416((uint)fVar176);
                local_7c0._0_4_ = fVar140;
                local_a00._0_4_ = fVar228;
                local_980._0_4_ = fVar204;
                fVar142 = sqrtf(fVar142);
                auVar388 = ZEXT464(auVar184._0_4_);
                fVar204 = (float)local_980._0_4_;
                fVar140 = (float)local_7c0._0_4_;
                fVar228 = (float)local_a00._0_4_;
                auVar184 = local_9e0._0_16_;
              }
              else {
                auVar184 = vsqrtss_avx(auVar119,auVar119);
                fVar142 = auVar184._0_4_;
                auVar184 = ZEXT416((uint)fVar176);
              }
              auVar405 = ZEXT1664(auVar120);
              auVar397 = ZEXT464((uint)fVar146);
              auVar122 = vpermilps_avx(local_a20._0_16_,0xff);
              auVar15 = vshufps_avx(auVar329,auVar329,0xff);
              fVar176 = fVar140 * fVar204 - auVar15._0_4_;
              auVar236._0_8_ = auVar14._0_8_ ^ 0x8000000080000000;
              auVar236._8_4_ = auVar14._8_4_ ^ 0x80000000;
              auVar236._12_4_ = auVar14._12_4_ ^ 0x80000000;
              auVar257._0_4_ = -fVar176;
              auVar257._4_4_ = 0x80000000;
              auVar257._8_4_ = 0x80000000;
              auVar257._12_4_ = 0x80000000;
              auVar267 = ZEXT1664(auVar257);
              auVar156 = vinsertps_avx(auVar257,ZEXT416((uint)(fVar228 * fVar204)),0x1c);
              auVar119 = vmovsldup_avx(ZEXT416((uint)(auVar184._0_4_ * fVar228 * fVar204 -
                                                     auVar14._0_4_ * fVar176)));
              auVar156 = vdivps_avx(auVar156,auVar119);
              auVar184 = vinsertps_avx(auVar184,auVar236,0x10);
              auVar184 = vdivps_avx(auVar184,auVar119);
              auVar119 = vmovsldup_avx(auVar120);
              auVar122 = ZEXT416((uint)(fVar142 - auVar122._0_4_));
              auVar14 = vmovsldup_avx(auVar122);
              auVar182._0_4_ = auVar119._0_4_ * auVar156._0_4_ + auVar14._0_4_ * auVar184._0_4_;
              auVar182._4_4_ = auVar119._4_4_ * auVar156._4_4_ + auVar14._4_4_ * auVar184._4_4_;
              auVar182._8_4_ = auVar119._8_4_ * auVar156._8_4_ + auVar14._8_4_ * auVar184._8_4_;
              auVar182._12_4_ = auVar119._12_4_ * auVar156._12_4_ + auVar14._12_4_ * auVar184._12_4_
              ;
              auVar156 = vsubps_avx(auVar367,auVar182);
              auVar375 = ZEXT1664(auVar156);
              auVar183._8_4_ = 0x7fffffff;
              auVar183._0_8_ = 0x7fffffff7fffffff;
              auVar183._12_4_ = 0x7fffffff;
              auVar184 = vandps_avx(auVar120,auVar183);
              if (auVar184._0_4_ < fVar146) {
                auVar210._8_4_ = 0x7fffffff;
                auVar210._0_8_ = 0x7fffffff7fffffff;
                auVar210._12_4_ = 0x7fffffff;
                auVar184 = vandps_avx(auVar122,auVar210);
                if (auVar184._0_4_ <
                    (float)local_7e0._0_4_ * 1.9073486e-06 + auVar388._0_4_ + fVar146) {
                  fVar176 = auVar156._0_4_ + (float)local_8d0._0_4_;
                  if ((fVar205 <= fVar176) &&
                     (fVar204 = *(float *)(ray + k * 4 + 0x80), fVar176 <= fVar204)) {
                    auVar184 = vmovshdup_avx(auVar156);
                    fVar140 = auVar184._0_4_;
                    if ((0.0 <= fVar140) && (fVar140 <= 1.0)) {
                      auVar216 = vrsqrtss_avx(auVar216,auVar216);
                      fVar228 = auVar216._0_4_;
                      auVar267 = ZEXT464((uint)(fVar227 * -0.5));
                      pGVar26 = (context->scene->geometries).items[uVar101].ptr;
                      if ((pGVar26->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                        auVar216 = ZEXT416((uint)(fVar228 * 1.5 +
                                                 fVar227 * -0.5 * fVar228 * fVar228 * fVar228));
                        auVar216 = vshufps_avx(auVar216,auVar216,0);
                        auVar211._0_4_ = auVar216._0_4_ * local_960;
                        auVar211._4_4_ = auVar216._4_4_ * fStack_95c;
                        auVar211._8_4_ = auVar216._8_4_ * fStack_958;
                        auVar211._12_4_ = auVar216._12_4_ * fStack_954;
                        auVar153._0_4_ = auVar329._0_4_ + auVar15._0_4_ * auVar211._0_4_;
                        auVar153._4_4_ = auVar329._4_4_ + auVar15._4_4_ * auVar211._4_4_;
                        auVar153._8_4_ = auVar329._8_4_ + auVar15._8_4_ * auVar211._8_4_;
                        auVar153._12_4_ = auVar329._12_4_ + auVar15._12_4_ * auVar211._12_4_;
                        auVar216 = vshufps_avx(auVar211,auVar211,0xc9);
                        auVar184 = vshufps_avx(auVar329,auVar329,0xc9);
                        auVar212._0_4_ = auVar184._0_4_ * auVar211._0_4_;
                        auVar212._4_4_ = auVar184._4_4_ * auVar211._4_4_;
                        auVar212._8_4_ = auVar184._8_4_ * auVar211._8_4_;
                        auVar212._12_4_ = auVar184._12_4_ * auVar211._12_4_;
                        auVar237._0_4_ = auVar329._0_4_ * auVar216._0_4_;
                        auVar237._4_4_ = auVar329._4_4_ * auVar216._4_4_;
                        auVar237._8_4_ = auVar329._8_4_ * auVar216._8_4_;
                        auVar237._12_4_ = auVar329._12_4_ * auVar216._12_4_;
                        auVar367 = vsubps_avx(auVar237,auVar212);
                        auVar216 = vshufps_avx(auVar367,auVar367,0xc9);
                        auVar184 = vshufps_avx(auVar153,auVar153,0xc9);
                        auVar267 = ZEXT1664(auVar184);
                        auVar238._0_4_ = auVar184._0_4_ * auVar216._0_4_;
                        auVar238._4_4_ = auVar184._4_4_ * auVar216._4_4_;
                        auVar238._8_4_ = auVar184._8_4_ * auVar216._8_4_;
                        auVar238._12_4_ = auVar184._12_4_ * auVar216._12_4_;
                        auVar216 = vshufps_avx(auVar367,auVar367,0xd2);
                        auVar154._0_4_ = auVar153._0_4_ * auVar216._0_4_;
                        auVar154._4_4_ = auVar153._4_4_ * auVar216._4_4_;
                        auVar154._8_4_ = auVar153._8_4_ * auVar216._8_4_;
                        auVar154._12_4_ = auVar153._12_4_ * auVar216._12_4_;
                        auVar216 = vsubps_avx(auVar238,auVar154);
                        if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                           (pGVar26->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                          *(float *)(ray + k * 4 + 0x80) = fVar176;
                          uVar8 = vextractps_avx(auVar216,1);
                          *(undefined4 *)(ray + k * 4 + 0xc0) = uVar8;
                          uVar8 = vextractps_avx(auVar216,2);
                          *(undefined4 *)(ray + k * 4 + 0xd0) = uVar8;
                          *(int *)(ray + k * 4 + 0xe0) = auVar216._0_4_;
                          *(float *)(ray + k * 4 + 0xf0) = fVar140;
                          *(undefined4 *)(ray + k * 4 + 0x100) = 0;
                          *(int *)(ray + k * 4 + 0x110) = (int)local_a28;
                          *(uint *)(ray + k * 4 + 0x120) = uVar101;
                          *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                          *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                        }
                        else {
                          local_750 = vshufps_avx(auVar156,auVar156,0x55);
                          auVar367 = vshufps_avx(auVar216,auVar216,0x55);
                          auStack_770 = vshufps_avx(auVar216,auVar216,0xaa);
                          local_760 = vshufps_avx(auVar216,auVar216,0);
                          local_780 = (RTCHitN  [16])auVar367;
                          local_740 = ZEXT816(0) << 0x20;
                          local_730 = local_7a0._0_8_;
                          uStack_728 = local_7a0._8_8_;
                          local_720 = local_790._0_8_;
                          uStack_718 = local_790._8_8_;
                          uVar105 = context->user->instID[0];
                          _local_710 = CONCAT44(uVar105,uVar105);
                          _uStack_708 = CONCAT44(uVar105,uVar105);
                          uVar105 = context->user->instPrimID[0];
                          auVar155._4_4_ = uVar105;
                          auVar155._0_4_ = uVar105;
                          auVar155._8_4_ = uVar105;
                          auVar155._12_4_ = uVar105;
                          auStack_700 = auVar155;
                          *(float *)(ray + k * 4 + 0x80) = fVar176;
                          local_900._0_16_ = *local_a30;
                          local_a90.valid = (int *)local_900;
                          local_a90.geometryUserPtr = pGVar26->userPtr;
                          local_a90.context = context->user;
                          local_a90.hit = local_780;
                          local_a90.N = 4;
                          auVar216 = *local_a30;
                          local_a90.ray = (RTCRayN *)ray;
                          if (pGVar26->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                            auVar267 = ZEXT1664(auVar184);
                            auVar375 = ZEXT1664(auVar156);
                            auVar388 = ZEXT1664(auVar388._0_16_);
                            auVar397 = ZEXT464((uint)fVar146);
                            auVar405 = ZEXT1664(auVar120);
                            (*pGVar26->intersectionFilterN)(&local_a90);
                            auVar293._8_56_ = extraout_var;
                            auVar293._0_8_ = extraout_XMM1_Qa;
                            auVar155 = auVar293._0_16_;
                            auVar216 = local_900._0_16_;
                          }
                          if (auVar216 == (undefined1  [16])0x0) {
                            auVar184 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
                            auVar216 = vpcmpeqd_avx(auVar155,auVar155);
                            auVar184 = auVar184 ^ auVar216;
                          }
                          else {
                            p_Var30 = context->args->filter;
                            auVar120 = vpcmpeqd_avx(auVar367,auVar367);
                            if ((p_Var30 != (RTCFilterFunctionN)0x0) &&
                               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                 != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                (((pGVar26->field_8).field_0x2 & 0x40) != 0)))) {
                              auVar267 = ZEXT1664(auVar267._0_16_);
                              auVar375 = ZEXT1664(auVar375._0_16_);
                              auVar388 = ZEXT1664(auVar388._0_16_);
                              auVar397 = ZEXT1664(auVar397._0_16_);
                              auVar405 = ZEXT1664(auVar405._0_16_);
                              (*p_Var30)(&local_a90);
                              auVar120 = vpcmpeqd_avx(auVar120,auVar120);
                              auVar216 = local_900._0_16_;
                            }
                            auVar156 = vpcmpeqd_avx(auVar216,_DAT_01f7aa10);
                            auVar184 = auVar156 ^ auVar120;
                            if (auVar216 != (undefined1  [16])0x0) {
                              auVar156 = auVar156 ^ auVar120;
                              auVar216 = vmaskmovps_avx(auVar156,*(undefined1 (*) [16])local_a90.hit
                                                       );
                              *(undefined1 (*) [16])(local_a90.ray + 0xc0) = auVar216;
                              auVar216 = vmaskmovps_avx(auVar156,*(undefined1 (*) [16])
                                                                  (local_a90.hit + 0x10));
                              *(undefined1 (*) [16])(local_a90.ray + 0xd0) = auVar216;
                              auVar216 = vmaskmovps_avx(auVar156,*(undefined1 (*) [16])
                                                                  (local_a90.hit + 0x20));
                              *(undefined1 (*) [16])(local_a90.ray + 0xe0) = auVar216;
                              auVar216 = vmaskmovps_avx(auVar156,*(undefined1 (*) [16])
                                                                  (local_a90.hit + 0x30));
                              *(undefined1 (*) [16])(local_a90.ray + 0xf0) = auVar216;
                              auVar216 = vmaskmovps_avx(auVar156,*(undefined1 (*) [16])
                                                                  (local_a90.hit + 0x40));
                              *(undefined1 (*) [16])(local_a90.ray + 0x100) = auVar216;
                              auVar216 = vmaskmovps_avx(auVar156,*(undefined1 (*) [16])
                                                                  (local_a90.hit + 0x50));
                              *(undefined1 (*) [16])(local_a90.ray + 0x110) = auVar216;
                              auVar216 = vmaskmovps_avx(auVar156,*(undefined1 (*) [16])
                                                                  (local_a90.hit + 0x60));
                              *(undefined1 (*) [16])(local_a90.ray + 0x120) = auVar216;
                              auVar216 = vmaskmovps_avx(auVar156,*(undefined1 (*) [16])
                                                                  (local_a90.hit + 0x70));
                              *(undefined1 (*) [16])(local_a90.ray + 0x130) = auVar216;
                              auVar216 = vmaskmovps_avx(auVar156,*(undefined1 (*) [16])
                                                                  (local_a90.hit + 0x80));
                              *(undefined1 (*) [16])(local_a90.ray + 0x140) = auVar216;
                            }
                          }
                          auVar117._8_8_ = 0x100000001;
                          auVar117._0_8_ = 0x100000001;
                          if ((auVar117 & auVar184) == (undefined1  [16])0x0) {
                            *(float *)(ray + k * 4 + 0x80) = fVar204;
                          }
                        }
                      }
                    }
                  }
                  break;
                }
              }
              lVar107 = lVar107 + -1;
            } while (lVar107 != 0);
            auVar173 = local_5c0;
            uVar8 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar133._4_4_ = uVar8;
            auVar133._0_4_ = uVar8;
            auVar133._8_4_ = uVar8;
            auVar133._12_4_ = uVar8;
            auVar133._16_4_ = uVar8;
            auVar133._20_4_ = uVar8;
            auVar133._24_4_ = uVar8;
            auVar133._28_4_ = uVar8;
            auVar124 = vcmpps_avx(_local_9a0,auVar133,2);
            fVar146 = auVar124._28_4_;
            local_5c0 = vandps_avx(auVar124,local_5c0);
            auVar313 = ZEXT3264(local_5c0);
            auVar173 = auVar173 & auVar124;
          } while ((((((((auVar173 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                        (auVar173 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (auVar173 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      SUB321(auVar173 >> 0x7f,0) != '\0') ||
                     (auVar173 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    SUB321(auVar173 >> 0xbf,0) != '\0') ||
                   (auVar173 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   auVar173[0x1f] < '\0');
          auVar313 = ZEXT3264(local_3a0);
          auVar10 = local_840._0_28_;
          fVar227 = (float)local_6a0._0_4_;
          fVar176 = (float)local_6a0._4_4_;
          fVar204 = fStack_698;
          fVar140 = fStack_694;
          fVar228 = fStack_690;
          fVar142 = fStack_68c;
          fVar229 = fStack_688;
          fVar230 = fStack_684;
        }
        auVar293 = ZEXT3264(_local_800);
        auVar172._0_4_ =
             (float)local_820._0_4_ * (float)local_860._0_4_ +
             local_800._0_4_ * (float)local_880._0_4_ + auVar10._0_4_ * (float)local_8a0._0_4_;
        auVar172._4_4_ =
             (float)local_820._4_4_ * (float)local_860._4_4_ +
             local_800._4_4_ * (float)local_880._4_4_ + auVar10._4_4_ * (float)local_8a0._4_4_;
        auVar172._8_4_ =
             fStack_818 * fStack_858 + local_800._8_4_ * fStack_878 + auVar10._8_4_ * fStack_898;
        auVar172._12_4_ =
             fStack_814 * fStack_854 + local_800._12_4_ * fStack_874 + auVar10._12_4_ * fStack_894;
        auVar172._16_4_ =
             fStack_810 * fStack_850 + local_800._16_4_ * fStack_870 + auVar10._16_4_ * fStack_890;
        auVar172._20_4_ =
             fStack_80c * fStack_84c + local_800._20_4_ * fStack_86c + auVar10._20_4_ * fStack_88c;
        auVar172._24_4_ =
             fStack_808 * fStack_848 + local_800._24_4_ * fStack_868 + auVar10._24_4_ * fStack_888;
        auVar172._28_4_ = fVar146 + fVar146 + auVar313._28_4_;
        auVar196._8_4_ = 0x7fffffff;
        auVar196._0_8_ = 0x7fffffff7fffffff;
        auVar196._12_4_ = 0x7fffffff;
        auVar196._16_4_ = 0x7fffffff;
        auVar196._20_4_ = 0x7fffffff;
        auVar196._24_4_ = 0x7fffffff;
        auVar196._28_4_ = 0x7fffffff;
        auVar124 = vandps_avx(auVar172,auVar196);
        auVar197._8_4_ = 0x3e99999a;
        auVar197._0_8_ = 0x3e99999a3e99999a;
        auVar197._12_4_ = 0x3e99999a;
        auVar197._16_4_ = 0x3e99999a;
        auVar197._20_4_ = 0x3e99999a;
        auVar197._24_4_ = 0x3e99999a;
        auVar197._28_4_ = 0x3e99999a;
        auVar124 = vcmpps_avx(auVar124,auVar197,1);
        auVar173 = vorps_avx(auVar124,_local_6c0);
        auVar198._0_4_ = (float)local_a60._0_4_ + fVar227;
        auVar198._4_4_ = (float)local_a60._4_4_ + fVar176;
        auVar198._8_4_ = fStack_a58 + fVar204;
        auVar198._12_4_ = fStack_a54 + fVar140;
        auVar198._16_4_ = fStack_a50 + fVar228;
        auVar198._20_4_ = fStack_a4c + fVar142;
        auVar198._24_4_ = fStack_a48 + fVar229;
        auVar198._28_4_ = fStack_a44 + fVar230;
        auVar124 = vcmpps_avx(auVar198,auVar133,2);
        _local_8a0 = vandps_avx(auVar124,local_620);
        auVar199._8_4_ = 3;
        auVar199._0_8_ = 0x300000003;
        auVar199._12_4_ = 3;
        auVar199._16_4_ = 3;
        auVar199._20_4_ = 3;
        auVar199._24_4_ = 3;
        auVar199._28_4_ = 3;
        auVar226._8_4_ = 2;
        auVar226._0_8_ = 0x200000002;
        auVar226._12_4_ = 2;
        auVar226._16_4_ = 2;
        auVar226._20_4_ = 2;
        auVar226._24_4_ = 2;
        auVar226._28_4_ = 2;
        auVar124 = vblendvps_avx(auVar226,auVar199,auVar173);
        auVar216 = vpcmpgtd_avx(auVar124._16_16_,local_660._0_16_);
        auVar184 = vpshufd_avx(local_640._0_16_,0);
        auVar184 = vpcmpgtd_avx(auVar124._0_16_,auVar184);
        auVar200._16_16_ = auVar216;
        auVar200._0_16_ = auVar133._0_16_;
        _local_880 = vblendps_avx(ZEXT1632(auVar184),auVar200,0xf0);
        auVar124 = vandnps_avx(_local_880,_local_8a0);
        auVar173 = _local_8a0 & ~_local_880;
        local_900 = auVar124;
        if ((((((((auVar173 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar173 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar173 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar173 >> 0x7f,0) != '\0') ||
              (auVar173 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar173 >> 0xbf,0) != '\0') ||
            (auVar173 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar173[0x1f] < '\0') {
          local_860._4_4_ = (float)local_a60._4_4_ + local_3a0._4_4_;
          local_860._0_4_ = (float)local_a60._0_4_ + local_3a0._0_4_;
          fStack_858 = fStack_a58 + local_3a0._8_4_;
          fStack_854 = fStack_a54 + local_3a0._12_4_;
          fStack_850 = fStack_a50 + local_3a0._16_4_;
          fStack_84c = fStack_a4c + local_3a0._20_4_;
          fStack_848 = fStack_a48 + local_3a0._24_4_;
          fStack_844 = fStack_a44 + local_3a0._28_4_;
          _local_9a0 = local_3a0;
          do {
            auVar135._8_4_ = 0x7f800000;
            auVar135._0_8_ = 0x7f8000007f800000;
            auVar135._12_4_ = 0x7f800000;
            auVar135._16_4_ = 0x7f800000;
            auVar135._20_4_ = 0x7f800000;
            auVar135._24_4_ = 0x7f800000;
            auVar135._28_4_ = 0x7f800000;
            auVar173 = vblendvps_avx(auVar135,_local_9a0,auVar124);
            auVar31 = vshufps_avx(auVar173,auVar173,0xb1);
            auVar31 = vminps_avx(auVar173,auVar31);
            auVar374 = vshufpd_avx(auVar31,auVar31,5);
            auVar31 = vminps_avx(auVar31,auVar374);
            auVar374 = vperm2f128_avx(auVar31,auVar31,1);
            auVar31 = vminps_avx(auVar31,auVar374);
            auVar31 = vcmpps_avx(auVar173,auVar31,0);
            auVar374 = auVar124 & auVar31;
            auVar173 = auVar124;
            if ((((((((auVar374 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar374 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar374 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar374 >> 0x7f,0) != '\0') ||
                  (auVar374 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar374 >> 0xbf,0) != '\0') ||
                (auVar374 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar374[0x1f] < '\0') {
              auVar173 = vandps_avx(auVar31,auVar124);
            }
            uVar102 = vmovmskps_avx(auVar173);
            uVar105 = 0;
            if (uVar102 != 0) {
              for (; (uVar102 >> uVar105 & 1) == 0; uVar105 = uVar105 + 1) {
              }
            }
            uVar103 = (ulong)uVar105;
            local_900 = auVar124;
            *(undefined4 *)(local_900 + uVar103 * 4) = 0;
            fVar146 = local_1c0[uVar103];
            uVar105 = *(uint *)(local_380 + uVar103 * 4);
            fVar227 = auVar36._0_4_;
            if ((float)local_9c0._0_4_ < 0.0) {
              fVar227 = sqrtf((float)local_9c0._0_4_);
            }
            auVar184 = vminps_avx(auVar11,auVar12);
            auVar216 = vmaxps_avx(auVar11,auVar12);
            auVar120 = vminps_avx(auVar37,auVar13);
            auVar156 = vminps_avx(auVar184,auVar120);
            auVar184 = vmaxps_avx(auVar37,auVar13);
            auVar120 = vmaxps_avx(auVar216,auVar184);
            auVar213._8_4_ = 0x7fffffff;
            auVar213._0_8_ = 0x7fffffff7fffffff;
            auVar213._12_4_ = 0x7fffffff;
            auVar216 = vandps_avx(auVar156,auVar213);
            auVar184 = vandps_avx(auVar120,auVar213);
            auVar216 = vmaxps_avx(auVar216,auVar184);
            auVar184 = vmovshdup_avx(auVar216);
            auVar184 = vmaxss_avx(auVar184,auVar216);
            auVar216 = vshufpd_avx(auVar216,auVar216,1);
            auVar216 = vmaxss_avx(auVar216,auVar184);
            local_940 = auVar216._0_4_ * 1.9073486e-06;
            local_920._0_4_ = fVar227 * 1.9073486e-06;
            local_7e0._0_16_ = vshufps_avx(auVar120,auVar120,0xff);
            auVar216 = vinsertps_avx(ZEXT416(uVar105),ZEXT416((uint)fVar146),0x10);
            auVar375 = ZEXT1664(auVar216);
            lVar107 = 5;
            do {
              auVar367 = auVar375._0_16_;
              auVar216 = vmovshdup_avx(auVar367);
              fVar146 = auVar216._0_4_;
              fVar140 = 1.0 - fVar146;
              fVar227 = fVar140 * fVar140 * fVar140;
              fVar176 = fVar146 * fVar146 * fVar146;
              fVar204 = fVar146 * fVar140;
              auVar216 = vshufps_avx(ZEXT416((uint)(fVar176 * 0.16666667)),
                                     ZEXT416((uint)(fVar176 * 0.16666667)),0);
              auVar184 = ZEXT416((uint)((fVar176 * 4.0 + fVar227 +
                                        fVar146 * fVar204 * 12.0 + fVar140 * fVar204 * 6.0) *
                                       0.16666667));
              auVar184 = vshufps_avx(auVar184,auVar184,0);
              auVar120 = ZEXT416((uint)((fVar227 * 4.0 + fVar176 +
                                        fVar140 * fVar204 * 12.0 + fVar146 * fVar204 * 6.0) *
                                       0.16666667));
              auVar120 = vshufps_avx(auVar120,auVar120,0);
              auVar156 = vshufps_avx(auVar367,auVar367,0);
              auVar185._0_4_ = auVar156._0_4_ * (float)local_9b0._0_4_ + 0.0;
              auVar185._4_4_ = auVar156._4_4_ * (float)local_9b0._4_4_ + 0.0;
              auVar185._8_4_ = auVar156._8_4_ * fStack_9a8 + 0.0;
              auVar185._12_4_ = auVar156._12_4_ * fStack_9a4 + 0.0;
              auVar156 = vshufps_avx(ZEXT416((uint)(fVar227 * 0.16666667)),
                                     ZEXT416((uint)(fVar227 * 0.16666667)),0);
              auVar118._0_4_ =
                   auVar156._0_4_ * local_aa0 +
                   auVar120._0_4_ * local_ac0 +
                   auVar216._0_4_ * local_ad0 + auVar184._0_4_ * local_ab0;
              auVar118._4_4_ =
                   auVar156._4_4_ * fStack_a9c +
                   auVar120._4_4_ * fStack_abc +
                   auVar216._4_4_ * fStack_acc + auVar184._4_4_ * fStack_aac;
              auVar118._8_4_ =
                   auVar156._8_4_ * fStack_a98 +
                   auVar120._8_4_ * fStack_ab8 +
                   auVar216._8_4_ * fStack_ac8 + auVar184._8_4_ * fStack_aa8;
              auVar118._12_4_ =
                   auVar156._12_4_ * fStack_a94 +
                   auVar120._12_4_ * fStack_ab4 +
                   auVar216._12_4_ * fStack_ac4 + auVar184._12_4_ * fStack_aa4;
              local_a20._0_16_ = auVar118;
              auVar216 = vsubps_avx(auVar185,auVar118);
              local_960 = auVar216._0_4_;
              fStack_95c = auVar216._4_4_;
              fStack_958 = auVar216._8_4_;
              fStack_954 = auVar216._12_4_;
              auVar216 = vdpps_avx(auVar216,auVar216,0x7f);
              fVar227 = auVar216._0_4_;
              local_c00 = auVar375._0_4_;
              if (fVar227 < 0.0) {
                fVar176 = sqrtf(fVar227);
              }
              else {
                auVar184 = vsqrtss_avx(auVar216,auVar216);
                fVar176 = auVar184._0_4_;
              }
              auVar184 = ZEXT416((uint)(fVar146 * fVar146 * 0.5));
              auVar184 = vshufps_avx(auVar184,auVar184,0);
              auVar120 = ZEXT416((uint)((fVar140 * fVar140 + fVar204 * 4.0) * 0.5));
              auVar120 = vshufps_avx(auVar120,auVar120,0);
              auVar156 = ZEXT416((uint)((fVar146 * -fVar146 - fVar204 * 4.0) * 0.5));
              auVar156 = vshufps_avx(auVar156,auVar156,0);
              auVar119 = ZEXT416((uint)(fVar140 * -fVar140 * 0.5));
              auVar119 = vshufps_avx(auVar119,auVar119,0);
              auVar330._0_4_ =
                   local_aa0 * auVar119._0_4_ +
                   local_ac0 * auVar156._0_4_ +
                   local_ad0 * auVar184._0_4_ + local_ab0 * auVar120._0_4_;
              auVar330._4_4_ =
                   fStack_a9c * auVar119._4_4_ +
                   fStack_abc * auVar156._4_4_ +
                   fStack_acc * auVar184._4_4_ + fStack_aac * auVar120._4_4_;
              auVar330._8_4_ =
                   fStack_a98 * auVar119._8_4_ +
                   fStack_ab8 * auVar156._8_4_ +
                   fStack_ac8 * auVar184._8_4_ + fStack_aa8 * auVar120._8_4_;
              auVar330._12_4_ =
                   fStack_a94 * auVar119._12_4_ +
                   fStack_ab4 * auVar156._12_4_ +
                   fStack_ac4 * auVar184._12_4_ + fStack_aa4 * auVar120._12_4_;
              auVar184 = vshufps_avx(auVar367,auVar367,0x55);
              auVar120 = ZEXT416((uint)(fVar140 - (fVar146 + fVar146)));
              auVar156 = vshufps_avx(auVar120,auVar120,0);
              auVar120 = ZEXT416((uint)(fVar146 - (fVar140 + fVar140)));
              auVar119 = vshufps_avx(auVar120,auVar120,0);
              auVar14 = vshufps_avx(ZEXT416((uint)fVar140),ZEXT416((uint)fVar140),0);
              auVar120 = vdpps_avx(auVar330,auVar330,0x7f);
              auVar157._0_4_ =
                   local_aa0 * auVar14._0_4_ +
                   local_ac0 * auVar119._0_4_ +
                   local_ad0 * auVar184._0_4_ + local_ab0 * auVar156._0_4_;
              auVar157._4_4_ =
                   fStack_a9c * auVar14._4_4_ +
                   fStack_abc * auVar119._4_4_ +
                   fStack_acc * auVar184._4_4_ + fStack_aac * auVar156._4_4_;
              auVar157._8_4_ =
                   fStack_a98 * auVar14._8_4_ +
                   fStack_ab8 * auVar119._8_4_ +
                   fStack_ac8 * auVar184._8_4_ + fStack_aa8 * auVar156._8_4_;
              auVar157._12_4_ =
                   fStack_a94 * auVar14._12_4_ +
                   fStack_ab4 * auVar119._12_4_ +
                   fStack_ac4 * auVar184._12_4_ + fStack_aa4 * auVar156._12_4_;
              auVar184 = vblendps_avx(auVar120,_DAT_01f7aa10,0xe);
              auVar156 = vrsqrtss_avx(auVar184,auVar184);
              fVar204 = auVar156._0_4_;
              fVar146 = auVar120._0_4_;
              auVar156 = vdpps_avx(auVar330,auVar157,0x7f);
              auVar119 = vshufps_avx(auVar120,auVar120,0);
              auVar158._0_4_ = auVar157._0_4_ * auVar119._0_4_;
              auVar158._4_4_ = auVar157._4_4_ * auVar119._4_4_;
              auVar158._8_4_ = auVar157._8_4_ * auVar119._8_4_;
              auVar158._12_4_ = auVar157._12_4_ * auVar119._12_4_;
              auVar156 = vshufps_avx(auVar156,auVar156,0);
              auVar239._0_4_ = auVar330._0_4_ * auVar156._0_4_;
              auVar239._4_4_ = auVar330._4_4_ * auVar156._4_4_;
              auVar239._8_4_ = auVar330._8_4_ * auVar156._8_4_;
              auVar239._12_4_ = auVar330._12_4_ * auVar156._12_4_;
              auVar14 = vsubps_avx(auVar158,auVar239);
              auVar156 = vrcpss_avx(auVar184,auVar184);
              auVar184 = vmaxss_avx(ZEXT416((uint)local_940),
                                    ZEXT416((uint)(local_c00 * (float)local_920._0_4_)));
              auVar388 = ZEXT1664(auVar184);
              auVar156 = ZEXT416((uint)(auVar156._0_4_ * (2.0 - fVar146 * auVar156._0_4_)));
              auVar156 = vshufps_avx(auVar156,auVar156,0);
              uVar103 = CONCAT44(auVar330._4_4_,auVar330._0_4_);
              auVar258._0_8_ = uVar103 ^ 0x8000000080000000;
              auVar258._8_4_ = -auVar330._8_4_;
              auVar258._12_4_ = -auVar330._12_4_;
              auVar119 = ZEXT416((uint)(fVar204 * 1.5 + fVar146 * -0.5 * fVar204 * fVar204 * fVar204
                                       ));
              auVar119 = vshufps_avx(auVar119,auVar119,0);
              auVar214._0_4_ = auVar119._0_4_ * auVar14._0_4_ * auVar156._0_4_;
              auVar214._4_4_ = auVar119._4_4_ * auVar14._4_4_ * auVar156._4_4_;
              auVar214._8_4_ = auVar119._8_4_ * auVar14._8_4_ * auVar156._8_4_;
              auVar214._12_4_ = auVar119._12_4_ * auVar14._12_4_ * auVar156._12_4_;
              auVar283._0_4_ = auVar330._0_4_ * auVar119._0_4_;
              auVar283._4_4_ = auVar330._4_4_ * auVar119._4_4_;
              auVar283._8_4_ = auVar330._8_4_ * auVar119._8_4_;
              auVar283._12_4_ = auVar330._12_4_ * auVar119._12_4_;
              if (fVar146 < 0.0) {
                local_9e0._0_16_ = auVar214;
                fVar146 = sqrtf(fVar146);
                auVar388 = ZEXT464(auVar184._0_4_);
                auVar214 = local_9e0._0_16_;
              }
              else {
                auVar120 = vsqrtss_avx(auVar120,auVar120);
                fVar146 = auVar120._0_4_;
              }
              auVar96._4_4_ = fStack_95c;
              auVar96._0_4_ = local_960;
              auVar96._8_4_ = fStack_958;
              auVar96._12_4_ = fStack_954;
              auVar120 = vdpps_avx(auVar96,auVar283,0x7f);
              fVar146 = (local_940 / fVar146) * (fVar176 + 1.0) +
                        auVar388._0_4_ + fVar176 * local_940;
              auVar156 = vdpps_avx(auVar258,auVar283,0x7f);
              auVar119 = vdpps_avx(auVar96,auVar214,0x7f);
              auVar14 = vdpps_avx(_local_9b0,auVar283,0x7f);
              auVar15 = vdpps_avx(auVar96,auVar258,0x7f);
              fVar176 = auVar156._0_4_ + auVar119._0_4_;
              fVar204 = auVar120._0_4_;
              auVar121._0_4_ = fVar204 * fVar204;
              auVar121._4_4_ = auVar120._4_4_ * auVar120._4_4_;
              auVar121._8_4_ = auVar120._8_4_ * auVar120._8_4_;
              auVar121._12_4_ = auVar120._12_4_ * auVar120._12_4_;
              auVar119 = vsubps_avx(auVar216,auVar121);
              auVar156 = vdpps_avx(auVar96,_local_9b0,0x7f);
              fVar140 = auVar15._0_4_ - fVar204 * fVar176;
              fVar228 = auVar156._0_4_ - fVar204 * auVar14._0_4_;
              auVar156 = vrsqrtss_avx(auVar119,auVar119);
              fVar142 = auVar119._0_4_;
              fVar204 = auVar156._0_4_;
              fVar204 = fVar204 * 1.5 + fVar142 * -0.5 * fVar204 * fVar204 * fVar204;
              if (fVar142 < 0.0) {
                local_9e0._0_16_ = ZEXT416((uint)fVar176);
                local_7c0._0_4_ = fVar140;
                local_a00._0_4_ = fVar228;
                local_980._0_4_ = fVar204;
                fVar142 = sqrtf(fVar142);
                auVar388 = ZEXT464(auVar184._0_4_);
                fVar204 = (float)local_980._0_4_;
                fVar140 = (float)local_7c0._0_4_;
                fVar228 = (float)local_a00._0_4_;
                auVar184 = local_9e0._0_16_;
              }
              else {
                auVar184 = vsqrtss_avx(auVar119,auVar119);
                fVar142 = auVar184._0_4_;
                auVar184 = ZEXT416((uint)fVar176);
              }
              auVar405 = ZEXT1664(auVar120);
              auVar397 = ZEXT464((uint)fVar146);
              auVar122 = vpermilps_avx(local_a20._0_16_,0xff);
              auVar15 = vshufps_avx(auVar330,auVar330,0xff);
              fVar140 = fVar140 * fVar204 - auVar15._0_4_;
              auVar240._0_8_ = auVar14._0_8_ ^ 0x8000000080000000;
              auVar240._8_4_ = auVar14._8_4_ ^ 0x80000000;
              auVar240._12_4_ = auVar14._12_4_ ^ 0x80000000;
              auVar259._0_4_ = -fVar140;
              auVar259._4_4_ = 0x80000000;
              auVar259._8_4_ = 0x80000000;
              auVar259._12_4_ = 0x80000000;
              auVar267 = ZEXT1664(auVar259);
              fVar176 = auVar184._0_4_ * fVar228 * fVar204;
              auVar293 = ZEXT464((uint)fVar176);
              auVar156 = vinsertps_avx(auVar259,ZEXT416((uint)(fVar228 * fVar204)),0x1c);
              auVar119 = vmovsldup_avx(ZEXT416((uint)(fVar176 - auVar14._0_4_ * fVar140)));
              auVar156 = vdivps_avx(auVar156,auVar119);
              auVar184 = vinsertps_avx(auVar184,auVar240,0x10);
              auVar184 = vdivps_avx(auVar184,auVar119);
              auVar119 = vmovsldup_avx(auVar120);
              auVar122 = ZEXT416((uint)(fVar142 - auVar122._0_4_));
              auVar14 = vmovsldup_avx(auVar122);
              auVar186._0_4_ = auVar119._0_4_ * auVar156._0_4_ + auVar14._0_4_ * auVar184._0_4_;
              auVar186._4_4_ = auVar119._4_4_ * auVar156._4_4_ + auVar14._4_4_ * auVar184._4_4_;
              auVar186._8_4_ = auVar119._8_4_ * auVar156._8_4_ + auVar14._8_4_ * auVar184._8_4_;
              auVar186._12_4_ = auVar119._12_4_ * auVar156._12_4_ + auVar14._12_4_ * auVar184._12_4_
              ;
              auVar156 = vsubps_avx(auVar367,auVar186);
              auVar375 = ZEXT1664(auVar156);
              auVar187._8_4_ = 0x7fffffff;
              auVar187._0_8_ = 0x7fffffff7fffffff;
              auVar187._12_4_ = 0x7fffffff;
              auVar184 = vandps_avx(auVar120,auVar187);
              if (auVar184._0_4_ < fVar146) {
                auVar215._8_4_ = 0x7fffffff;
                auVar215._0_8_ = 0x7fffffff7fffffff;
                auVar215._12_4_ = 0x7fffffff;
                auVar184 = vandps_avx(auVar122,auVar215);
                if (auVar184._0_4_ <
                    (float)local_7e0._0_4_ * 1.9073486e-06 + auVar388._0_4_ + fVar146) {
                  fVar176 = auVar156._0_4_ + (float)local_8d0._0_4_;
                  if (fVar205 <= fVar176) {
                    fVar204 = *(float *)(ray + k * 4 + 0x80);
                    auVar293 = ZEXT464((uint)fVar204);
                    if (fVar176 <= fVar204) {
                      auVar184 = vmovshdup_avx(auVar156);
                      fVar140 = auVar184._0_4_;
                      if ((0.0 <= fVar140) && (fVar140 <= 1.0)) {
                        auVar216 = vrsqrtss_avx(auVar216,auVar216);
                        fVar228 = auVar216._0_4_;
                        auVar267 = ZEXT464((uint)(fVar227 * -0.5));
                        pGVar26 = (context->scene->geometries).items[uVar101].ptr;
                        if ((pGVar26->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                          auVar216 = ZEXT416((uint)(fVar228 * 1.5 +
                                                   fVar227 * -0.5 * fVar228 * fVar228 * fVar228));
                          auVar216 = vshufps_avx(auVar216,auVar216,0);
                          auVar217._0_4_ = auVar216._0_4_ * local_960;
                          auVar217._4_4_ = auVar216._4_4_ * fStack_95c;
                          auVar217._8_4_ = auVar216._8_4_ * fStack_958;
                          auVar217._12_4_ = auVar216._12_4_ * fStack_954;
                          auVar159._0_4_ = auVar330._0_4_ + auVar15._0_4_ * auVar217._0_4_;
                          auVar159._4_4_ = auVar330._4_4_ + auVar15._4_4_ * auVar217._4_4_;
                          auVar159._8_4_ = auVar330._8_4_ + auVar15._8_4_ * auVar217._8_4_;
                          auVar159._12_4_ = auVar330._12_4_ + auVar15._12_4_ * auVar217._12_4_;
                          auVar216 = vshufps_avx(auVar217,auVar217,0xc9);
                          auVar184 = vshufps_avx(auVar330,auVar330,0xc9);
                          auVar218._0_4_ = auVar184._0_4_ * auVar217._0_4_;
                          auVar218._4_4_ = auVar184._4_4_ * auVar217._4_4_;
                          auVar218._8_4_ = auVar184._8_4_ * auVar217._8_4_;
                          auVar218._12_4_ = auVar184._12_4_ * auVar217._12_4_;
                          auVar241._0_4_ = auVar330._0_4_ * auVar216._0_4_;
                          auVar241._4_4_ = auVar330._4_4_ * auVar216._4_4_;
                          auVar241._8_4_ = auVar330._8_4_ * auVar216._8_4_;
                          auVar241._12_4_ = auVar330._12_4_ * auVar216._12_4_;
                          auVar367 = vsubps_avx(auVar241,auVar218);
                          auVar216 = vshufps_avx(auVar367,auVar367,0xc9);
                          auVar184 = vshufps_avx(auVar159,auVar159,0xc9);
                          auVar267 = ZEXT1664(auVar184);
                          auVar242._0_4_ = auVar184._0_4_ * auVar216._0_4_;
                          auVar242._4_4_ = auVar184._4_4_ * auVar216._4_4_;
                          auVar242._8_4_ = auVar184._8_4_ * auVar216._8_4_;
                          auVar242._12_4_ = auVar184._12_4_ * auVar216._12_4_;
                          auVar216 = vshufps_avx(auVar367,auVar367,0xd2);
                          auVar160._0_4_ = auVar159._0_4_ * auVar216._0_4_;
                          auVar160._4_4_ = auVar159._4_4_ * auVar216._4_4_;
                          auVar160._8_4_ = auVar159._8_4_ * auVar216._8_4_;
                          auVar160._12_4_ = auVar159._12_4_ * auVar216._12_4_;
                          auVar216 = vsubps_avx(auVar242,auVar160);
                          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                             (pGVar26->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                            *(float *)(ray + k * 4 + 0x80) = fVar176;
                            uVar8 = vextractps_avx(auVar216,1);
                            *(undefined4 *)(ray + k * 4 + 0xc0) = uVar8;
                            uVar8 = vextractps_avx(auVar216,2);
                            *(undefined4 *)(ray + k * 4 + 0xd0) = uVar8;
                            *(int *)(ray + k * 4 + 0xe0) = auVar216._0_4_;
                            *(float *)(ray + k * 4 + 0xf0) = fVar140;
                            *(undefined4 *)(ray + k * 4 + 0x100) = 0;
                            *(int *)(ray + k * 4 + 0x110) = (int)local_a28;
                            *(uint *)(ray + k * 4 + 0x120) = uVar101;
                            *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                            *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                          }
                          else {
                            local_750 = vshufps_avx(auVar156,auVar156,0x55);
                            auVar367 = vshufps_avx(auVar216,auVar216,0x55);
                            auStack_770 = vshufps_avx(auVar216,auVar216,0xaa);
                            local_760 = vshufps_avx(auVar216,auVar216,0);
                            local_780 = (RTCHitN  [16])auVar367;
                            local_740 = ZEXT816(0) << 0x20;
                            local_730 = local_7a0._0_8_;
                            uStack_728 = local_7a0._8_8_;
                            local_720 = local_790._0_8_;
                            uStack_718 = local_790._8_8_;
                            uVar105 = context->user->instID[0];
                            _local_710 = CONCAT44(uVar105,uVar105);
                            _uStack_708 = CONCAT44(uVar105,uVar105);
                            uVar105 = context->user->instPrimID[0];
                            auVar161._4_4_ = uVar105;
                            auVar161._0_4_ = uVar105;
                            auVar161._8_4_ = uVar105;
                            auVar161._12_4_ = uVar105;
                            auStack_700 = auVar161;
                            *(float *)(ray + k * 4 + 0x80) = fVar176;
                            local_8c0 = *local_a30;
                            local_a90.valid = (int *)local_8c0;
                            local_a90.geometryUserPtr = pGVar26->userPtr;
                            local_a90.context = context->user;
                            local_a90.hit = local_780;
                            local_a90.N = 4;
                            local_a90.ray = (RTCRayN *)ray;
                            if (pGVar26->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                              auVar267 = ZEXT1664(auVar184);
                              auVar375 = ZEXT1664(auVar156);
                              auVar388 = ZEXT1664(auVar388._0_16_);
                              auVar397 = ZEXT464((uint)fVar146);
                              auVar405 = ZEXT1664(auVar120);
                              (*pGVar26->intersectionFilterN)(&local_a90);
                              auVar313._8_56_ = extraout_var_00;
                              auVar313._0_8_ = extraout_XMM1_Qa_00;
                              auVar161 = auVar313._0_16_;
                            }
                            if (local_8c0 == (undefined1  [16])0x0) {
                              auVar216 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
                              auVar184 = vpcmpeqd_avx(auVar161,auVar161);
                              auVar216 = auVar216 ^ auVar184;
                            }
                            else {
                              p_Var30 = context->args->filter;
                              auVar184 = vpcmpeqd_avx(auVar367,auVar367);
                              if ((p_Var30 != (RTCFilterFunctionN)0x0) &&
                                 (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER
                                   ) != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                  (((pGVar26->field_8).field_0x2 & 0x40) != 0)))) {
                                auVar267 = ZEXT1664(auVar267._0_16_);
                                auVar375 = ZEXT1664(auVar375._0_16_);
                                auVar388 = ZEXT1664(auVar388._0_16_);
                                auVar397 = ZEXT1664(auVar397._0_16_);
                                auVar405 = ZEXT1664(auVar405._0_16_);
                                (*p_Var30)(&local_a90);
                                auVar184 = vpcmpeqd_avx(auVar184,auVar184);
                              }
                              auVar120 = vpcmpeqd_avx(local_8c0,_DAT_01f7aa10);
                              auVar216 = auVar120 ^ auVar184;
                              if (local_8c0 != (undefined1  [16])0x0) {
                                auVar120 = auVar120 ^ auVar184;
                                auVar184 = vmaskmovps_avx(auVar120,*(undefined1 (*) [16])
                                                                    local_a90.hit);
                                *(undefined1 (*) [16])(local_a90.ray + 0xc0) = auVar184;
                                auVar184 = vmaskmovps_avx(auVar120,*(undefined1 (*) [16])
                                                                    (local_a90.hit + 0x10));
                                *(undefined1 (*) [16])(local_a90.ray + 0xd0) = auVar184;
                                auVar184 = vmaskmovps_avx(auVar120,*(undefined1 (*) [16])
                                                                    (local_a90.hit + 0x20));
                                *(undefined1 (*) [16])(local_a90.ray + 0xe0) = auVar184;
                                auVar184 = vmaskmovps_avx(auVar120,*(undefined1 (*) [16])
                                                                    (local_a90.hit + 0x30));
                                *(undefined1 (*) [16])(local_a90.ray + 0xf0) = auVar184;
                                auVar184 = vmaskmovps_avx(auVar120,*(undefined1 (*) [16])
                                                                    (local_a90.hit + 0x40));
                                *(undefined1 (*) [16])(local_a90.ray + 0x100) = auVar184;
                                auVar184 = vmaskmovps_avx(auVar120,*(undefined1 (*) [16])
                                                                    (local_a90.hit + 0x50));
                                *(undefined1 (*) [16])(local_a90.ray + 0x110) = auVar184;
                                auVar184 = vmaskmovps_avx(auVar120,*(undefined1 (*) [16])
                                                                    (local_a90.hit + 0x60));
                                *(undefined1 (*) [16])(local_a90.ray + 0x120) = auVar184;
                                auVar184 = vmaskmovps_avx(auVar120,*(undefined1 (*) [16])
                                                                    (local_a90.hit + 0x70));
                                *(undefined1 (*) [16])(local_a90.ray + 0x130) = auVar184;
                                auVar184 = vmaskmovps_avx(auVar120,*(undefined1 (*) [16])
                                                                    (local_a90.hit + 0x80));
                                *(undefined1 (*) [16])(local_a90.ray + 0x140) = auVar184;
                              }
                            }
                            auVar293 = ZEXT464((uint)fVar204);
                            auVar123._8_8_ = 0x100000001;
                            auVar123._0_8_ = 0x100000001;
                            if ((auVar123 & auVar216) == (undefined1  [16])0x0) {
                              *(float *)(ray + k * 4 + 0x80) = fVar204;
                            }
                          }
                        }
                      }
                    }
                  }
                  break;
                }
              }
              lVar107 = lVar107 + -1;
            } while (lVar107 != 0);
            uVar8 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar133._4_4_ = uVar8;
            auVar133._0_4_ = uVar8;
            auVar133._8_4_ = uVar8;
            auVar133._12_4_ = uVar8;
            auVar133._16_4_ = uVar8;
            auVar133._20_4_ = uVar8;
            auVar133._24_4_ = uVar8;
            auVar133._28_4_ = uVar8;
            auVar173 = vcmpps_avx(_local_860,auVar133,2);
            auVar124 = vandps_avx(auVar173,local_900);
            auVar173 = local_900 & auVar173;
            local_900 = auVar124;
          } while ((((((((auVar173 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                        (auVar173 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (auVar173 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      SUB321(auVar173 >> 0x7f,0) != '\0') ||
                     (auVar173 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    SUB321(auVar173 >> 0xbf,0) != '\0') ||
                   (auVar173 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   auVar173[0x1f] < '\0');
        }
        auVar124 = vandps_avx(local_600,local_5e0);
        auVar173 = vandps_avx(_local_8a0,_local_880);
        auVar313 = ZEXT3264(_local_a60);
        auVar244._0_4_ = local_a60._0_4_ + local_3e0._0_4_;
        auVar244._4_4_ = local_a60._4_4_ + local_3e0._4_4_;
        auVar244._8_4_ = local_a60._8_4_ + local_3e0._8_4_;
        auVar244._12_4_ = local_a60._12_4_ + local_3e0._12_4_;
        auVar244._16_4_ = local_a60._16_4_ + local_3e0._16_4_;
        auVar244._20_4_ = local_a60._20_4_ + local_3e0._20_4_;
        auVar244._24_4_ = local_a60._24_4_ + local_3e0._24_4_;
        auVar244._28_4_ = local_a60._28_4_ + local_3e0._28_4_;
        auVar31 = vcmpps_avx(auVar244,auVar133,2);
        auVar124 = vandps_avx(auVar31,auVar124);
        auVar245._0_4_ = local_3a0._0_4_ + local_a60._0_4_;
        auVar245._4_4_ = local_3a0._4_4_ + local_a60._4_4_;
        auVar245._8_4_ = local_3a0._8_4_ + local_a60._8_4_;
        auVar245._12_4_ = local_3a0._12_4_ + local_a60._12_4_;
        auVar245._16_4_ = local_3a0._16_4_ + local_a60._16_4_;
        auVar245._20_4_ = local_3a0._20_4_ + local_a60._20_4_;
        auVar245._24_4_ = local_3a0._24_4_ + local_a60._24_4_;
        auVar245._28_4_ = local_3a0._28_4_ + local_a60._28_4_;
        auVar31 = vcmpps_avx(auVar245,auVar133,2);
        auVar173 = vandps_avx(auVar31,auVar173);
        auVar173 = vorps_avx(auVar124,auVar173);
        if ((((((((auVar173 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar173 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar173 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar173 >> 0x7f,0) != '\0') ||
              (auVar173 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar173 >> 0xbf,0) != '\0') ||
            (auVar173 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar173[0x1f] < '\0') {
          uVar103 = (ulong)uVar111;
          *(undefined1 (*) [32])(auStack_180 + uVar103 * 0x60) = auVar173;
          auVar124 = vblendvps_avx(local_3a0,_local_3e0,auVar124);
          *(undefined1 (*) [32])(auStack_160 + uVar103 * 0x60) = auVar124;
          uVar9 = vmovlps_avx(local_590);
          (&uStack_140)[uVar103 * 0xc] = uVar9;
          aiStack_138[uVar103 * 0x18] = uVar110 + 1;
          uVar111 = uVar111 + 1;
        }
        goto LAB_011411ea;
      }
    }
    if (uVar111 == 0) break;
    uVar8 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar130._4_4_ = uVar8;
    auVar130._0_4_ = uVar8;
    auVar130._8_4_ = uVar8;
    auVar130._12_4_ = uVar8;
    auVar130._16_4_ = uVar8;
    auVar130._20_4_ = uVar8;
    auVar130._24_4_ = uVar8;
    auVar130._28_4_ = uVar8;
    uVar105 = -uVar111;
    pauVar104 = (undefined1 (*) [32])(auStack_180 + (ulong)(uVar111 - 1) * 0x60);
    fVar146 = (float)local_a60._0_4_;
    fVar227 = (float)local_a60._4_4_;
    fVar176 = fStack_a58;
    fVar204 = fStack_a54;
    fVar140 = fStack_a50;
    fVar228 = fStack_a4c;
    fVar142 = fStack_a48;
    fVar229 = fStack_a44;
    while( true ) {
      auVar124 = pauVar104[1];
      auVar166._0_4_ = fVar146 + auVar124._0_4_;
      auVar166._4_4_ = fVar227 + auVar124._4_4_;
      auVar166._8_4_ = fVar176 + auVar124._8_4_;
      auVar166._12_4_ = fVar204 + auVar124._12_4_;
      auVar166._16_4_ = fVar140 + auVar124._16_4_;
      auVar166._20_4_ = fVar228 + auVar124._20_4_;
      auVar166._24_4_ = fVar142 + auVar124._24_4_;
      auVar166._28_4_ = fVar229 + auVar124._28_4_;
      auVar31 = vcmpps_avx(auVar166,auVar130,2);
      auVar173 = vandps_avx(auVar31,*pauVar104);
      _local_780 = auVar173;
      auVar31 = *pauVar104 & auVar31;
      if ((((((((auVar31 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar31 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar31 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar31 >> 0x7f,0) != '\0') ||
            (auVar31 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar31 >> 0xbf,0) != '\0') ||
          (auVar31 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar31[0x1f] < '\0') break;
      pauVar104 = pauVar104 + -3;
      uVar105 = uVar105 + 1;
      fVar146 = (float)local_a60._0_4_;
      fVar227 = (float)local_a60._4_4_;
      fVar176 = fStack_a58;
      fVar204 = fStack_a54;
      fVar140 = fStack_a50;
      fVar228 = fStack_a4c;
      fVar142 = fStack_a48;
      fVar229 = fStack_a44;
      if (uVar105 == 0) goto LAB_011430f3;
    }
    auVar131._8_4_ = 0x7f800000;
    auVar131._0_8_ = 0x7f8000007f800000;
    auVar131._12_4_ = 0x7f800000;
    auVar131._16_4_ = 0x7f800000;
    auVar131._20_4_ = 0x7f800000;
    auVar131._24_4_ = 0x7f800000;
    auVar131._28_4_ = 0x7f800000;
    auVar124 = vblendvps_avx(auVar131,auVar124,auVar173);
    auVar31 = vshufps_avx(auVar124,auVar124,0xb1);
    auVar31 = vminps_avx(auVar124,auVar31);
    auVar374 = vshufpd_avx(auVar31,auVar31,5);
    auVar31 = vminps_avx(auVar31,auVar374);
    auVar374 = vperm2f128_avx(auVar31,auVar31,1);
    auVar31 = vminps_avx(auVar31,auVar374);
    auVar124 = vcmpps_avx(auVar124,auVar31,0);
    auVar31 = auVar173 & auVar124;
    if ((((((((auVar31 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar31 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar31 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar31 >> 0x7f,0) != '\0') ||
          (auVar31 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar31 >> 0xbf,0) != '\0') ||
        (auVar31 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar31[0x1f] < '\0')
    {
      auVar173 = vandps_avx(auVar124,auVar173);
    }
    auVar114._8_8_ = 0;
    auVar114._0_8_ = *(ulong *)pauVar104[2];
    uVar110 = *(uint *)(pauVar104[2] + 8);
    uVar111 = vmovmskps_avx(auVar173);
    uVar102 = 0;
    if (uVar111 != 0) {
      for (; (uVar111 >> uVar102 & 1) == 0; uVar102 = uVar102 + 1) {
      }
    }
    *(undefined4 *)(local_780 + (ulong)uVar102 * 4) = 0;
    *pauVar104 = _local_780;
    uVar111 = ~uVar105;
    if ((((((((_local_780 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (_local_780 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (_local_780 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(_local_780 >> 0x7f,0) != '\0') ||
          (_local_780 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(_local_780 >> 0xbf,0) != '\0') ||
        (_local_780 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        local_780[0x1f] < '\0') {
      uVar111 = -uVar105;
    }
    auVar216 = vshufps_avx(auVar114,auVar114,0);
    auVar184 = vshufps_avx(auVar114,auVar114,0x55);
    auVar184 = vsubps_avx(auVar184,auVar216);
    local_3e0._4_4_ = auVar216._4_4_ + auVar184._4_4_ * 0.14285715;
    local_3e0._0_4_ = auVar216._0_4_ + auVar184._0_4_ * 0.0;
    fStack_3d8 = auVar216._8_4_ + auVar184._8_4_ * 0.2857143;
    fStack_3d4 = auVar216._12_4_ + auVar184._12_4_ * 0.42857146;
    fStack_3d0 = auVar216._0_4_ + auVar184._0_4_ * 0.5714286;
    fStack_3cc = auVar216._4_4_ + auVar184._4_4_ * 0.71428573;
    fStack_3c8 = auVar216._8_4_ + auVar184._8_4_ * 0.8571429;
    fStack_3c4 = auVar216._12_4_ + auVar184._12_4_;
    local_590._8_8_ = 0;
    local_590._0_8_ = *(ulong *)(local_3e0 + (ulong)uVar102 * 4);
  } while( true );
LAB_011430f3:
  uVar8 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar138._4_4_ = uVar8;
  auVar138._0_4_ = uVar8;
  auVar138._8_4_ = uVar8;
  auVar138._12_4_ = uVar8;
  auVar138._16_4_ = uVar8;
  auVar138._20_4_ = uVar8;
  auVar138._24_4_ = uVar8;
  auVar138._28_4_ = uVar8;
  auVar124 = vcmpps_avx(local_300,auVar138,2);
  uVar101 = vmovmskps_avx(auVar124);
  uVar101 = (uint)local_8a8 - 1 & (uint)local_8a8 & uVar101;
  if (uVar101 == 0) {
    return;
  }
  goto LAB_011403d4;
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time()[k]);

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }